

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [28];
  undefined4 uVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Primitive PVar32;
  Geometry *pGVar33;
  __int_type_conflict _Var34;
  RTCFilterFunctionN p_Var35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [28];
  undefined1 auVar141 [28];
  undefined1 auVar142 [28];
  uint uVar143;
  int iVar144;
  RTCIntersectArguments *pRVar145;
  ulong uVar146;
  uint uVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  ulong uVar151;
  long lVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar167;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar166;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar168;
  undefined1 auVar161 [32];
  float fVar169;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar170;
  float fVar185;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar188;
  float fVar189;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar186;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar178 [32];
  float fVar184;
  float fVar187;
  undefined1 auVar183 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar191 [16];
  float fVar190;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar200;
  float fVar221;
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  float fVar201;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar217;
  float fVar219;
  float fVar223;
  float fVar225;
  float fVar227;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar203 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar218;
  float fVar220;
  float fVar222;
  float fVar224;
  float fVar226;
  float fVar228;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar229;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar232 [32];
  float fVar240;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar244;
  float fVar245;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar246;
  float fVar255;
  float fVar256;
  undefined1 auVar247 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar248 [32];
  float fVar257;
  float fVar263;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar258;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar264;
  undefined1 auVar265 [16];
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar274;
  float fVar278;
  undefined1 auVar271 [32];
  undefined1 auVar279 [16];
  float fVar286;
  float fVar287;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar288;
  undefined1 auVar285 [32];
  undefined1 auVar294 [16];
  float fVar293;
  float fVar302;
  float fVar303;
  float fVar306;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar304;
  float fVar305;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar307;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar323;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [64];
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float in_register_0000151c;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  float fVar358;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar359;
  float fVar363;
  float fVar364;
  float fVar365;
  float in_register_0000159c;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  float fVar366;
  float fVar369;
  float fVar370;
  float fVar371;
  float in_register_000015dc;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar372 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7f9;
  int local_7ec;
  Ray *local_7e8;
  undefined1 local_7e0 [4];
  undefined1 auStack_7dc [8];
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint local_7c0;
  undefined4 uStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  ulong local_790;
  Precalculations *local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [48];
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [48];
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined8 local_680;
  undefined4 local_678;
  float local_674;
  uint local_670;
  undefined4 local_66c;
  undefined4 local_668;
  uint local_664;
  uint local_660;
  ulong local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  undefined8 uStack_598;
  undefined1 auStack_590 [8];
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 auStack_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_240 [32];
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar175 [24];
  
  local_788 = pre;
  PVar32 = prim[1];
  uVar146 = (ulong)(byte)PVar32;
  lVar150 = uVar146 * 0x25;
  fVar200 = *(float *)(prim + lVar150 + 0x12);
  auVar372 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar150 + 6));
  auVar171._0_4_ = fVar200 * auVar372._0_4_;
  auVar171._4_4_ = fVar200 * auVar372._4_4_;
  auVar171._8_4_ = fVar200 * auVar372._8_4_;
  auVar171._12_4_ = fVar200 * auVar372._12_4_;
  auVar247._0_4_ = fVar200 * (ray->dir).field_0.m128[0];
  auVar247._4_4_ = fVar200 * (ray->dir).field_0.m128[1];
  auVar247._8_4_ = fVar200 * (ray->dir).field_0.m128[2];
  auVar247._12_4_ = fVar200 * (ray->dir).field_0.m128[3];
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 4 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 4 + 10)));
  auVar155._16_16_ = auVar205;
  auVar155._0_16_ = auVar372;
  lVar152 = uVar146 * 5;
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar152 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar152 + 10)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar195._16_16_ = auVar205;
  auVar195._0_16_ = auVar372;
  auVar37 = vcvtdq2ps_avx(auVar195);
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 6 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 6 + 10)));
  auVar208._16_16_ = auVar205;
  auVar208._0_16_ = auVar372;
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0xf + 6)));
  auVar38 = vcvtdq2ps_avx(auVar208);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0xf + 10)));
  auVar209._16_16_ = auVar205;
  auVar209._0_16_ = auVar372;
  lVar148 = (ulong)(byte)PVar32 * 0x10;
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar209);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + 10)));
  auVar266._16_16_ = auVar205;
  auVar266._0_16_ = auVar372;
  auVar40 = vcvtdq2ps_avx(auVar266);
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + uVar146 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + uVar146 + 10)));
  auVar280._16_16_ = auVar205;
  auVar280._0_16_ = auVar372;
  auVar41 = vcvtdq2ps_avx(auVar280);
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0x1a + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0x1a + 10)));
  auVar295._16_16_ = auVar205;
  auVar295._0_16_ = auVar372;
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0x1b + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0x1b + 10)));
  auVar42 = vcvtdq2ps_avx(auVar295);
  auVar308._16_16_ = auVar205;
  auVar308._0_16_ = auVar372;
  auVar43 = vcvtdq2ps_avx(auVar308);
  auVar372 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0x1c + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar146 * 0x1c + 10)));
  auVar324._16_16_ = auVar205;
  auVar324._0_16_ = auVar372;
  auVar44 = vcvtdq2ps_avx(auVar324);
  auVar372 = vshufps_avx(auVar247,auVar247,0);
  auVar205 = vshufps_avx(auVar247,auVar247,0x55);
  auVar206 = vshufps_avx(auVar247,auVar247,0xaa);
  fVar200 = auVar206._0_4_;
  fVar188 = auVar206._4_4_;
  fVar217 = auVar206._8_4_;
  fVar258 = auVar206._12_4_;
  fVar219 = auVar205._0_4_;
  fVar358 = auVar205._4_4_;
  fVar221 = auVar205._8_4_;
  fVar168 = auVar205._12_4_;
  fVar223 = auVar372._0_4_;
  fVar225 = auVar372._4_4_;
  fVar227 = auVar372._8_4_;
  fVar229 = auVar372._12_4_;
  auVar340._0_4_ = fVar223 * auVar155._0_4_ + fVar219 * auVar37._0_4_ + fVar200 * auVar38._0_4_;
  auVar340._4_4_ = fVar225 * auVar155._4_4_ + fVar358 * auVar37._4_4_ + fVar188 * auVar38._4_4_;
  auVar340._8_4_ = fVar227 * auVar155._8_4_ + fVar221 * auVar37._8_4_ + fVar217 * auVar38._8_4_;
  auVar340._12_4_ = fVar229 * auVar155._12_4_ + fVar168 * auVar37._12_4_ + fVar258 * auVar38._12_4_;
  auVar340._16_4_ = fVar223 * auVar155._16_4_ + fVar219 * auVar37._16_4_ + fVar200 * auVar38._16_4_;
  auVar340._20_4_ = fVar225 * auVar155._20_4_ + fVar358 * auVar37._20_4_ + fVar188 * auVar38._20_4_;
  auVar340._24_4_ = fVar227 * auVar155._24_4_ + fVar221 * auVar37._24_4_ + fVar217 * auVar38._24_4_;
  auVar340._28_4_ = fVar168 + in_register_000015dc + in_register_0000151c;
  auVar331._0_4_ = fVar223 * auVar39._0_4_ + fVar219 * auVar40._0_4_ + fVar200 * auVar41._0_4_;
  auVar331._4_4_ = fVar225 * auVar39._4_4_ + fVar358 * auVar40._4_4_ + fVar188 * auVar41._4_4_;
  auVar331._8_4_ = fVar227 * auVar39._8_4_ + fVar221 * auVar40._8_4_ + fVar217 * auVar41._8_4_;
  auVar331._12_4_ = fVar229 * auVar39._12_4_ + fVar168 * auVar40._12_4_ + fVar258 * auVar41._12_4_;
  auVar331._16_4_ = fVar223 * auVar39._16_4_ + fVar219 * auVar40._16_4_ + fVar200 * auVar41._16_4_;
  auVar331._20_4_ = fVar225 * auVar39._20_4_ + fVar358 * auVar40._20_4_ + fVar188 * auVar41._20_4_;
  auVar331._24_4_ = fVar227 * auVar39._24_4_ + fVar221 * auVar40._24_4_ + fVar217 * auVar41._24_4_;
  auVar331._28_4_ = fVar168 + in_register_000015dc + in_register_0000159c;
  auVar248._0_4_ = fVar223 * auVar42._0_4_ + fVar219 * auVar43._0_4_ + auVar44._0_4_ * fVar200;
  auVar248._4_4_ = fVar225 * auVar42._4_4_ + fVar358 * auVar43._4_4_ + auVar44._4_4_ * fVar188;
  auVar248._8_4_ = fVar227 * auVar42._8_4_ + fVar221 * auVar43._8_4_ + auVar44._8_4_ * fVar217;
  auVar248._12_4_ = fVar229 * auVar42._12_4_ + fVar168 * auVar43._12_4_ + auVar44._12_4_ * fVar258;
  auVar248._16_4_ = fVar223 * auVar42._16_4_ + fVar219 * auVar43._16_4_ + auVar44._16_4_ * fVar200;
  auVar248._20_4_ = fVar225 * auVar42._20_4_ + fVar358 * auVar43._20_4_ + auVar44._20_4_ * fVar188;
  auVar248._24_4_ = fVar227 * auVar42._24_4_ + fVar221 * auVar43._24_4_ + auVar44._24_4_ * fVar217;
  auVar248._28_4_ = fVar229 + fVar168 + fVar258;
  auVar372 = vshufps_avx(auVar171,auVar171,0);
  auVar205 = vshufps_avx(auVar171,auVar171,0x55);
  auVar206 = vshufps_avx(auVar171,auVar171,0xaa);
  fVar188 = auVar206._0_4_;
  fVar217 = auVar206._4_4_;
  fVar258 = auVar206._8_4_;
  fVar219 = auVar206._12_4_;
  fVar225 = auVar205._0_4_;
  fVar227 = auVar205._4_4_;
  fVar229 = auVar205._8_4_;
  fVar237 = auVar205._12_4_;
  fVar358 = auVar372._0_4_;
  fVar221 = auVar372._4_4_;
  fVar168 = auVar372._8_4_;
  fVar223 = auVar372._12_4_;
  fVar200 = auVar155._28_4_;
  auVar196._0_4_ = fVar358 * auVar155._0_4_ + fVar225 * auVar37._0_4_ + fVar188 * auVar38._0_4_;
  auVar196._4_4_ = fVar221 * auVar155._4_4_ + fVar227 * auVar37._4_4_ + fVar217 * auVar38._4_4_;
  auVar196._8_4_ = fVar168 * auVar155._8_4_ + fVar229 * auVar37._8_4_ + fVar258 * auVar38._8_4_;
  auVar196._12_4_ = fVar223 * auVar155._12_4_ + fVar237 * auVar37._12_4_ + fVar219 * auVar38._12_4_;
  auVar196._16_4_ = fVar358 * auVar155._16_4_ + fVar225 * auVar37._16_4_ + fVar188 * auVar38._16_4_;
  auVar196._20_4_ = fVar221 * auVar155._20_4_ + fVar227 * auVar37._20_4_ + fVar217 * auVar38._20_4_;
  auVar196._24_4_ = fVar168 * auVar155._24_4_ + fVar229 * auVar37._24_4_ + fVar258 * auVar38._24_4_;
  auVar196._28_4_ = fVar200 + auVar37._28_4_ + auVar38._28_4_;
  auVar176._0_4_ = fVar358 * auVar39._0_4_ + fVar225 * auVar40._0_4_ + fVar188 * auVar41._0_4_;
  auVar176._4_4_ = fVar221 * auVar39._4_4_ + fVar227 * auVar40._4_4_ + fVar217 * auVar41._4_4_;
  auVar176._8_4_ = fVar168 * auVar39._8_4_ + fVar229 * auVar40._8_4_ + fVar258 * auVar41._8_4_;
  auVar176._12_4_ = fVar223 * auVar39._12_4_ + fVar237 * auVar40._12_4_ + fVar219 * auVar41._12_4_;
  auVar176._16_4_ = fVar358 * auVar39._16_4_ + fVar225 * auVar40._16_4_ + fVar188 * auVar41._16_4_;
  auVar176._20_4_ = fVar221 * auVar39._20_4_ + fVar227 * auVar40._20_4_ + fVar217 * auVar41._20_4_;
  auVar176._24_4_ = fVar168 * auVar39._24_4_ + fVar229 * auVar40._24_4_ + fVar258 * auVar41._24_4_;
  auVar176._28_4_ = fVar200 + auVar38._28_4_ + auVar41._28_4_;
  auVar156._0_4_ = fVar358 * auVar42._0_4_ + fVar225 * auVar43._0_4_ + auVar44._0_4_ * fVar188;
  auVar156._4_4_ = fVar221 * auVar42._4_4_ + fVar227 * auVar43._4_4_ + auVar44._4_4_ * fVar217;
  auVar156._8_4_ = fVar168 * auVar42._8_4_ + fVar229 * auVar43._8_4_ + auVar44._8_4_ * fVar258;
  auVar156._12_4_ = fVar223 * auVar42._12_4_ + fVar237 * auVar43._12_4_ + auVar44._12_4_ * fVar219;
  auVar156._16_4_ = fVar358 * auVar42._16_4_ + fVar225 * auVar43._16_4_ + auVar44._16_4_ * fVar188;
  auVar156._20_4_ = fVar221 * auVar42._20_4_ + fVar227 * auVar43._20_4_ + auVar44._20_4_ * fVar217;
  auVar156._24_4_ = fVar168 * auVar42._24_4_ + fVar229 * auVar43._24_4_ + auVar44._24_4_ * fVar258;
  auVar156._28_4_ = fVar200 + auVar40._28_4_ + fVar219;
  auVar281._8_4_ = 0x7fffffff;
  auVar281._0_8_ = 0x7fffffff7fffffff;
  auVar281._12_4_ = 0x7fffffff;
  auVar281._16_4_ = 0x7fffffff;
  auVar281._20_4_ = 0x7fffffff;
  auVar281._24_4_ = 0x7fffffff;
  auVar281._28_4_ = 0x7fffffff;
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  auVar210._16_4_ = 0x219392ef;
  auVar210._20_4_ = 0x219392ef;
  auVar210._24_4_ = 0x219392ef;
  auVar210._28_4_ = 0x219392ef;
  auVar155 = vandps_avx(auVar340,auVar281);
  auVar155 = vcmpps_avx(auVar155,auVar210,1);
  auVar37 = vblendvps_avx(auVar340,auVar210,auVar155);
  auVar155 = vandps_avx(auVar331,auVar281);
  auVar155 = vcmpps_avx(auVar155,auVar210,1);
  auVar38 = vblendvps_avx(auVar331,auVar210,auVar155);
  auVar155 = vandps_avx(auVar248,auVar281);
  auVar155 = vcmpps_avx(auVar155,auVar210,1);
  auVar155 = vblendvps_avx(auVar248,auVar210,auVar155);
  auVar39 = vrcpps_avx(auVar37);
  fVar200 = auVar39._0_4_;
  fVar217 = auVar39._4_4_;
  auVar40._4_4_ = auVar37._4_4_ * fVar217;
  auVar40._0_4_ = auVar37._0_4_ * fVar200;
  fVar219 = auVar39._8_4_;
  auVar40._8_4_ = auVar37._8_4_ * fVar219;
  fVar221 = auVar39._12_4_;
  auVar40._12_4_ = auVar37._12_4_ * fVar221;
  fVar223 = auVar39._16_4_;
  auVar40._16_4_ = auVar37._16_4_ * fVar223;
  fVar225 = auVar39._20_4_;
  auVar40._20_4_ = auVar37._20_4_ * fVar225;
  fVar227 = auVar39._24_4_;
  auVar40._24_4_ = auVar37._24_4_ * fVar227;
  auVar40._28_4_ = auVar37._28_4_;
  auVar282._8_4_ = 0x3f800000;
  auVar282._0_8_ = &DAT_3f8000003f800000;
  auVar282._12_4_ = 0x3f800000;
  auVar282._16_4_ = 0x3f800000;
  auVar282._20_4_ = 0x3f800000;
  auVar282._24_4_ = 0x3f800000;
  auVar282._28_4_ = 0x3f800000;
  auVar41 = vsubps_avx(auVar282,auVar40);
  fVar200 = fVar200 + fVar200 * auVar41._0_4_;
  fVar217 = fVar217 + fVar217 * auVar41._4_4_;
  fVar219 = fVar219 + fVar219 * auVar41._8_4_;
  fVar221 = fVar221 + fVar221 * auVar41._12_4_;
  fVar223 = fVar223 + fVar223 * auVar41._16_4_;
  fVar225 = fVar225 + fVar225 * auVar41._20_4_;
  fVar227 = fVar227 + fVar227 * auVar41._24_4_;
  auVar40 = vrcpps_avx(auVar38);
  fVar229 = auVar40._0_4_;
  fVar237 = auVar40._4_4_;
  auVar37._4_4_ = fVar237 * auVar38._4_4_;
  auVar37._0_4_ = fVar229 * auVar38._0_4_;
  fVar238 = auVar40._8_4_;
  auVar37._8_4_ = fVar238 * auVar38._8_4_;
  fVar239 = auVar40._12_4_;
  auVar37._12_4_ = fVar239 * auVar38._12_4_;
  fVar241 = auVar40._16_4_;
  auVar37._16_4_ = fVar241 * auVar38._16_4_;
  fVar242 = auVar40._20_4_;
  auVar37._20_4_ = fVar242 * auVar38._20_4_;
  fVar243 = auVar40._24_4_;
  auVar37._24_4_ = fVar243 * auVar38._24_4_;
  auVar37._28_4_ = auVar38._28_4_;
  auVar38 = vsubps_avx(auVar282,auVar37);
  fVar229 = fVar229 + fVar229 * auVar38._0_4_;
  fVar237 = fVar237 + fVar237 * auVar38._4_4_;
  fVar238 = fVar238 + fVar238 * auVar38._8_4_;
  fVar239 = fVar239 + fVar239 * auVar38._12_4_;
  fVar241 = fVar241 + fVar241 * auVar38._16_4_;
  fVar242 = fVar242 + fVar242 * auVar38._20_4_;
  fVar243 = fVar243 + fVar243 * auVar38._24_4_;
  auVar37 = vrcpps_avx(auVar155);
  fVar246 = auVar37._0_4_;
  fVar255 = auVar37._4_4_;
  auVar42._4_4_ = fVar255 * auVar155._4_4_;
  auVar42._0_4_ = fVar246 * auVar155._0_4_;
  fVar256 = auVar37._8_4_;
  auVar42._8_4_ = fVar256 * auVar155._8_4_;
  fVar257 = auVar37._12_4_;
  auVar42._12_4_ = fVar257 * auVar155._12_4_;
  fVar259 = auVar37._16_4_;
  auVar42._16_4_ = fVar259 * auVar155._16_4_;
  fVar260 = auVar37._20_4_;
  auVar42._20_4_ = fVar260 * auVar155._20_4_;
  fVar261 = auVar37._24_4_;
  auVar42._24_4_ = fVar261 * auVar155._24_4_;
  auVar42._28_4_ = auVar155._28_4_;
  auVar155 = vsubps_avx(auVar282,auVar42);
  fVar246 = fVar246 + fVar246 * auVar155._0_4_;
  fVar255 = fVar255 + fVar255 * auVar155._4_4_;
  fVar256 = fVar256 + fVar256 * auVar155._8_4_;
  fVar257 = fVar257 + fVar257 * auVar155._12_4_;
  fVar259 = fVar259 + fVar259 * auVar155._16_4_;
  fVar260 = fVar260 + fVar260 * auVar155._20_4_;
  fVar261 = fVar261 + fVar261 * auVar155._24_4_;
  auVar372 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar150 + 0x16)) *
                           *(float *)(prim + lVar150 + 0x1a)));
  auVar45 = vshufps_avx(auVar372,auVar372,0);
  auVar372._8_8_ = 0;
  auVar372._0_8_ = *(ulong *)(prim + uVar146 * 7 + 6);
  auVar372 = vpmovsxwd_avx(auVar372);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar146 * 7 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar205);
  auVar283._16_16_ = auVar205;
  auVar283._0_16_ = auVar372;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar146 * 0xb + 6);
  auVar372 = vpmovsxwd_avx(auVar206);
  auVar155 = vcvtdq2ps_avx(auVar283);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar146 * 0xb + 0xe);
  auVar205 = vpmovsxwd_avx(auVar207);
  auVar296._16_16_ = auVar205;
  auVar296._0_16_ = auVar372;
  auVar37 = vcvtdq2ps_avx(auVar296);
  auVar37 = vsubps_avx(auVar37,auVar155);
  fVar188 = auVar45._0_4_;
  fVar258 = auVar45._4_4_;
  fVar358 = auVar45._8_4_;
  fVar168 = auVar45._12_4_;
  auVar284._0_4_ = auVar37._0_4_ * fVar188 + auVar155._0_4_;
  auVar284._4_4_ = auVar37._4_4_ * fVar258 + auVar155._4_4_;
  auVar284._8_4_ = auVar37._8_4_ * fVar358 + auVar155._8_4_;
  auVar284._12_4_ = auVar37._12_4_ * fVar168 + auVar155._12_4_;
  auVar284._16_4_ = auVar37._16_4_ * fVar188 + auVar155._16_4_;
  auVar284._20_4_ = auVar37._20_4_ * fVar258 + auVar155._20_4_;
  auVar284._24_4_ = auVar37._24_4_ * fVar358 + auVar155._24_4_;
  auVar284._28_4_ = auVar37._28_4_ + auVar155._28_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar146 * 9 + 6);
  auVar372 = vpmovsxwd_avx(auVar45);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar146 * 9 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar13);
  auVar297._16_16_ = auVar205;
  auVar297._0_16_ = auVar372;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar146 * 0xd + 6);
  auVar372 = vpmovsxwd_avx(auVar14);
  auVar155 = vcvtdq2ps_avx(auVar297);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar146 * 0xd + 0xe);
  auVar205 = vpmovsxwd_avx(auVar15);
  auVar309._16_16_ = auVar205;
  auVar309._0_16_ = auVar372;
  auVar37 = vcvtdq2ps_avx(auVar309);
  auVar37 = vsubps_avx(auVar37,auVar155);
  auVar298._0_4_ = auVar155._0_4_ + auVar37._0_4_ * fVar188;
  auVar298._4_4_ = auVar155._4_4_ + auVar37._4_4_ * fVar258;
  auVar298._8_4_ = auVar155._8_4_ + auVar37._8_4_ * fVar358;
  auVar298._12_4_ = auVar155._12_4_ + auVar37._12_4_ * fVar168;
  auVar298._16_4_ = auVar155._16_4_ + auVar37._16_4_ * fVar188;
  auVar298._20_4_ = auVar155._20_4_ + auVar37._20_4_ * fVar258;
  auVar298._24_4_ = auVar155._24_4_ + auVar37._24_4_ * fVar358;
  auVar298._28_4_ = auVar155._28_4_ + auVar37._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar146 * 0x12 + 6);
  auVar372 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar146 * 0x12 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar17);
  auVar310._16_16_ = auVar205;
  auVar310._0_16_ = auVar372;
  uVar151 = (ulong)(uint)((int)lVar152 << 2);
  lVar150 = uVar146 * 2 + uVar151;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar150 + 6);
  auVar372 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar150 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar19);
  auVar155 = vcvtdq2ps_avx(auVar310);
  auVar325._16_16_ = auVar205;
  auVar325._0_16_ = auVar372;
  auVar37 = vcvtdq2ps_avx(auVar325);
  auVar37 = vsubps_avx(auVar37,auVar155);
  auVar311._0_4_ = auVar155._0_4_ + auVar37._0_4_ * fVar188;
  auVar311._4_4_ = auVar155._4_4_ + auVar37._4_4_ * fVar258;
  auVar311._8_4_ = auVar155._8_4_ + auVar37._8_4_ * fVar358;
  auVar311._12_4_ = auVar155._12_4_ + auVar37._12_4_ * fVar168;
  auVar311._16_4_ = auVar155._16_4_ + auVar37._16_4_ * fVar188;
  auVar311._20_4_ = auVar155._20_4_ + auVar37._20_4_ * fVar258;
  auVar311._24_4_ = auVar155._24_4_ + auVar37._24_4_ * fVar358;
  auVar311._28_4_ = auVar155._28_4_ + auVar37._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar151 + 6);
  auVar372 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar151 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar21);
  auVar326._16_16_ = auVar205;
  auVar326._0_16_ = auVar372;
  auVar155 = vcvtdq2ps_avx(auVar326);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar146 * 0x18 + 6);
  auVar372 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar146 * 0x18 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar23);
  auVar332._16_16_ = auVar205;
  auVar332._0_16_ = auVar372;
  auVar37 = vcvtdq2ps_avx(auVar332);
  auVar37 = vsubps_avx(auVar37,auVar155);
  auVar327._0_4_ = auVar155._0_4_ + auVar37._0_4_ * fVar188;
  auVar327._4_4_ = auVar155._4_4_ + auVar37._4_4_ * fVar258;
  auVar327._8_4_ = auVar155._8_4_ + auVar37._8_4_ * fVar358;
  auVar327._12_4_ = auVar155._12_4_ + auVar37._12_4_ * fVar168;
  auVar327._16_4_ = auVar155._16_4_ + auVar37._16_4_ * fVar188;
  auVar327._20_4_ = auVar155._20_4_ + auVar37._20_4_ * fVar258;
  auVar327._24_4_ = auVar155._24_4_ + auVar37._24_4_ * fVar358;
  auVar327._28_4_ = auVar155._28_4_ + auVar37._28_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar146 * 0x1d + 6);
  auVar372 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar146 * 0x1d + 0xe);
  auVar205 = vpmovsxwd_avx(auVar25);
  auVar333._16_16_ = auVar205;
  auVar333._0_16_ = auVar372;
  lVar150 = uVar146 + (ulong)(byte)PVar32 * 0x20;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar150 + 6);
  auVar372 = vpmovsxwd_avx(auVar26);
  auVar155 = vcvtdq2ps_avx(auVar333);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar150 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar27);
  auVar341._16_16_ = auVar205;
  auVar341._0_16_ = auVar372;
  auVar37 = vcvtdq2ps_avx(auVar341);
  auVar37 = vsubps_avx(auVar37,auVar155);
  lVar150 = (ulong)(byte)PVar32 * 0x20 - uVar146;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar150 + 6);
  auVar372 = vpmovsxwd_avx(auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar150 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar29);
  auVar334._0_4_ = auVar155._0_4_ + auVar37._0_4_ * fVar188;
  auVar334._4_4_ = auVar155._4_4_ + auVar37._4_4_ * fVar258;
  auVar334._8_4_ = auVar155._8_4_ + auVar37._8_4_ * fVar358;
  auVar334._12_4_ = auVar155._12_4_ + auVar37._12_4_ * fVar168;
  auVar334._16_4_ = auVar155._16_4_ + auVar37._16_4_ * fVar188;
  auVar334._20_4_ = auVar155._20_4_ + auVar37._20_4_ * fVar258;
  auVar334._24_4_ = auVar155._24_4_ + auVar37._24_4_ * fVar358;
  auVar334._28_4_ = auVar155._28_4_ + auVar37._28_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar146 * 0x23 + 6);
  auVar206 = vpmovsxwd_avx(auVar30);
  auVar350._16_16_ = auVar205;
  auVar350._0_16_ = auVar372;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar146 * 0x23 + 0xe);
  auVar372 = vpmovsxwd_avx(auVar31);
  auVar342._16_16_ = auVar372;
  auVar342._0_16_ = auVar206;
  auVar155 = vcvtdq2ps_avx(auVar350);
  auVar37 = vcvtdq2ps_avx(auVar342);
  auVar37 = vsubps_avx(auVar37,auVar155);
  auVar343._0_4_ = auVar155._0_4_ + auVar37._0_4_ * fVar188;
  auVar343._4_4_ = auVar155._4_4_ + auVar37._4_4_ * fVar258;
  auVar343._8_4_ = auVar155._8_4_ + auVar37._8_4_ * fVar358;
  auVar343._12_4_ = auVar155._12_4_ + auVar37._12_4_ * fVar168;
  auVar343._16_4_ = auVar155._16_4_ + auVar37._16_4_ * fVar188;
  auVar343._20_4_ = auVar155._20_4_ + auVar37._20_4_ * fVar258;
  auVar343._24_4_ = auVar155._24_4_ + auVar37._24_4_ * fVar358;
  auVar343._28_4_ = auVar155._28_4_ + fVar168;
  auVar155 = vsubps_avx(auVar284,auVar196);
  auVar265._0_4_ = fVar200 * auVar155._0_4_;
  auVar265._4_4_ = fVar217 * auVar155._4_4_;
  auVar265._8_4_ = fVar219 * auVar155._8_4_;
  auVar265._12_4_ = fVar221 * auVar155._12_4_;
  auVar43._16_4_ = fVar223 * auVar155._16_4_;
  auVar43._0_16_ = auVar265;
  auVar43._20_4_ = fVar225 * auVar155._20_4_;
  auVar43._24_4_ = fVar227 * auVar155._24_4_;
  auVar43._28_4_ = auVar155._28_4_;
  auVar155 = vsubps_avx(auVar298,auVar196);
  auVar202._0_4_ = fVar200 * auVar155._0_4_;
  auVar202._4_4_ = fVar217 * auVar155._4_4_;
  auVar202._8_4_ = fVar219 * auVar155._8_4_;
  auVar202._12_4_ = fVar221 * auVar155._12_4_;
  auVar44._16_4_ = fVar223 * auVar155._16_4_;
  auVar44._0_16_ = auVar202;
  auVar44._20_4_ = fVar225 * auVar155._20_4_;
  auVar44._24_4_ = fVar227 * auVar155._24_4_;
  auVar44._28_4_ = auVar39._28_4_ + auVar41._28_4_;
  auVar155 = vsubps_avx(auVar311,auVar176);
  auVar191._0_4_ = fVar229 * auVar155._0_4_;
  auVar191._4_4_ = fVar237 * auVar155._4_4_;
  auVar191._8_4_ = fVar238 * auVar155._8_4_;
  auVar191._12_4_ = fVar239 * auVar155._12_4_;
  auVar39._16_4_ = fVar241 * auVar155._16_4_;
  auVar39._0_16_ = auVar191;
  auVar39._20_4_ = fVar242 * auVar155._20_4_;
  auVar39._24_4_ = fVar243 * auVar155._24_4_;
  auVar39._28_4_ = auVar155._28_4_;
  auVar155 = vsubps_avx(auVar327,auVar176);
  auVar230._0_4_ = fVar229 * auVar155._0_4_;
  auVar230._4_4_ = fVar237 * auVar155._4_4_;
  auVar230._8_4_ = fVar238 * auVar155._8_4_;
  auVar230._12_4_ = fVar239 * auVar155._12_4_;
  auVar41._16_4_ = fVar241 * auVar155._16_4_;
  auVar41._0_16_ = auVar230;
  auVar41._20_4_ = fVar242 * auVar155._20_4_;
  auVar41._24_4_ = fVar243 * auVar155._24_4_;
  auVar41._28_4_ = auVar40._28_4_ + auVar38._28_4_;
  auVar155 = vsubps_avx(auVar334,auVar156);
  auVar172._0_4_ = fVar246 * auVar155._0_4_;
  auVar172._4_4_ = fVar255 * auVar155._4_4_;
  auVar172._8_4_ = fVar256 * auVar155._8_4_;
  auVar172._12_4_ = fVar257 * auVar155._12_4_;
  auVar38._16_4_ = fVar259 * auVar155._16_4_;
  auVar38._0_16_ = auVar172;
  auVar38._20_4_ = fVar260 * auVar155._20_4_;
  auVar38._24_4_ = fVar261 * auVar155._24_4_;
  auVar38._28_4_ = auVar155._28_4_;
  auVar155 = vsubps_avx(auVar343,auVar156);
  auVar153._0_4_ = fVar246 * auVar155._0_4_;
  auVar153._4_4_ = fVar255 * auVar155._4_4_;
  auVar153._8_4_ = fVar256 * auVar155._8_4_;
  auVar153._12_4_ = fVar257 * auVar155._12_4_;
  auVar46._16_4_ = fVar259 * auVar155._16_4_;
  auVar46._0_16_ = auVar153;
  auVar46._20_4_ = fVar260 * auVar155._20_4_;
  auVar46._24_4_ = fVar261 * auVar155._24_4_;
  auVar46._28_4_ = auVar155._28_4_;
  auVar372 = vpminsd_avx(auVar43._16_16_,auVar44._16_16_);
  auVar205 = vpminsd_avx(auVar265,auVar202);
  auVar299._16_16_ = auVar372;
  auVar299._0_16_ = auVar205;
  auVar372 = vpminsd_avx(auVar39._16_16_,auVar41._16_16_);
  auVar205 = vpminsd_avx(auVar191,auVar230);
  auVar335._16_16_ = auVar372;
  auVar335._0_16_ = auVar205;
  auVar155 = vmaxps_avx(auVar299,auVar335);
  auVar372 = vpminsd_avx(auVar38._16_16_,auVar46._16_16_);
  auVar205 = vpminsd_avx(auVar172,auVar153);
  auVar351._16_16_ = auVar372;
  auVar351._0_16_ = auVar205;
  uVar11 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar360._4_4_ = uVar11;
  auVar360._0_4_ = uVar11;
  auVar360._8_4_ = uVar11;
  auVar360._12_4_ = uVar11;
  auVar360._16_4_ = uVar11;
  auVar360._20_4_ = uVar11;
  auVar360._24_4_ = uVar11;
  auVar360._28_4_ = uVar11;
  auVar37 = vmaxps_avx(auVar351,auVar360);
  auVar155 = vmaxps_avx(auVar155,auVar37);
  local_80._4_4_ = auVar155._4_4_ * 0.99999964;
  local_80._0_4_ = auVar155._0_4_ * 0.99999964;
  local_80._8_4_ = auVar155._8_4_ * 0.99999964;
  local_80._12_4_ = auVar155._12_4_ * 0.99999964;
  local_80._16_4_ = auVar155._16_4_ * 0.99999964;
  local_80._20_4_ = auVar155._20_4_ * 0.99999964;
  local_80._24_4_ = auVar155._24_4_ * 0.99999964;
  local_80._28_4_ = auVar155._28_4_;
  auVar372 = vpmaxsd_avx(auVar43._16_16_,auVar44._16_16_);
  auVar205 = vpmaxsd_avx(auVar265,auVar202);
  auVar211._16_16_ = auVar372;
  auVar211._0_16_ = auVar205;
  auVar372 = vpmaxsd_avx(auVar39._16_16_,auVar41._16_16_);
  auVar205 = vpmaxsd_avx(auVar191,auVar230);
  auVar197._16_16_ = auVar372;
  auVar197._0_16_ = auVar205;
  auVar155 = vminps_avx(auVar211,auVar197);
  auVar372 = vpmaxsd_avx(auVar38._16_16_,auVar46._16_16_);
  auVar205 = vpmaxsd_avx(auVar172,auVar153);
  auVar157._16_16_ = auVar372;
  auVar157._0_16_ = auVar205;
  fVar200 = ray->tfar;
  auVar177._4_4_ = fVar200;
  auVar177._0_4_ = fVar200;
  auVar177._8_4_ = fVar200;
  auVar177._12_4_ = fVar200;
  auVar177._16_4_ = fVar200;
  auVar177._20_4_ = fVar200;
  auVar177._24_4_ = fVar200;
  auVar177._28_4_ = fVar200;
  auVar37 = vminps_avx(auVar157,auVar177);
  auVar155 = vminps_avx(auVar155,auVar37);
  auVar36._4_4_ = auVar155._4_4_ * 1.0000004;
  auVar36._0_4_ = auVar155._0_4_ * 1.0000004;
  auVar36._8_4_ = auVar155._8_4_ * 1.0000004;
  auVar36._12_4_ = auVar155._12_4_ * 1.0000004;
  auVar36._16_4_ = auVar155._16_4_ * 1.0000004;
  auVar36._20_4_ = auVar155._20_4_ * 1.0000004;
  auVar36._24_4_ = auVar155._24_4_ * 1.0000004;
  auVar36._28_4_ = auVar155._28_4_;
  auVar155 = vcmpps_avx(local_80,auVar36,2);
  auVar372 = vpshufd_avx(ZEXT116((byte)PVar32),0);
  auVar178._16_16_ = auVar372;
  auVar178._0_16_ = auVar372;
  auVar37 = vcvtdq2ps_avx(auVar178);
  auVar37 = vcmpps_avx(_DAT_02020f40,auVar37,1);
  auVar155 = vandps_avx(auVar155,auVar37);
  uVar143 = vmovmskps_avx(auVar155);
  local_7f9 = uVar143 != 0;
  if (local_7f9) {
    local_500 = mm_lookupmask_ps._16_8_;
    uStack_4f8 = mm_lookupmask_ps._24_8_;
    uStack_4f0 = mm_lookupmask_ps._16_8_;
    uStack_4e8 = mm_lookupmask_ps._24_8_;
    uVar143 = uVar143 & 0xff;
    local_7e8 = ray;
    do {
      lVar150 = 0;
      if (uVar143 != 0) {
        for (; (uVar143 >> lVar150 & 1) == 0; lVar150 = lVar150 + 1) {
        }
      }
      local_790 = (ulong)*(uint *)(prim + 2);
      pGVar33 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      local_648 = (ulong)*(uint *)(prim + lVar150 * 4 + 6);
      uVar146 = (ulong)*(uint *)(*(long *)&pGVar33->field_0x58 +
                                (ulong)*(uint *)(prim + lVar150 * 4 + 6) *
                                pGVar33[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar200 = (pGVar33->time_range).lower;
      fVar200 = pGVar33->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar200) / ((pGVar33->time_range).upper - fVar200));
      auVar372 = vroundss_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),9);
      auVar372 = vminss_avx(auVar372,ZEXT416((uint)(pGVar33->fnumTimeSegments + -1.0)));
      auVar372 = vmaxss_avx(ZEXT816(0) << 0x20,auVar372);
      fVar200 = fVar200 - auVar372._0_4_;
      _Var34 = pGVar33[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar149 = (long)(int)auVar372._0_4_ * 0x38;
      lVar150 = *(long *)(_Var34 + 0x10 + lVar149);
      lVar152 = *(long *)(_Var34 + 0x38 + lVar149);
      lVar148 = *(long *)(_Var34 + 0x48 + lVar149);
      auVar372 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
      pfVar1 = (float *)(lVar152 + uVar146 * lVar148);
      fVar188 = auVar372._0_4_;
      fVar217 = auVar372._4_4_;
      fVar258 = auVar372._8_4_;
      fVar219 = auVar372._12_4_;
      pfVar2 = (float *)(lVar152 + (uVar146 + 1) * lVar148);
      uVar151 = (uVar146 + 2) * lVar148;
      pfVar3 = (float *)(lVar152 + uVar151);
      pfVar4 = (float *)(lVar152 + lVar148 * (uVar146 + 3));
      lVar152 = *(long *)(_Var34 + lVar149);
      auVar372 = vshufps_avx(ZEXT416((uint)(1.0 - fVar200)),ZEXT416((uint)(1.0 - fVar200)),0);
      pfVar5 = (float *)(lVar152 + lVar150 * uVar146);
      fVar200 = auVar372._0_4_;
      fVar358 = auVar372._4_4_;
      fVar221 = auVar372._8_4_;
      fVar168 = auVar372._12_4_;
      pfVar6 = (float *)(lVar152 + lVar150 * (uVar146 + 1));
      pfVar7 = (float *)(lVar152 + lVar150 * (uVar146 + 2));
      pfVar8 = (float *)(lVar152 + lVar150 * (uVar146 + 3));
      uVar147 = (uint)pGVar33[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar150 = (long)(int)uVar147 * 0x44;
      local_690 = (undefined1  [8])
                  CONCAT44(fVar217 * pfVar1[1] + fVar358 * pfVar5[1],
                           fVar188 * *pfVar1 + fVar200 * *pfVar5);
      uStack_688._0_4_ = fVar258 * pfVar1[2] + fVar221 * pfVar5[2];
      uStack_688._4_4_ = fVar219 * pfVar1[3] + fVar168 * pfVar5[3];
      local_3f0._0_8_ =
           CONCAT44(fVar358 * pfVar6[1] + fVar217 * pfVar2[1],fVar200 * *pfVar6 + fVar188 * *pfVar2)
      ;
      local_3f0._8_4_ = fVar221 * pfVar6[2] + fVar258 * pfVar2[2];
      local_3f0._12_4_ = fVar168 * pfVar6[3] + fVar219 * pfVar2[3];
      local_400._0_8_ =
           CONCAT44(fVar358 * pfVar7[1] + fVar217 * pfVar3[1],fVar200 * *pfVar7 + fVar188 * *pfVar3)
      ;
      local_400._8_4_ = fVar221 * pfVar7[2] + fVar258 * pfVar3[2];
      local_400._12_4_ = fVar168 * pfVar7[3] + fVar219 * pfVar3[3];
      local_410._0_8_ =
           CONCAT44(fVar358 * pfVar8[1] + fVar217 * pfVar4[1],fVar200 * *pfVar8 + fVar188 * *pfVar4)
      ;
      local_410._8_4_ = fVar221 * pfVar8[2] + fVar258 * pfVar4[2];
      local_410._12_4_ = fVar168 * pfVar8[3] + fVar219 * pfVar4[3];
      aVar12 = (local_7e8->org).field_0;
      auVar206 = vsubps_avx(_local_690,(undefined1  [16])aVar12);
      auVar14 = _local_690;
      auVar372 = vshufps_avx(auVar206,auVar206,0);
      auVar205 = vshufps_avx(auVar206,auVar206,0x55);
      auVar206 = vshufps_avx(auVar206,auVar206,0xaa);
      fVar200 = (local_788->ray_space).vx.field_0.m128[0];
      fVar188 = (local_788->ray_space).vx.field_0.m128[1];
      fVar217 = (local_788->ray_space).vx.field_0.m128[2];
      fVar258 = (local_788->ray_space).vx.field_0.m128[3];
      fVar219 = (local_788->ray_space).vy.field_0.m128[0];
      fVar358 = (local_788->ray_space).vy.field_0.m128[1];
      fVar221 = (local_788->ray_space).vy.field_0.m128[2];
      fVar168 = (local_788->ray_space).vy.field_0.m128[3];
      fVar223 = (local_788->ray_space).vz.field_0.m128[0];
      fVar225 = (local_788->ray_space).vz.field_0.m128[1];
      fVar227 = (local_788->ray_space).vz.field_0.m128[2];
      fVar229 = (local_788->ray_space).vz.field_0.m128[3];
      auVar203._0_8_ =
           CONCAT44(auVar372._4_4_ * fVar188 + auVar206._4_4_ * fVar225 + auVar205._4_4_ * fVar358,
                    auVar372._0_4_ * fVar200 + auVar206._0_4_ * fVar223 + auVar205._0_4_ * fVar219);
      auVar203._8_4_ =
           auVar372._8_4_ * fVar217 + auVar206._8_4_ * fVar227 + auVar205._8_4_ * fVar221;
      auVar203._12_4_ =
           auVar372._12_4_ * fVar258 + auVar206._12_4_ * fVar229 + auVar205._12_4_ * fVar168;
      auVar372 = vblendps_avx(auVar203,_local_690,8);
      auVar207 = vsubps_avx(local_3f0,(undefined1  [16])aVar12);
      auVar205 = vshufps_avx(auVar207,auVar207,0);
      auVar206 = vshufps_avx(auVar207,auVar207,0x55);
      auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
      auVar279._0_4_ =
           auVar205._0_4_ * fVar200 + auVar206._0_4_ * fVar219 + auVar207._0_4_ * fVar223;
      auVar279._4_4_ =
           auVar205._4_4_ * fVar188 + auVar206._4_4_ * fVar358 + auVar207._4_4_ * fVar225;
      auVar279._8_4_ =
           auVar205._8_4_ * fVar217 + auVar206._8_4_ * fVar221 + auVar207._8_4_ * fVar227;
      auVar279._12_4_ =
           auVar205._12_4_ * fVar258 + auVar206._12_4_ * fVar168 + auVar207._12_4_ * fVar229;
      auVar205 = vblendps_avx(auVar279,local_3f0,8);
      auVar45 = vsubps_avx(local_400,(undefined1  [16])aVar12);
      auVar206 = vshufps_avx(auVar45,auVar45,0);
      auVar207 = vshufps_avx(auVar45,auVar45,0x55);
      auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
      auVar294._0_4_ = auVar206._0_4_ * fVar200 + auVar45._0_4_ * fVar223 + auVar207._0_4_ * fVar219
      ;
      auVar294._4_4_ = auVar206._4_4_ * fVar188 + auVar45._4_4_ * fVar225 + auVar207._4_4_ * fVar358
      ;
      auVar294._8_4_ = auVar206._8_4_ * fVar217 + auVar45._8_4_ * fVar227 + auVar207._8_4_ * fVar221
      ;
      auVar294._12_4_ =
           auVar206._12_4_ * fVar258 + auVar45._12_4_ * fVar229 + auVar207._12_4_ * fVar168;
      auVar206 = vblendps_avx(auVar294,local_400,8);
      auVar13 = vsubps_avx(local_410,(undefined1  [16])aVar12);
      auVar207 = vshufps_avx(auVar13,auVar13,0);
      auVar45 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar173._0_4_ = auVar207._0_4_ * fVar200 + auVar13._0_4_ * fVar223 + auVar45._0_4_ * fVar219;
      auVar173._4_4_ = auVar207._4_4_ * fVar188 + auVar13._4_4_ * fVar225 + auVar45._4_4_ * fVar358;
      auVar173._8_4_ = auVar207._8_4_ * fVar217 + auVar13._8_4_ * fVar227 + auVar45._8_4_ * fVar221;
      auVar173._12_4_ =
           auVar207._12_4_ * fVar258 + auVar13._12_4_ * fVar229 + auVar45._12_4_ * fVar168;
      auVar207 = vblendps_avx(auVar173,local_410,8);
      auVar231._8_4_ = 0x7fffffff;
      auVar231._0_8_ = 0x7fffffff7fffffff;
      auVar231._12_4_ = 0x7fffffff;
      auVar372 = vandps_avx(auVar372,auVar231);
      auVar205 = vandps_avx(auVar205,auVar231);
      auVar45 = vmaxps_avx(auVar372,auVar205);
      auVar372 = vandps_avx(auVar206,auVar231);
      auVar205 = vandps_avx(auVar207,auVar231);
      auVar372 = vmaxps_avx(auVar372,auVar205);
      auVar372 = vmaxps_avx(auVar45,auVar372);
      auVar205 = vmovshdup_avx(auVar372);
      auVar205 = vmaxss_avx(auVar205,auVar372);
      auVar372 = vshufpd_avx(auVar372,auVar372,1);
      auVar372 = vmaxss_avx(auVar372,auVar205);
      fVar168 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar150 + 0x908);
      fVar223 = *(float *)(catmullrom_basis0 + lVar150 + 0x90c);
      fVar227 = *(float *)(catmullrom_basis0 + lVar150 + 0x910);
      fVar229 = *(float *)(catmullrom_basis0 + lVar150 + 0x914);
      fVar237 = *(float *)(catmullrom_basis0 + lVar150 + 0x918);
      fVar238 = *(float *)(catmullrom_basis0 + lVar150 + 0x91c);
      fVar239 = *(float *)(catmullrom_basis0 + lVar150 + 0x920);
      auVar139 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar150 + 0x908);
      local_760._0_16_ = auVar294;
      auVar205 = vshufps_avx(auVar294,auVar294,0);
      register0x00001250 = auVar205;
      _local_580 = auVar205;
      auVar206 = vshufps_avx(auVar294,auVar294,0x55);
      register0x00001290 = auVar206;
      _local_5e0 = auVar206;
      fVar241 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar150 + 0xd8c);
      fVar242 = *(float *)(catmullrom_basis0 + lVar150 + 0xd90);
      fVar243 = *(float *)(catmullrom_basis0 + lVar150 + 0xd94);
      fVar246 = *(float *)(catmullrom_basis0 + lVar150 + 0xd98);
      fVar255 = *(float *)(catmullrom_basis0 + lVar150 + 0xd9c);
      fVar256 = *(float *)(catmullrom_basis0 + lVar150 + 0xda0);
      fVar257 = *(float *)(catmullrom_basis0 + lVar150 + 0xda4);
      auVar138 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar150 + 0xd8c);
      auVar207 = vshufps_avx(auVar173,auVar173,0);
      register0x00001550 = auVar207;
      _local_3c0 = auVar207;
      fVar307 = auVar207._0_4_;
      fVar317 = auVar207._4_4_;
      fVar318 = auVar207._8_4_;
      fVar319 = auVar207._12_4_;
      fVar170 = auVar205._0_4_;
      fVar184 = auVar205._4_4_;
      fVar185 = auVar205._8_4_;
      fVar187 = auVar205._12_4_;
      auVar205 = vshufps_avx(auVar173,auVar173,0x55);
      register0x00001250 = auVar205;
      _local_600 = auVar205;
      fVar200 = auVar205._0_4_;
      fVar258 = auVar205._4_4_;
      fVar221 = auVar205._8_4_;
      fVar225 = auVar205._12_4_;
      fVar190 = auVar206._0_4_;
      fVar169 = auVar206._4_4_;
      fVar264 = auVar206._8_4_;
      fVar272 = auVar206._12_4_;
      auVar15 = local_400;
      auVar205 = vshufps_avx(local_400,local_400,0xff);
      register0x00001310 = auVar205;
      _local_a0 = auVar205;
      auVar13 = local_410;
      auVar206 = vshufps_avx(local_410,local_410,0xff);
      register0x00001390 = auVar206;
      _local_c0 = auVar206;
      fVar188 = auVar206._0_4_;
      fVar217 = auVar206._4_4_;
      fVar219 = auVar206._8_4_;
      fVar358 = auVar206._12_4_;
      fVar273 = auVar205._0_4_;
      fVar274 = auVar205._4_4_;
      fVar275 = auVar205._8_4_;
      auVar206 = vshufps_avx(auVar279,auVar279,0);
      local_640._16_16_ = auVar206;
      local_640._0_16_ = auVar206;
      fVar259 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar150 + 0x484);
      fVar260 = *(float *)(catmullrom_basis0 + lVar150 + 0x488);
      fVar261 = *(float *)(catmullrom_basis0 + lVar150 + 0x48c);
      fVar337 = *(float *)(catmullrom_basis0 + lVar150 + 0x490);
      fVar186 = *(float *)(catmullrom_basis0 + lVar150 + 0x494);
      fVar338 = *(float *)(catmullrom_basis0 + lVar150 + 0x498);
      fVar262 = *(float *)(catmullrom_basis0 + lVar150 + 0x49c);
      auVar140 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar150 + 0x484);
      fVar339 = *(float *)(catmullrom_basis0 + lVar150 + 0x4a0);
      fVar293 = auVar206._0_4_;
      fVar302 = auVar206._4_4_;
      fVar303 = auVar206._8_4_;
      fVar304 = auVar206._12_4_;
      auVar207 = vshufps_avx(auVar279,auVar279,0x55);
      register0x000015d0 = auVar207;
      _local_4e0 = auVar207;
      fVar366 = auVar207._0_4_;
      fVar369 = auVar207._4_4_;
      fVar370 = auVar207._8_4_;
      fVar371 = auVar207._12_4_;
      auVar16 = local_3f0;
      auVar207 = vshufps_avx(local_3f0,local_3f0,0xff);
      register0x00001590 = auVar207;
      _local_160 = auVar207;
      fVar320 = auVar207._0_4_;
      fVar321 = auVar207._4_4_;
      fVar322 = auVar207._8_4_;
      fVar355 = auVar207._12_4_;
      auVar131._8_4_ = auVar203._8_4_;
      auVar131._0_8_ = auVar203._0_8_;
      auVar131._12_4_ = auVar203._12_4_;
      auVar207 = vshufps_avx(auVar131,auVar131,0);
      register0x000014d0 = auVar207;
      _local_180 = auVar207;
      local_340 = *(float *)(catmullrom_basis0 + lVar150);
      fStack_33c = *(float *)(catmullrom_basis0 + lVar150 + 4);
      fStack_338 = *(float *)(catmullrom_basis0 + lVar150 + 8);
      fStack_334 = *(float *)(catmullrom_basis0 + lVar150 + 0xc);
      fStack_330 = *(float *)(catmullrom_basis0 + lVar150 + 0x10);
      fStack_32c = *(float *)(catmullrom_basis0 + lVar150 + 0x14);
      fStack_328 = *(float *)(catmullrom_basis0 + lVar150 + 0x18);
      fVar289 = auVar207._0_4_;
      fVar290 = auVar207._4_4_;
      fVar291 = auVar207._8_4_;
      fVar292 = auVar207._12_4_;
      auVar344._0_4_ =
           fVar289 * local_340 + fVar293 * fVar259 + fVar170 * fVar168 + fVar307 * fVar241;
      auVar344._4_4_ =
           fVar290 * fStack_33c + fVar302 * fVar260 + fVar184 * fVar223 + fVar317 * fVar242;
      auVar344._8_4_ =
           fVar291 * fStack_338 + fVar303 * fVar261 + fVar185 * fVar227 + fVar318 * fVar243;
      auVar344._12_4_ =
           fVar292 * fStack_334 + fVar304 * fVar337 + fVar187 * fVar229 + fVar319 * fVar246;
      auVar344._16_4_ =
           fVar289 * fStack_330 + fVar293 * fVar186 + fVar170 * fVar237 + fVar307 * fVar255;
      auVar344._20_4_ =
           fVar290 * fStack_32c + fVar302 * fVar338 + fVar184 * fVar238 + fVar317 * fVar256;
      auVar344._24_4_ =
           fVar291 * fStack_328 + fVar303 * fVar262 + fVar185 * fVar239 + fVar318 * fVar257;
      auVar344._28_4_ = fVar339 + fVar187 + 0.0 + 0.0;
      auVar207 = vshufps_avx(auVar131,auVar131,0x55);
      register0x000013d0 = auVar207;
      _local_3a0 = auVar207;
      fVar276 = auVar207._0_4_;
      fVar277 = auVar207._4_4_;
      fVar278 = auVar207._8_4_;
      fVar288 = auVar207._12_4_;
      auVar312._0_4_ =
           fVar276 * local_340 + fVar366 * fVar259 + fVar190 * fVar168 + fVar241 * fVar200;
      auVar312._4_4_ =
           fVar277 * fStack_33c + fVar369 * fVar260 + fVar169 * fVar223 + fVar242 * fVar258;
      auVar312._8_4_ =
           fVar278 * fStack_338 + fVar370 * fVar261 + fVar264 * fVar227 + fVar243 * fVar221;
      auVar312._12_4_ =
           fVar288 * fStack_334 + fVar371 * fVar337 + fVar272 * fVar229 + fVar246 * fVar225;
      auVar312._16_4_ =
           fVar276 * fStack_330 + fVar366 * fVar186 + fVar190 * fVar237 + fVar255 * fVar200;
      auVar312._20_4_ =
           fVar277 * fStack_32c + fVar369 * fVar338 + fVar169 * fVar238 + fVar256 * fVar258;
      auVar312._24_4_ =
           fVar278 * fStack_328 + fVar370 * fVar262 + fVar264 * fVar239 + fVar257 * fVar221;
      auVar312._28_4_ = fVar272 + fVar225 + 0.0 + 0.0;
      auVar207 = vpermilps_avx(_local_690,0xff);
      register0x00001490 = auVar207;
      _local_e0 = auVar207;
      fStack_324 = (float)*(undefined4 *)(catmullrom_basis0 + lVar150 + 0x1c);
      fVar240 = auVar207._0_4_;
      fVar286 = auVar207._4_4_;
      fVar287 = auVar207._8_4_;
      local_7e0 = (undefined1  [4])
                  (fVar240 * local_340 + fVar320 * fVar259 + fVar273 * fVar168 + fVar241 * fVar188);
      auStack_7dc._0_4_ =
           fVar286 * fStack_33c + fVar321 * fVar260 + fVar274 * fVar223 + fVar242 * fVar217;
      auStack_7dc._4_4_ =
           fVar287 * fStack_338 + fVar322 * fVar261 + fVar275 * fVar227 + fVar243 * fVar219;
      fStack_7d4 = auVar207._12_4_ * fStack_334 +
                   fVar355 * fVar337 + auVar205._12_4_ * fVar229 + fVar246 * fVar358;
      fStack_7d0 = fVar240 * fStack_330 + fVar320 * fVar186 + fVar273 * fVar237 + fVar255 * fVar188;
      fStack_7cc = fVar286 * fStack_32c + fVar321 * fVar338 + fVar274 * fVar238 + fVar256 * fVar217;
      fStack_7c8 = fVar287 * fStack_328 + fVar322 * fVar262 + fVar275 * fVar239 + fVar257 * fVar219;
      register0x0000121c = 0;
      fVar246 = *(float *)(catmullrom_basis1 + lVar150 + 0x908);
      fVar255 = *(float *)(catmullrom_basis1 + lVar150 + 0x90c);
      fVar256 = *(float *)(catmullrom_basis1 + lVar150 + 0x910);
      fVar257 = *(float *)(catmullrom_basis1 + lVar150 + 0x914);
      fVar259 = *(float *)(catmullrom_basis1 + lVar150 + 0x918);
      fVar260 = *(float *)(catmullrom_basis1 + lVar150 + 0x91c);
      fVar261 = *(float *)(catmullrom_basis1 + lVar150 + 0x920);
      fVar337 = *(float *)(catmullrom_basis1 + lVar150 + 0xd8c);
      fVar186 = *(float *)(catmullrom_basis1 + lVar150 + 0xd90);
      fVar338 = *(float *)(catmullrom_basis1 + lVar150 + 0xd94);
      fVar262 = *(float *)(catmullrom_basis1 + lVar150 + 0xd98);
      fVar166 = *(float *)(catmullrom_basis1 + lVar150 + 0xd9c);
      fVar245 = *(float *)(catmullrom_basis1 + lVar150 + 0xda0);
      fVar189 = *(float *)(catmullrom_basis1 + lVar150 + 0xda4);
      fVar263 = *(float *)(catmullrom_basis1 + lVar150 + 0x484);
      fVar323 = *(float *)(catmullrom_basis1 + lVar150 + 0x488);
      fVar167 = *(float *)(catmullrom_basis1 + lVar150 + 0x48c);
      fVar201 = *(float *)(catmullrom_basis1 + lVar150 + 0x490);
      fVar218 = *(float *)(catmullrom_basis1 + lVar150 + 0x494);
      fVar220 = *(float *)(catmullrom_basis1 + lVar150 + 0x498);
      fVar222 = *(float *)(catmullrom_basis1 + lVar150 + 0x49c);
      fVar223 = fVar319 + 0.0;
      fVar224 = *(float *)(catmullrom_basis1 + lVar150);
      fVar226 = *(float *)(catmullrom_basis1 + lVar150 + 4);
      fVar228 = *(float *)(catmullrom_basis1 + lVar150 + 8);
      fVar199 = *(float *)(catmullrom_basis1 + lVar150 + 0xc);
      fVar244 = *(float *)(catmullrom_basis1 + lVar150 + 0x10);
      fVar305 = *(float *)(catmullrom_basis1 + lVar150 + 0x14);
      fVar306 = *(float *)(catmullrom_basis1 + lVar150 + 0x18);
      auVar232._0_4_ = fVar289 * fVar224 + fVar293 * fVar263 + fVar246 * fVar170 + fVar307 * fVar337
      ;
      auVar232._4_4_ = fVar290 * fVar226 + fVar302 * fVar323 + fVar255 * fVar184 + fVar317 * fVar186
      ;
      auVar232._8_4_ = fVar291 * fVar228 + fVar303 * fVar167 + fVar256 * fVar185 + fVar318 * fVar338
      ;
      auVar232._12_4_ =
           fVar292 * fVar199 + fVar304 * fVar201 + fVar257 * fVar187 + fVar319 * fVar262;
      auVar232._16_4_ =
           fVar289 * fVar244 + fVar293 * fVar218 + fVar259 * fVar170 + fVar307 * fVar166;
      auVar232._20_4_ =
           fVar290 * fVar305 + fVar302 * fVar220 + fVar260 * fVar184 + fVar317 * fVar245;
      auVar232._24_4_ =
           fVar291 * fVar306 + fVar303 * fVar222 + fVar261 * fVar185 + fVar318 * fVar189;
      auVar232._28_4_ = fVar355 + fVar223;
      auVar212._0_4_ = fVar276 * fVar224 + fVar366 * fVar263 + fVar246 * fVar190 + fVar337 * fVar200
      ;
      auVar212._4_4_ = fVar277 * fVar226 + fVar369 * fVar323 + fVar255 * fVar169 + fVar186 * fVar258
      ;
      auVar212._8_4_ = fVar278 * fVar228 + fVar370 * fVar167 + fVar256 * fVar264 + fVar338 * fVar221
      ;
      auVar212._12_4_ =
           fVar288 * fVar199 + fVar371 * fVar201 + fVar257 * fVar272 + fVar262 * fVar225;
      auVar212._16_4_ =
           fVar276 * fVar244 + fVar366 * fVar218 + fVar259 * fVar190 + fVar166 * fVar200;
      auVar212._20_4_ =
           fVar277 * fVar305 + fVar369 * fVar220 + fVar260 * fVar169 + fVar245 * fVar258;
      auVar212._24_4_ =
           fVar278 * fVar306 + fVar370 * fVar222 + fVar261 * fVar264 + fVar189 * fVar221;
      auVar212._28_4_ = fVar223 + fVar319 + fVar339 + 0.0;
      local_6c0._0_4_ =
           fVar320 * fVar263 + fVar273 * fVar246 + fVar188 * fVar337 + fVar240 * fVar224;
      local_6c0._4_4_ =
           fVar321 * fVar323 + fVar274 * fVar255 + fVar217 * fVar186 + fVar286 * fVar226;
      local_6c0._8_4_ =
           fVar322 * fVar167 + fVar275 * fVar256 + fVar219 * fVar338 + fVar287 * fVar228;
      local_6c0._12_4_ =
           fVar355 * fVar201 + auVar205._12_4_ * fVar257 + fVar358 * fVar262 +
           auVar207._12_4_ * fVar199;
      local_6c0._16_4_ =
           fVar320 * fVar218 + fVar273 * fVar259 + fVar188 * fVar166 + fVar240 * fVar244;
      local_6c0._20_4_ =
           fVar321 * fVar220 + fVar274 * fVar260 + fVar217 * fVar245 + fVar286 * fVar305;
      local_6c0._24_4_ =
           fVar322 * fVar222 + fVar275 * fVar261 + fVar219 * fVar189 + fVar287 * fVar306;
      local_6c0._28_4_ = fVar319 + fVar358 + fVar339 + fVar223;
      auVar38 = vsubps_avx(auVar232,auVar344);
      auVar39 = vsubps_avx(auVar212,auVar312);
      _auStack_430 = auVar39._16_16_;
      fVar188 = auVar38._0_4_;
      fVar219 = auVar38._4_4_;
      auVar47._4_4_ = auVar312._4_4_ * fVar219;
      auVar47._0_4_ = auVar312._0_4_ * fVar188;
      fVar168 = auVar38._8_4_;
      auVar47._8_4_ = auVar312._8_4_ * fVar168;
      fVar227 = auVar38._12_4_;
      auVar47._12_4_ = auVar312._12_4_ * fVar227;
      fVar237 = auVar38._16_4_;
      auVar47._16_4_ = auVar312._16_4_ * fVar237;
      fVar239 = auVar38._20_4_;
      auVar47._20_4_ = auVar312._20_4_ * fVar239;
      fVar242 = auVar38._24_4_;
      auVar47._24_4_ = auVar312._24_4_ * fVar242;
      auVar47._28_4_ = fVar223;
      fVar217 = auVar39._0_4_;
      fVar358 = auVar39._4_4_;
      auVar48._4_4_ = auVar344._4_4_ * fVar358;
      auVar48._0_4_ = auVar344._0_4_ * fVar217;
      fVar223 = auVar39._8_4_;
      auVar48._8_4_ = auVar344._8_4_ * fVar223;
      fVar229 = auVar39._12_4_;
      auVar48._12_4_ = auVar344._12_4_ * fVar229;
      fVar238 = auVar39._16_4_;
      auVar48._16_4_ = auVar344._16_4_ * fVar238;
      fVar241 = auVar39._20_4_;
      auVar48._20_4_ = auVar344._20_4_ * fVar241;
      fVar243 = auVar39._24_4_;
      auVar48._24_4_ = auVar344._24_4_ * fVar243;
      auVar48._28_4_ = auVar212._28_4_;
      auVar37 = vsubps_avx(auVar47,auVar48);
      auVar155 = vmaxps_avx(_local_7e0,local_6c0._0_32_);
      auVar49._4_4_ = auVar155._4_4_ * auVar155._4_4_ * (fVar219 * fVar219 + fVar358 * fVar358);
      auVar49._0_4_ = auVar155._0_4_ * auVar155._0_4_ * (fVar188 * fVar188 + fVar217 * fVar217);
      auVar49._8_4_ = auVar155._8_4_ * auVar155._8_4_ * (fVar168 * fVar168 + fVar223 * fVar223);
      auVar49._12_4_ = auVar155._12_4_ * auVar155._12_4_ * (fVar227 * fVar227 + fVar229 * fVar229);
      auVar49._16_4_ = auVar155._16_4_ * auVar155._16_4_ * (fVar237 * fVar237 + fVar238 * fVar238);
      auVar49._20_4_ = auVar155._20_4_ * auVar155._20_4_ * (fVar239 * fVar239 + fVar241 * fVar241);
      auVar49._24_4_ = auVar155._24_4_ * auVar155._24_4_ * (fVar242 * fVar242 + fVar243 * fVar243);
      auVar49._28_4_ = auVar232._28_4_ + auVar212._28_4_;
      auVar50._4_4_ = auVar37._4_4_ * auVar37._4_4_;
      auVar50._0_4_ = auVar37._0_4_ * auVar37._0_4_;
      auVar50._8_4_ = auVar37._8_4_ * auVar37._8_4_;
      auVar50._12_4_ = auVar37._12_4_ * auVar37._12_4_;
      auVar50._16_4_ = auVar37._16_4_ * auVar37._16_4_;
      auVar50._20_4_ = auVar37._20_4_ * auVar37._20_4_;
      auVar50._24_4_ = auVar37._24_4_ * auVar37._24_4_;
      auVar50._28_4_ = auVar37._28_4_;
      auVar155 = vcmpps_avx(auVar50,auVar49,2);
      auVar204._0_4_ = (float)(int)uVar147;
      auVar204._4_12_ = auVar206._4_12_;
      _local_3e0 = auVar204;
      auVar205 = vshufps_avx(auVar204,auVar204,0);
      auVar213._16_16_ = auVar205;
      auVar213._0_16_ = auVar205;
      auVar37 = vcmpps_avx(_DAT_02020f40,auVar213,1);
      auVar132._8_4_ = auVar203._8_4_;
      auVar132._0_8_ = auVar203._0_8_;
      auVar132._12_4_ = auVar203._12_4_;
      auVar205 = vpermilps_avx(auVar132,0xaa);
      auVar345._16_16_ = auVar205;
      auVar345._0_16_ = auVar205;
      auVar206 = vpermilps_avx(auVar279,0xaa);
      register0x00001550 = auVar206;
      _local_320 = auVar206;
      auVar207 = vpermilps_avx(auVar294,0xaa);
      register0x00001590 = auVar207;
      _local_100 = auVar207;
      auVar45 = vpermilps_avx(auVar173,0xaa);
      register0x00001310 = auVar45;
      _local_540 = auVar45;
      auVar40 = auVar37 & auVar155;
      local_7c0 = *(uint *)((long)&(local_7e8->org).field_0 + 0xc);
      uStack_7bc = 0;
      fStack_7b8 = 0.0;
      fStack_7b4 = 0.0;
      auVar372 = ZEXT416((uint)(auVar372._0_4_ * 4.7683716e-07));
      ray = local_7e8;
      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar40 >> 0x7f,0) == '\0') &&
            (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar40 >> 0xbf,0) == '\0') &&
          (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar40[0x1f])
      {
        uVar151 = 0;
        auVar362 = ZEXT3264(local_640);
      }
      else {
        auVar155 = vandps_avx(auVar155,auVar37);
        fVar286 = auVar205._0_4_;
        fVar287 = auVar205._4_4_;
        fVar320 = auVar205._8_4_;
        fVar321 = auVar205._12_4_;
        fVar322 = auVar206._0_4_;
        fVar355 = auVar206._4_4_;
        fVar356 = auVar206._8_4_;
        fVar357 = auVar206._12_4_;
        fVar359 = auVar207._0_4_;
        fVar363 = auVar207._4_4_;
        fVar364 = auVar207._8_4_;
        fVar365 = auVar207._12_4_;
        fVar273 = auVar45._0_4_;
        fVar274 = auVar45._4_4_;
        fVar275 = auVar45._8_4_;
        fVar240 = auVar45._12_4_;
        fVar188 = auVar37._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar150 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar150 + 0x4a0);
        local_760._0_16_ = auVar372;
        local_480 = fVar286 * fVar224 + fVar322 * fVar263 + fVar359 * fVar246 + fVar273 * fVar337;
        fStack_47c = fVar287 * fVar226 + fVar355 * fVar323 + fVar363 * fVar255 + fVar274 * fVar186;
        fStack_478 = fVar320 * fVar228 + fVar356 * fVar167 + fVar364 * fVar256 + fVar275 * fVar338;
        fStack_474 = fVar321 * fVar199 + fVar357 * fVar201 + fVar365 * fVar257 + fVar240 * fVar262;
        fStack_470 = fVar286 * fVar244 + fVar322 * fVar218 + fVar359 * fVar259 + fVar273 * fVar166;
        fStack_46c = fVar287 * fVar305 + fVar355 * fVar220 + fVar363 * fVar260 + fVar274 * fVar245;
        fStack_468 = fVar320 * fVar306 + fVar356 * fVar222 + fVar364 * fVar261 + fVar275 * fVar189;
        fStack_464 = auVar155._28_4_ + fVar188;
        local_460._0_4_ = auVar140._0_4_;
        local_460._4_4_ = auVar140._4_4_;
        fStack_458 = auVar140._8_4_;
        fStack_454 = auVar140._12_4_;
        fStack_450 = auVar140._16_4_;
        fStack_44c = auVar140._20_4_;
        fStack_448 = auVar140._24_4_;
        local_520._0_4_ = auVar139._0_4_;
        local_520._4_4_ = auVar139._4_4_;
        fStack_518 = auVar139._8_4_;
        fStack_514 = auVar139._12_4_;
        fStack_510 = auVar139._16_4_;
        fStack_50c = auVar139._20_4_;
        fStack_508 = auVar139._24_4_;
        local_5c0._0_4_ = auVar138._0_4_;
        local_5c0._4_4_ = auVar138._4_4_;
        fStack_5b8 = auVar138._8_4_;
        fStack_5b4 = auVar138._12_4_;
        fStack_5b0 = auVar138._16_4_;
        fStack_5ac = auVar138._20_4_;
        fStack_5a8 = auVar138._24_4_;
        local_520._0_4_ =
             fVar286 * local_340 +
             fVar322 * (float)local_460._0_4_ +
             fVar359 * (float)local_520._0_4_ + fVar273 * (float)local_5c0._0_4_;
        local_520._4_4_ =
             fVar287 * fStack_33c +
             fVar355 * (float)local_460._4_4_ +
             fVar363 * (float)local_520._4_4_ + fVar274 * (float)local_5c0._4_4_;
        fStack_518 = fVar320 * fStack_338 +
                     fVar356 * fStack_458 + fVar364 * fStack_518 + fVar275 * fStack_5b8;
        fStack_514 = fVar321 * fStack_334 +
                     fVar357 * fStack_454 + fVar365 * fStack_514 + fVar240 * fStack_5b4;
        fStack_510 = fVar286 * fStack_330 +
                     fVar322 * fStack_450 + fVar359 * fStack_510 + fVar273 * fStack_5b0;
        fStack_50c = fVar287 * fStack_32c +
                     fVar355 * fStack_44c + fVar363 * fStack_50c + fVar274 * fStack_5ac;
        fStack_508 = fVar320 * fStack_328 +
                     fVar356 * fStack_448 + fVar364 * fStack_508 + fVar275 * fStack_5a8;
        fStack_504 = fStack_464 + fVar188 + auVar155._28_4_ + auVar37._28_4_;
        fVar188 = *(float *)(catmullrom_basis0 + lVar150 + 0x1210);
        fVar217 = *(float *)(catmullrom_basis0 + lVar150 + 0x1214);
        fVar219 = *(float *)(catmullrom_basis0 + lVar150 + 0x1218);
        fVar358 = *(float *)(catmullrom_basis0 + lVar150 + 0x121c);
        fVar168 = *(float *)(catmullrom_basis0 + lVar150 + 0x1220);
        fVar223 = *(float *)(catmullrom_basis0 + lVar150 + 0x1224);
        fVar227 = *(float *)(catmullrom_basis0 + lVar150 + 0x1228);
        fVar229 = *(float *)(catmullrom_basis0 + lVar150 + 0x1694);
        fVar237 = *(float *)(catmullrom_basis0 + lVar150 + 0x1698);
        fVar238 = *(float *)(catmullrom_basis0 + lVar150 + 0x169c);
        fVar239 = *(float *)(catmullrom_basis0 + lVar150 + 0x16a0);
        fVar241 = *(float *)(catmullrom_basis0 + lVar150 + 0x16a4);
        fVar242 = *(float *)(catmullrom_basis0 + lVar150 + 0x16a8);
        fVar243 = *(float *)(catmullrom_basis0 + lVar150 + 0x16ac);
        fVar246 = *(float *)(catmullrom_basis0 + lVar150 + 0x1b18);
        fVar255 = *(float *)(catmullrom_basis0 + lVar150 + 0x1b1c);
        fVar256 = *(float *)(catmullrom_basis0 + lVar150 + 0x1b20);
        fVar257 = *(float *)(catmullrom_basis0 + lVar150 + 0x1b24);
        fVar259 = *(float *)(catmullrom_basis0 + lVar150 + 0x1b28);
        fVar260 = *(float *)(catmullrom_basis0 + lVar150 + 0x1b2c);
        fVar261 = *(float *)(catmullrom_basis0 + lVar150 + 0x1b30);
        fVar337 = *(float *)(catmullrom_basis0 + lVar150 + 0x1f9c);
        fVar186 = *(float *)(catmullrom_basis0 + lVar150 + 0x1fa0);
        fVar338 = *(float *)(catmullrom_basis0 + lVar150 + 0x1fa4);
        fVar262 = *(float *)(catmullrom_basis0 + lVar150 + 0x1fa8);
        fVar339 = *(float *)(catmullrom_basis0 + lVar150 + 0x1fac);
        fVar166 = *(float *)(catmullrom_basis0 + lVar150 + 0x1fb0);
        fVar245 = *(float *)(catmullrom_basis0 + lVar150 + 0x1fb4);
        fVar263 = auVar312._28_4_ + *(float *)(catmullrom_basis1 + lVar150 + 0x4a0);
        fVar189 = *(float *)(catmullrom_basis0 + lVar150 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar150 + 0x1fb8);
        fVar323 = *(float *)(catmullrom_basis0 + lVar150 + 0x16b0) + fVar189;
        local_460._4_4_ =
             fVar290 * fVar217 + fVar302 * fVar237 + fVar184 * fVar255 + fVar317 * fVar186;
        local_460._0_4_ =
             fVar289 * fVar188 + fVar293 * fVar229 + fVar170 * fVar246 + fVar307 * fVar337;
        fStack_458 = fVar291 * fVar219 + fVar303 * fVar238 + fVar185 * fVar256 + fVar318 * fVar338;
        fStack_454 = fVar292 * fVar358 + fVar304 * fVar239 + fVar187 * fVar257 + fVar319 * fVar262;
        fStack_450 = fVar289 * fVar168 + fVar293 * fVar241 + fVar170 * fVar259 + fVar307 * fVar339;
        fStack_44c = fVar290 * fVar223 + fVar302 * fVar242 + fVar184 * fVar260 + fVar317 * fVar166;
        fStack_448 = fVar291 * fVar227 + fVar303 * fVar243 + fVar185 * fVar261 + fVar318 * fVar245;
        fStack_444 = *(float *)(catmullrom_basis0 + lVar150 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar150 + 0x1fb8) + fVar263;
        auVar179._0_4_ =
             fVar276 * fVar188 + fVar190 * fVar246 + fVar200 * fVar337 + fVar366 * fVar229;
        auVar179._4_4_ =
             fVar277 * fVar217 + fVar169 * fVar255 + fVar258 * fVar186 + fVar369 * fVar237;
        auVar179._8_4_ =
             fVar278 * fVar219 + fVar264 * fVar256 + fVar221 * fVar338 + fVar370 * fVar238;
        auVar179._12_4_ =
             fVar288 * fVar358 + fVar272 * fVar257 + fVar225 * fVar262 + fVar371 * fVar239;
        auVar179._16_4_ =
             fVar276 * fVar168 + fVar190 * fVar259 + fVar200 * fVar339 + fVar366 * fVar241;
        auVar179._20_4_ =
             fVar277 * fVar223 + fVar169 * fVar260 + fVar258 * fVar166 + fVar369 * fVar242;
        auVar179._24_4_ =
             fVar278 * fVar227 + fVar264 * fVar261 + fVar221 * fVar245 + fVar370 * fVar243;
        auVar179._28_4_ =
             fVar189 + auVar312._28_4_ + *(float *)(catmullrom_basis1 + lVar150 + 0x1c) + fVar263;
        auVar249._0_4_ =
             fVar322 * fVar229 + fVar359 * fVar246 + fVar273 * fVar337 + fVar286 * fVar188;
        auVar249._4_4_ =
             fVar355 * fVar237 + fVar363 * fVar255 + fVar274 * fVar186 + fVar287 * fVar217;
        auVar249._8_4_ =
             fVar356 * fVar238 + fVar364 * fVar256 + fVar275 * fVar338 + fVar320 * fVar219;
        auVar249._12_4_ =
             fVar357 * fVar239 + fVar365 * fVar257 + fVar240 * fVar262 + fVar321 * fVar358;
        auVar249._16_4_ =
             fVar322 * fVar241 + fVar359 * fVar259 + fVar273 * fVar339 + fVar286 * fVar168;
        auVar249._20_4_ =
             fVar355 * fVar242 + fVar363 * fVar260 + fVar274 * fVar166 + fVar287 * fVar223;
        auVar249._24_4_ =
             fVar356 * fVar243 + fVar364 * fVar261 + fVar275 * fVar245 + fVar320 * fVar227;
        auVar249._28_4_ = fVar323 + *(float *)(catmullrom_basis0 + lVar150 + 0x122c);
        fVar188 = *(float *)(catmullrom_basis1 + lVar150 + 0x1b18);
        fVar217 = *(float *)(catmullrom_basis1 + lVar150 + 0x1b1c);
        fVar219 = *(float *)(catmullrom_basis1 + lVar150 + 0x1b20);
        fVar358 = *(float *)(catmullrom_basis1 + lVar150 + 0x1b24);
        fVar168 = *(float *)(catmullrom_basis1 + lVar150 + 0x1b28);
        fVar223 = *(float *)(catmullrom_basis1 + lVar150 + 0x1b2c);
        fVar227 = *(float *)(catmullrom_basis1 + lVar150 + 0x1b30);
        fVar229 = *(float *)(catmullrom_basis1 + lVar150 + 0x1f9c);
        fVar237 = *(float *)(catmullrom_basis1 + lVar150 + 0x1fa0);
        fVar238 = *(float *)(catmullrom_basis1 + lVar150 + 0x1fa4);
        fVar239 = *(float *)(catmullrom_basis1 + lVar150 + 0x1fa8);
        fVar241 = *(float *)(catmullrom_basis1 + lVar150 + 0x1fac);
        fVar242 = *(float *)(catmullrom_basis1 + lVar150 + 0x1fb0);
        fVar243 = *(float *)(catmullrom_basis1 + lVar150 + 0x1fb4);
        fVar246 = *(float *)(catmullrom_basis1 + lVar150 + 0x1694);
        fVar255 = *(float *)(catmullrom_basis1 + lVar150 + 0x1698);
        fVar256 = *(float *)(catmullrom_basis1 + lVar150 + 0x169c);
        fVar257 = *(float *)(catmullrom_basis1 + lVar150 + 0x16a0);
        fVar259 = *(float *)(catmullrom_basis1 + lVar150 + 0x16a4);
        fVar260 = *(float *)(catmullrom_basis1 + lVar150 + 0x16a8);
        fVar261 = *(float *)(catmullrom_basis1 + lVar150 + 0x16ac);
        fVar337 = *(float *)(catmullrom_basis1 + lVar150 + 0x1210);
        fVar186 = *(float *)(catmullrom_basis1 + lVar150 + 0x1214);
        fVar338 = *(float *)(catmullrom_basis1 + lVar150 + 0x1218);
        fVar262 = *(float *)(catmullrom_basis1 + lVar150 + 0x121c);
        fVar339 = *(float *)(catmullrom_basis1 + lVar150 + 0x1220);
        fVar166 = *(float *)(catmullrom_basis1 + lVar150 + 0x1224);
        fVar245 = *(float *)(catmullrom_basis1 + lVar150 + 0x1228);
        auVar267._0_4_ =
             fVar289 * fVar337 + fVar293 * fVar246 + fVar170 * fVar188 + fVar307 * fVar229;
        auVar267._4_4_ =
             fVar290 * fVar186 + fVar302 * fVar255 + fVar184 * fVar217 + fVar317 * fVar237;
        auVar267._8_4_ =
             fVar291 * fVar338 + fVar303 * fVar256 + fVar185 * fVar219 + fVar318 * fVar238;
        auVar267._12_4_ =
             fVar292 * fVar262 + fVar304 * fVar257 + fVar187 * fVar358 + fVar319 * fVar239;
        auVar267._16_4_ =
             fVar289 * fVar339 + fVar293 * fVar259 + fVar170 * fVar168 + fVar307 * fVar241;
        auVar267._20_4_ =
             fVar290 * fVar166 + fVar302 * fVar260 + fVar184 * fVar223 + fVar317 * fVar242;
        auVar267._24_4_ =
             fVar291 * fVar245 + fVar303 * fVar261 + fVar185 * fVar227 + fVar318 * fVar243;
        auVar267._28_4_ = fVar272 + fVar272 + fVar323 + fVar319;
        auVar313._0_4_ =
             fVar276 * fVar337 + fVar366 * fVar246 + fVar190 * fVar188 + fVar200 * fVar229;
        auVar313._4_4_ =
             fVar277 * fVar186 + fVar369 * fVar255 + fVar169 * fVar217 + fVar258 * fVar237;
        auVar313._8_4_ =
             fVar278 * fVar338 + fVar370 * fVar256 + fVar264 * fVar219 + fVar221 * fVar238;
        auVar313._12_4_ =
             fVar288 * fVar262 + fVar371 * fVar257 + fVar272 * fVar358 + fVar225 * fVar239;
        auVar313._16_4_ =
             fVar276 * fVar339 + fVar366 * fVar259 + fVar190 * fVar168 + fVar200 * fVar241;
        auVar313._20_4_ =
             fVar277 * fVar166 + fVar369 * fVar260 + fVar169 * fVar223 + fVar258 * fVar242;
        auVar313._24_4_ =
             fVar278 * fVar245 + fVar370 * fVar261 + fVar264 * fVar227 + fVar221 * fVar243;
        auVar313._28_4_ = fVar272 + fVar272 + fVar272 + fVar323;
        _local_560 = auVar345;
        auVar198._0_4_ =
             fVar286 * fVar337 + fVar322 * fVar246 + fVar359 * fVar188 + fVar229 * fVar273;
        auVar198._4_4_ =
             fVar287 * fVar186 + fVar355 * fVar255 + fVar363 * fVar217 + fVar237 * fVar274;
        auVar198._8_4_ =
             fVar320 * fVar338 + fVar356 * fVar256 + fVar364 * fVar219 + fVar238 * fVar275;
        auVar198._12_4_ =
             fVar321 * fVar262 + fVar357 * fVar257 + fVar365 * fVar358 + fVar239 * fVar240;
        auVar198._16_4_ =
             fVar286 * fVar339 + fVar322 * fVar259 + fVar359 * fVar168 + fVar241 * fVar273;
        auVar198._20_4_ =
             fVar287 * fVar166 + fVar355 * fVar260 + fVar363 * fVar223 + fVar242 * fVar274;
        auVar198._24_4_ =
             fVar320 * fVar245 + fVar356 * fVar261 + fVar364 * fVar227 + fVar243 * fVar275;
        auVar198._28_4_ =
             *(float *)(catmullrom_basis1 + lVar150 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar150 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar150 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar150 + 0x1fb8);
        auVar233._8_4_ = 0x7fffffff;
        auVar233._0_8_ = 0x7fffffff7fffffff;
        auVar233._12_4_ = 0x7fffffff;
        auVar233._16_4_ = 0x7fffffff;
        auVar233._20_4_ = 0x7fffffff;
        auVar233._24_4_ = 0x7fffffff;
        auVar233._28_4_ = 0x7fffffff;
        auVar37 = vandps_avx(_local_460,auVar233);
        auVar40 = vandps_avx(auVar179,auVar233);
        auVar40 = vmaxps_avx(auVar37,auVar40);
        auVar37 = vandps_avx(auVar249,auVar233);
        auVar37 = vmaxps_avx(auVar40,auVar37);
        auVar372 = vpermilps_avx(auVar372,0);
        auVar250._16_16_ = auVar372;
        auVar250._0_16_ = auVar372;
        auVar37 = vcmpps_avx(auVar37,auVar250,1);
        auVar41 = vblendvps_avx(_local_460,auVar38,auVar37);
        auVar42 = vblendvps_avx(auVar179,auVar39,auVar37);
        auVar37 = vandps_avx(auVar267,auVar233);
        auVar40 = vandps_avx(auVar313,auVar233);
        auVar43 = vmaxps_avx(auVar37,auVar40);
        auVar37 = vandps_avx(auVar198,auVar233);
        auVar37 = vmaxps_avx(auVar43,auVar37);
        auVar43 = vcmpps_avx(auVar37,auVar250,1);
        auVar37 = vblendvps_avx(auVar267,auVar38,auVar43);
        auVar38 = vblendvps_avx(auVar313,auVar39,auVar43);
        fVar339 = auVar41._0_4_;
        fVar166 = auVar41._4_4_;
        fVar245 = auVar41._8_4_;
        fVar189 = auVar41._12_4_;
        fVar263 = auVar41._16_4_;
        fVar323 = auVar41._20_4_;
        fVar167 = auVar41._24_4_;
        fVar199 = -auVar41._28_4_;
        fVar201 = auVar37._0_4_;
        fVar218 = auVar37._4_4_;
        fVar220 = auVar37._8_4_;
        fVar222 = auVar37._12_4_;
        fVar224 = auVar37._16_4_;
        fVar226 = auVar37._20_4_;
        fVar228 = auVar37._24_4_;
        fVar200 = auVar42._0_4_;
        fVar219 = auVar42._4_4_;
        fVar223 = auVar42._8_4_;
        fVar237 = auVar42._12_4_;
        fVar242 = auVar42._16_4_;
        fVar256 = auVar42._20_4_;
        fVar261 = auVar42._24_4_;
        auVar158._0_4_ = fVar200 * fVar200 + fVar339 * fVar339;
        auVar158._4_4_ = fVar219 * fVar219 + fVar166 * fVar166;
        auVar158._8_4_ = fVar223 * fVar223 + fVar245 * fVar245;
        auVar158._12_4_ = fVar237 * fVar237 + fVar189 * fVar189;
        auVar158._16_4_ = fVar242 * fVar242 + fVar263 * fVar263;
        auVar158._20_4_ = fVar256 * fVar256 + fVar323 * fVar323;
        auVar158._24_4_ = fVar261 * fVar261 + fVar167 * fVar167;
        auVar158._28_4_ = auVar313._28_4_ + auVar41._28_4_;
        auVar39 = vrsqrtps_avx(auVar158);
        fVar188 = auVar39._0_4_;
        fVar217 = auVar39._4_4_;
        auVar51._4_4_ = fVar217 * 1.5;
        auVar51._0_4_ = fVar188 * 1.5;
        fVar258 = auVar39._8_4_;
        auVar51._8_4_ = fVar258 * 1.5;
        fVar358 = auVar39._12_4_;
        auVar51._12_4_ = fVar358 * 1.5;
        fVar221 = auVar39._16_4_;
        auVar51._16_4_ = fVar221 * 1.5;
        fVar168 = auVar39._20_4_;
        auVar51._20_4_ = fVar168 * 1.5;
        fVar225 = auVar39._24_4_;
        fVar262 = auVar40._28_4_;
        auVar51._24_4_ = fVar225 * 1.5;
        auVar51._28_4_ = fVar262;
        auVar52._4_4_ = fVar217 * fVar217 * fVar217 * auVar158._4_4_ * 0.5;
        auVar52._0_4_ = fVar188 * fVar188 * fVar188 * auVar158._0_4_ * 0.5;
        auVar52._8_4_ = fVar258 * fVar258 * fVar258 * auVar158._8_4_ * 0.5;
        auVar52._12_4_ = fVar358 * fVar358 * fVar358 * auVar158._12_4_ * 0.5;
        auVar52._16_4_ = fVar221 * fVar221 * fVar221 * auVar158._16_4_ * 0.5;
        auVar52._20_4_ = fVar168 * fVar168 * fVar168 * auVar158._20_4_ * 0.5;
        auVar52._24_4_ = fVar225 * fVar225 * fVar225 * auVar158._24_4_ * 0.5;
        auVar52._28_4_ = auVar158._28_4_;
        auVar39 = vsubps_avx(auVar51,auVar52);
        fVar188 = auVar39._0_4_;
        fVar358 = auVar39._4_4_;
        fVar225 = auVar39._8_4_;
        fVar238 = auVar39._12_4_;
        fVar243 = auVar39._16_4_;
        fVar257 = auVar39._20_4_;
        fVar337 = auVar39._24_4_;
        fVar217 = auVar38._0_4_;
        fVar221 = auVar38._4_4_;
        fVar227 = auVar38._8_4_;
        fVar239 = auVar38._12_4_;
        fVar246 = auVar38._16_4_;
        fVar259 = auVar38._20_4_;
        fVar186 = auVar38._24_4_;
        auVar159._0_4_ = fVar217 * fVar217 + fVar201 * fVar201;
        auVar159._4_4_ = fVar221 * fVar221 + fVar218 * fVar218;
        auVar159._8_4_ = fVar227 * fVar227 + fVar220 * fVar220;
        auVar159._12_4_ = fVar239 * fVar239 + fVar222 * fVar222;
        auVar159._16_4_ = fVar246 * fVar246 + fVar224 * fVar224;
        auVar159._20_4_ = fVar259 * fVar259 + fVar226 * fVar226;
        auVar159._24_4_ = fVar186 * fVar186 + fVar228 * fVar228;
        auVar159._28_4_ = auVar37._28_4_ + auVar39._28_4_;
        auVar37 = vrsqrtps_avx(auVar159);
        fVar258 = auVar37._0_4_;
        fVar168 = auVar37._4_4_;
        auVar53._4_4_ = fVar168 * 1.5;
        auVar53._0_4_ = fVar258 * 1.5;
        fVar229 = auVar37._8_4_;
        auVar53._8_4_ = fVar229 * 1.5;
        fVar241 = auVar37._12_4_;
        auVar53._12_4_ = fVar241 * 1.5;
        fVar255 = auVar37._16_4_;
        auVar53._16_4_ = fVar255 * 1.5;
        fVar260 = auVar37._20_4_;
        auVar53._20_4_ = fVar260 * 1.5;
        fVar338 = auVar37._24_4_;
        auVar53._24_4_ = fVar338 * 1.5;
        auVar53._28_4_ = fVar262;
        auVar54._4_4_ = fVar168 * fVar168 * fVar168 * auVar159._4_4_ * 0.5;
        auVar54._0_4_ = fVar258 * fVar258 * fVar258 * auVar159._0_4_ * 0.5;
        auVar54._8_4_ = fVar229 * fVar229 * fVar229 * auVar159._8_4_ * 0.5;
        auVar54._12_4_ = fVar241 * fVar241 * fVar241 * auVar159._12_4_ * 0.5;
        auVar54._16_4_ = fVar255 * fVar255 * fVar255 * auVar159._16_4_ * 0.5;
        auVar54._20_4_ = fVar260 * fVar260 * fVar260 * auVar159._20_4_ * 0.5;
        auVar54._24_4_ = fVar338 * fVar338 * fVar338 * auVar159._24_4_ * 0.5;
        auVar54._28_4_ = auVar159._28_4_;
        auVar37 = vsubps_avx(auVar53,auVar54);
        fVar258 = auVar37._0_4_;
        fVar168 = auVar37._4_4_;
        fVar229 = auVar37._8_4_;
        fVar241 = auVar37._12_4_;
        fVar255 = auVar37._16_4_;
        fVar260 = auVar37._20_4_;
        fVar338 = auVar37._24_4_;
        fVar200 = (float)local_7e0 * fVar200 * fVar188;
        fVar219 = (float)auStack_7dc._0_4_ * fVar219 * fVar358;
        auVar55._4_4_ = fVar219;
        auVar55._0_4_ = fVar200;
        fVar223 = (float)auStack_7dc._4_4_ * fVar223 * fVar225;
        auVar55._8_4_ = fVar223;
        fVar237 = fStack_7d4 * fVar237 * fVar238;
        auVar55._12_4_ = fVar237;
        fVar242 = fStack_7d0 * fVar242 * fVar243;
        auVar55._16_4_ = fVar242;
        fVar256 = fStack_7cc * fVar256 * fVar257;
        auVar55._20_4_ = fVar256;
        fVar261 = fStack_7c8 * fVar261 * fVar337;
        auVar55._24_4_ = fVar261;
        auVar55._28_4_ = fVar262;
        local_5c0._4_4_ = fVar219 + auVar344._4_4_;
        local_5c0._0_4_ = fVar200 + auVar344._0_4_;
        fStack_5b8 = fVar223 + auVar344._8_4_;
        fStack_5b4 = fVar237 + auVar344._12_4_;
        fStack_5b0 = fVar242 + auVar344._16_4_;
        fStack_5ac = fVar256 + auVar344._20_4_;
        fStack_5a8 = fVar261 + auVar344._24_4_;
        fStack_5a4 = fVar262 + auVar344._28_4_;
        fVar200 = (float)local_7e0 * fVar188 * -fVar339;
        fVar219 = (float)auStack_7dc._0_4_ * fVar358 * -fVar166;
        auVar56._4_4_ = fVar219;
        auVar56._0_4_ = fVar200;
        fVar223 = (float)auStack_7dc._4_4_ * fVar225 * -fVar245;
        auVar56._8_4_ = fVar223;
        fVar237 = fStack_7d4 * fVar238 * -fVar189;
        auVar56._12_4_ = fVar237;
        fVar242 = fStack_7d0 * fVar243 * -fVar263;
        auVar56._16_4_ = fVar242;
        fVar256 = fStack_7cc * fVar257 * -fVar323;
        auVar56._20_4_ = fVar256;
        fVar261 = fStack_7c8 * fVar337 * -fVar167;
        auVar56._24_4_ = fVar261;
        auVar56._28_4_ = fVar199;
        local_440._4_4_ = auVar312._4_4_ + fVar219;
        local_440._0_4_ = auVar312._0_4_ + fVar200;
        fStack_438 = auVar312._8_4_ + fVar223;
        fStack_434 = auVar312._12_4_ + fVar237;
        auStack_430._0_4_ = auVar312._16_4_ + fVar242;
        auStack_430._4_4_ = auVar312._20_4_ + fVar256;
        fStack_428 = auVar312._24_4_ + fVar261;
        fStack_424 = auVar312._28_4_ + fVar199;
        fVar200 = fVar188 * 0.0 * (float)local_7e0;
        fVar188 = fVar358 * 0.0 * (float)auStack_7dc._0_4_;
        auVar57._4_4_ = fVar188;
        auVar57._0_4_ = fVar200;
        fVar219 = fVar225 * 0.0 * (float)auStack_7dc._4_4_;
        auVar57._8_4_ = fVar219;
        fVar358 = fVar238 * 0.0 * fStack_7d4;
        auVar57._12_4_ = fVar358;
        fVar223 = fVar243 * 0.0 * fStack_7d0;
        auVar57._16_4_ = fVar223;
        fVar225 = fVar257 * 0.0 * fStack_7cc;
        auVar57._20_4_ = fVar225;
        fVar237 = fVar337 * 0.0 * fStack_7c8;
        auVar57._24_4_ = fVar237;
        auVar57._28_4_ = fVar357;
        auVar268._0_4_ = (float)local_520._0_4_ + fVar200;
        auVar268._4_4_ = (float)local_520._4_4_ + fVar188;
        auVar268._8_4_ = fStack_518 + fVar219;
        auVar268._12_4_ = fStack_514 + fVar358;
        auVar268._16_4_ = fStack_510 + fVar223;
        auVar268._20_4_ = fStack_50c + fVar225;
        auVar268._24_4_ = fStack_508 + fVar237;
        auVar268._28_4_ = fStack_504 + fVar357;
        fVar200 = local_6c0._0_4_ * fVar217 * fVar258;
        fVar188 = local_6c0._4_4_ * fVar221 * fVar168;
        auVar58._4_4_ = fVar188;
        auVar58._0_4_ = fVar200;
        fVar217 = local_6c0._8_4_ * fVar227 * fVar229;
        auVar58._8_4_ = fVar217;
        fVar219 = local_6c0._12_4_ * fVar239 * fVar241;
        auVar58._12_4_ = fVar219;
        fVar358 = local_6c0._16_4_ * fVar246 * fVar255;
        auVar58._16_4_ = fVar358;
        fVar221 = local_6c0._20_4_ * fVar259 * fVar260;
        auVar58._20_4_ = fVar221;
        fVar223 = local_6c0._24_4_ * fVar186 * fVar338;
        auVar58._24_4_ = fVar223;
        auVar58._28_4_ = auVar38._28_4_;
        auVar42 = vsubps_avx(auVar344,auVar55);
        auVar328._0_4_ = auVar232._0_4_ + fVar200;
        auVar328._4_4_ = auVar232._4_4_ + fVar188;
        auVar328._8_4_ = auVar232._8_4_ + fVar217;
        auVar328._12_4_ = auVar232._12_4_ + fVar219;
        auVar328._16_4_ = auVar232._16_4_ + fVar358;
        auVar328._20_4_ = auVar232._20_4_ + fVar221;
        auVar328._24_4_ = auVar232._24_4_ + fVar223;
        auVar328._28_4_ = auVar232._28_4_ + auVar38._28_4_;
        fVar200 = local_6c0._0_4_ * fVar258 * -fVar201;
        fVar188 = local_6c0._4_4_ * fVar168 * -fVar218;
        auVar59._4_4_ = fVar188;
        auVar59._0_4_ = fVar200;
        fVar217 = local_6c0._8_4_ * fVar229 * -fVar220;
        auVar59._8_4_ = fVar217;
        fVar219 = local_6c0._12_4_ * fVar241 * -fVar222;
        auVar59._12_4_ = fVar219;
        fVar358 = local_6c0._16_4_ * fVar255 * -fVar224;
        auVar59._16_4_ = fVar358;
        fVar221 = local_6c0._20_4_ * fVar260 * -fVar226;
        auVar59._20_4_ = fVar221;
        fVar223 = local_6c0._24_4_ * fVar338 * -fVar228;
        auVar59._24_4_ = fVar223;
        auVar59._28_4_ = fVar365;
        auVar43 = vsubps_avx(auVar312,auVar56);
        auVar336._0_4_ = fVar200 + auVar212._0_4_;
        auVar336._4_4_ = fVar188 + auVar212._4_4_;
        auVar336._8_4_ = fVar217 + auVar212._8_4_;
        auVar336._12_4_ = fVar219 + auVar212._12_4_;
        auVar336._16_4_ = fVar358 + auVar212._16_4_;
        auVar336._20_4_ = fVar221 + auVar212._20_4_;
        auVar336._24_4_ = fVar223 + auVar212._24_4_;
        auVar336._28_4_ = fVar365 + auVar212._28_4_;
        fVar200 = fVar258 * 0.0 * local_6c0._0_4_;
        fVar188 = fVar168 * 0.0 * local_6c0._4_4_;
        auVar60._4_4_ = fVar188;
        auVar60._0_4_ = fVar200;
        fVar217 = fVar229 * 0.0 * local_6c0._8_4_;
        auVar60._8_4_ = fVar217;
        fVar258 = fVar241 * 0.0 * local_6c0._12_4_;
        auVar60._12_4_ = fVar258;
        fVar219 = fVar255 * 0.0 * local_6c0._16_4_;
        auVar60._16_4_ = fVar219;
        fVar358 = fVar260 * 0.0 * local_6c0._20_4_;
        auVar60._20_4_ = fVar358;
        fVar221 = fVar338 * 0.0 * local_6c0._24_4_;
        auVar60._24_4_ = fVar221;
        auVar60._28_4_ = fVar199;
        auVar46 = vsubps_avx(_local_520,auVar57);
        auVar135._4_4_ = fStack_47c;
        auVar135._0_4_ = local_480;
        auVar135._8_4_ = fStack_478;
        auVar135._12_4_ = fStack_474;
        auVar135._16_4_ = fStack_470;
        auVar135._20_4_ = fStack_46c;
        auVar135._24_4_ = fStack_468;
        auVar135._28_4_ = fStack_464;
        auVar367._0_4_ = local_480 + fVar200;
        auVar367._4_4_ = fStack_47c + fVar188;
        auVar367._8_4_ = fStack_478 + fVar217;
        auVar367._12_4_ = fStack_474 + fVar258;
        auVar367._16_4_ = fStack_470 + fVar219;
        auVar367._20_4_ = fStack_46c + fVar358;
        auVar367._24_4_ = fStack_468 + fVar221;
        auVar367._28_4_ = fStack_464 + fVar199;
        auVar37 = vsubps_avx(auVar232,auVar58);
        auVar38 = vsubps_avx(auVar212,auVar59);
        auVar39 = vsubps_avx(auVar135,auVar60);
        auVar40 = vsubps_avx(auVar336,auVar43);
        auVar41 = vsubps_avx(auVar367,auVar46);
        auVar61._4_4_ = auVar46._4_4_ * auVar40._4_4_;
        auVar61._0_4_ = auVar46._0_4_ * auVar40._0_4_;
        auVar61._8_4_ = auVar46._8_4_ * auVar40._8_4_;
        auVar61._12_4_ = auVar46._12_4_ * auVar40._12_4_;
        auVar61._16_4_ = auVar46._16_4_ * auVar40._16_4_;
        auVar61._20_4_ = auVar46._20_4_ * auVar40._20_4_;
        auVar61._24_4_ = auVar46._24_4_ * auVar40._24_4_;
        auVar61._28_4_ = fVar365;
        auVar62._4_4_ = auVar43._4_4_ * auVar41._4_4_;
        auVar62._0_4_ = auVar43._0_4_ * auVar41._0_4_;
        auVar62._8_4_ = auVar43._8_4_ * auVar41._8_4_;
        auVar62._12_4_ = auVar43._12_4_ * auVar41._12_4_;
        auVar62._16_4_ = auVar43._16_4_ * auVar41._16_4_;
        auVar62._20_4_ = auVar43._20_4_ * auVar41._20_4_;
        auVar62._24_4_ = auVar43._24_4_ * auVar41._24_4_;
        auVar62._28_4_ = auVar212._28_4_;
        auVar44 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = auVar42._4_4_ * auVar41._4_4_;
        auVar63._0_4_ = auVar42._0_4_ * auVar41._0_4_;
        auVar63._8_4_ = auVar42._8_4_ * auVar41._8_4_;
        auVar63._12_4_ = auVar42._12_4_ * auVar41._12_4_;
        auVar63._16_4_ = auVar42._16_4_ * auVar41._16_4_;
        auVar63._20_4_ = auVar42._20_4_ * auVar41._20_4_;
        auVar63._24_4_ = auVar42._24_4_ * auVar41._24_4_;
        auVar63._28_4_ = auVar41._28_4_;
        auVar36 = vsubps_avx(auVar328,auVar42);
        auVar64._4_4_ = auVar46._4_4_ * auVar36._4_4_;
        auVar64._0_4_ = auVar46._0_4_ * auVar36._0_4_;
        auVar64._8_4_ = auVar46._8_4_ * auVar36._8_4_;
        auVar64._12_4_ = auVar46._12_4_ * auVar36._12_4_;
        auVar64._16_4_ = auVar46._16_4_ * auVar36._16_4_;
        auVar64._20_4_ = auVar46._20_4_ * auVar36._20_4_;
        auVar64._24_4_ = auVar46._24_4_ * auVar36._24_4_;
        auVar64._28_4_ = auVar232._28_4_;
        auVar156 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = auVar36._4_4_ * auVar43._4_4_;
        auVar65._0_4_ = auVar36._0_4_ * auVar43._0_4_;
        auVar65._8_4_ = auVar36._8_4_ * auVar43._8_4_;
        auVar65._12_4_ = auVar36._12_4_ * auVar43._12_4_;
        auVar65._16_4_ = auVar36._16_4_ * auVar43._16_4_;
        auVar65._20_4_ = auVar36._20_4_ * auVar43._20_4_;
        auVar65._24_4_ = auVar36._24_4_ * auVar43._24_4_;
        auVar65._28_4_ = auVar41._28_4_;
        auVar66._4_4_ = auVar42._4_4_ * auVar40._4_4_;
        auVar66._0_4_ = auVar42._0_4_ * auVar40._0_4_;
        auVar66._8_4_ = auVar42._8_4_ * auVar40._8_4_;
        auVar66._12_4_ = auVar42._12_4_ * auVar40._12_4_;
        auVar66._16_4_ = auVar42._16_4_ * auVar40._16_4_;
        auVar66._20_4_ = auVar42._20_4_ * auVar40._20_4_;
        auVar66._24_4_ = auVar42._24_4_ * auVar40._24_4_;
        auVar66._28_4_ = auVar40._28_4_;
        auVar40 = vsubps_avx(auVar66,auVar65);
        auVar160._0_4_ = auVar44._0_4_ * 0.0 + auVar40._0_4_ + auVar156._0_4_ * 0.0;
        auVar160._4_4_ = auVar44._4_4_ * 0.0 + auVar40._4_4_ + auVar156._4_4_ * 0.0;
        auVar160._8_4_ = auVar44._8_4_ * 0.0 + auVar40._8_4_ + auVar156._8_4_ * 0.0;
        auVar160._12_4_ = auVar44._12_4_ * 0.0 + auVar40._12_4_ + auVar156._12_4_ * 0.0;
        auVar160._16_4_ = auVar44._16_4_ * 0.0 + auVar40._16_4_ + auVar156._16_4_ * 0.0;
        auVar160._20_4_ = auVar44._20_4_ * 0.0 + auVar40._20_4_ + auVar156._20_4_ * 0.0;
        auVar160._24_4_ = auVar44._24_4_ * 0.0 + auVar40._24_4_ + auVar156._24_4_ * 0.0;
        auVar160._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar156._28_4_;
        auVar44 = vcmpps_avx(auVar160,ZEXT432(0) << 0x20,2);
        local_620 = vblendvps_avx(auVar37,_local_5c0,auVar44);
        auVar37 = vblendvps_avx(auVar38,_local_440,auVar44);
        auVar38 = vblendvps_avx(auVar39,auVar268,auVar44);
        auVar39 = vblendvps_avx(auVar42,auVar328,auVar44);
        auVar40 = vblendvps_avx(auVar43,auVar336,auVar44);
        auVar41 = vblendvps_avx(auVar46,auVar367,auVar44);
        auVar42 = vblendvps_avx(auVar328,auVar42,auVar44);
        auVar43 = vblendvps_avx(auVar336,auVar43,auVar44);
        local_780._0_16_ = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
        local_780._16_16_ = auVar155._16_16_;
        auVar155 = vblendvps_avx(auVar367,auVar46,auVar44);
        auVar42 = vsubps_avx(auVar42,local_620);
        auVar46 = vsubps_avx(auVar43,auVar37);
        auVar36 = vsubps_avx(auVar155,auVar38);
        auVar155 = vsubps_avx(auVar37,auVar40);
        fVar200 = auVar46._0_4_;
        fVar167 = auVar38._0_4_;
        fVar358 = auVar46._4_4_;
        fVar201 = auVar38._4_4_;
        auVar67._4_4_ = fVar201 * fVar358;
        auVar67._0_4_ = fVar167 * fVar200;
        fVar227 = auVar46._8_4_;
        fVar218 = auVar38._8_4_;
        auVar67._8_4_ = fVar218 * fVar227;
        fVar241 = auVar46._12_4_;
        fVar220 = auVar38._12_4_;
        auVar67._12_4_ = fVar220 * fVar241;
        fVar256 = auVar46._16_4_;
        fVar222 = auVar38._16_4_;
        auVar67._16_4_ = fVar222 * fVar256;
        fVar337 = auVar46._20_4_;
        fVar224 = auVar38._20_4_;
        auVar67._20_4_ = fVar224 * fVar337;
        fVar166 = auVar46._24_4_;
        fVar226 = auVar38._24_4_;
        auVar67._24_4_ = fVar226 * fVar166;
        auVar67._28_4_ = auVar43._28_4_;
        fVar188 = auVar37._0_4_;
        fVar185 = auVar36._0_4_;
        fVar221 = auVar37._4_4_;
        fVar187 = auVar36._4_4_;
        auVar68._4_4_ = fVar187 * fVar221;
        auVar68._0_4_ = fVar185 * fVar188;
        fVar229 = auVar37._8_4_;
        fVar190 = auVar36._8_4_;
        auVar68._8_4_ = fVar190 * fVar229;
        fVar242 = auVar37._12_4_;
        fVar169 = auVar36._12_4_;
        auVar68._12_4_ = fVar169 * fVar242;
        fVar257 = auVar37._16_4_;
        fVar264 = auVar36._16_4_;
        auVar68._16_4_ = fVar264 * fVar257;
        fVar186 = auVar37._20_4_;
        fVar272 = auVar36._20_4_;
        auVar68._20_4_ = fVar272 * fVar186;
        fVar245 = auVar37._24_4_;
        fVar273 = auVar36._24_4_;
        auVar68._24_4_ = fVar273 * fVar245;
        auVar68._28_4_ = auVar336._28_4_;
        auVar43 = vsubps_avx(auVar68,auVar67);
        fVar217 = local_620._0_4_;
        fVar168 = local_620._4_4_;
        auVar69._4_4_ = fVar187 * fVar168;
        auVar69._0_4_ = fVar185 * fVar217;
        fVar237 = local_620._8_4_;
        auVar69._8_4_ = fVar190 * fVar237;
        fVar243 = local_620._12_4_;
        auVar69._12_4_ = fVar169 * fVar243;
        fVar259 = local_620._16_4_;
        auVar69._16_4_ = fVar264 * fVar259;
        fVar338 = local_620._20_4_;
        auVar69._20_4_ = fVar272 * fVar338;
        fVar189 = local_620._24_4_;
        auVar69._24_4_ = fVar273 * fVar189;
        auVar69._28_4_ = auVar336._28_4_;
        fVar258 = auVar42._0_4_;
        auVar361._0_4_ = fVar167 * fVar258;
        fVar223 = auVar42._4_4_;
        auVar361._4_4_ = fVar201 * fVar223;
        fVar238 = auVar42._8_4_;
        auVar361._8_4_ = fVar218 * fVar238;
        fVar246 = auVar42._12_4_;
        auVar361._12_4_ = fVar220 * fVar246;
        fVar260 = auVar42._16_4_;
        auVar361._16_4_ = fVar222 * fVar260;
        fVar262 = auVar42._20_4_;
        auVar361._20_4_ = fVar224 * fVar262;
        fVar263 = auVar42._24_4_;
        auVar361._24_4_ = fVar226 * fVar263;
        auVar361._28_4_ = 0;
        auVar156 = vsubps_avx(auVar361,auVar69);
        auVar70._4_4_ = fVar221 * fVar223;
        auVar70._0_4_ = fVar188 * fVar258;
        auVar70._8_4_ = fVar229 * fVar238;
        auVar70._12_4_ = fVar242 * fVar246;
        auVar70._16_4_ = fVar257 * fVar260;
        auVar70._20_4_ = fVar186 * fVar262;
        auVar70._24_4_ = fVar245 * fVar263;
        auVar70._28_4_ = auVar336._28_4_;
        auVar71._4_4_ = fVar168 * fVar358;
        auVar71._0_4_ = fVar217 * fVar200;
        auVar71._8_4_ = fVar237 * fVar227;
        auVar71._12_4_ = fVar243 * fVar241;
        auVar71._16_4_ = fVar259 * fVar256;
        auVar71._20_4_ = fVar338 * fVar337;
        auVar71._24_4_ = fVar189 * fVar166;
        auVar71._28_4_ = auVar367._28_4_;
        auVar157 = vsubps_avx(auVar71,auVar70);
        auVar176 = vsubps_avx(auVar38,auVar41);
        fVar219 = auVar157._28_4_ + auVar156._28_4_;
        auVar180._0_4_ = auVar157._0_4_ + auVar156._0_4_ * 0.0 + auVar43._0_4_ * 0.0;
        auVar180._4_4_ = auVar157._4_4_ + auVar156._4_4_ * 0.0 + auVar43._4_4_ * 0.0;
        auVar180._8_4_ = auVar157._8_4_ + auVar156._8_4_ * 0.0 + auVar43._8_4_ * 0.0;
        auVar180._12_4_ = auVar157._12_4_ + auVar156._12_4_ * 0.0 + auVar43._12_4_ * 0.0;
        auVar180._16_4_ = auVar157._16_4_ + auVar156._16_4_ * 0.0 + auVar43._16_4_ * 0.0;
        auVar180._20_4_ = auVar157._20_4_ + auVar156._20_4_ * 0.0 + auVar43._20_4_ * 0.0;
        auVar180._24_4_ = auVar157._24_4_ + auVar156._24_4_ * 0.0 + auVar43._24_4_ * 0.0;
        auVar180._28_4_ = fVar219 + auVar43._28_4_;
        fVar228 = auVar155._0_4_;
        fVar199 = auVar155._4_4_;
        auVar72._4_4_ = fVar199 * auVar41._4_4_;
        auVar72._0_4_ = fVar228 * auVar41._0_4_;
        fVar244 = auVar155._8_4_;
        auVar72._8_4_ = fVar244 * auVar41._8_4_;
        fVar305 = auVar155._12_4_;
        auVar72._12_4_ = fVar305 * auVar41._12_4_;
        fVar306 = auVar155._16_4_;
        auVar72._16_4_ = fVar306 * auVar41._16_4_;
        fVar170 = auVar155._20_4_;
        auVar72._20_4_ = fVar170 * auVar41._20_4_;
        fVar184 = auVar155._24_4_;
        auVar72._24_4_ = fVar184 * auVar41._24_4_;
        auVar72._28_4_ = fVar219;
        fVar219 = auVar176._0_4_;
        fVar225 = auVar176._4_4_;
        auVar73._4_4_ = auVar40._4_4_ * fVar225;
        auVar73._0_4_ = auVar40._0_4_ * fVar219;
        fVar239 = auVar176._8_4_;
        auVar73._8_4_ = auVar40._8_4_ * fVar239;
        fVar255 = auVar176._12_4_;
        auVar73._12_4_ = auVar40._12_4_ * fVar255;
        fVar261 = auVar176._16_4_;
        auVar73._16_4_ = auVar40._16_4_ * fVar261;
        fVar339 = auVar176._20_4_;
        auVar73._20_4_ = auVar40._20_4_ * fVar339;
        fVar323 = auVar176._24_4_;
        auVar73._24_4_ = auVar40._24_4_ * fVar323;
        auVar73._28_4_ = auVar157._28_4_;
        auVar155 = vsubps_avx(auVar73,auVar72);
        auVar156 = vsubps_avx(local_620,auVar39);
        fVar274 = auVar156._0_4_;
        fVar275 = auVar156._4_4_;
        auVar74._4_4_ = fVar275 * auVar41._4_4_;
        auVar74._0_4_ = fVar274 * auVar41._0_4_;
        fVar276 = auVar156._8_4_;
        auVar74._8_4_ = fVar276 * auVar41._8_4_;
        fVar277 = auVar156._12_4_;
        auVar74._12_4_ = fVar277 * auVar41._12_4_;
        fVar278 = auVar156._16_4_;
        auVar74._16_4_ = fVar278 * auVar41._16_4_;
        fVar288 = auVar156._20_4_;
        auVar74._20_4_ = fVar288 * auVar41._20_4_;
        fVar293 = auVar156._24_4_;
        auVar74._24_4_ = fVar293 * auVar41._24_4_;
        auVar74._28_4_ = auVar41._28_4_;
        auVar75._4_4_ = auVar39._4_4_ * fVar225;
        auVar75._0_4_ = auVar39._0_4_ * fVar219;
        auVar75._8_4_ = auVar39._8_4_ * fVar239;
        auVar75._12_4_ = auVar39._12_4_ * fVar255;
        auVar75._16_4_ = auVar39._16_4_ * fVar261;
        auVar75._20_4_ = auVar39._20_4_ * fVar339;
        auVar75._24_4_ = auVar39._24_4_ * fVar323;
        auVar75._28_4_ = auVar43._28_4_;
        auVar43 = vsubps_avx(auVar74,auVar75);
        auVar76._4_4_ = auVar40._4_4_ * fVar275;
        auVar76._0_4_ = auVar40._0_4_ * fVar274;
        auVar76._8_4_ = auVar40._8_4_ * fVar276;
        auVar76._12_4_ = auVar40._12_4_ * fVar277;
        auVar76._16_4_ = auVar40._16_4_ * fVar278;
        auVar76._20_4_ = auVar40._20_4_ * fVar288;
        auVar76._24_4_ = auVar40._24_4_ * fVar293;
        auVar76._28_4_ = auVar41._28_4_;
        auVar77._4_4_ = auVar39._4_4_ * fVar199;
        auVar77._0_4_ = auVar39._0_4_ * fVar228;
        auVar77._8_4_ = auVar39._8_4_ * fVar244;
        auVar77._12_4_ = auVar39._12_4_ * fVar305;
        auVar77._16_4_ = auVar39._16_4_ * fVar306;
        auVar77._20_4_ = auVar39._20_4_ * fVar170;
        auVar77._24_4_ = auVar39._24_4_ * fVar184;
        auVar77._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar77,auVar76);
        auVar234._0_4_ = auVar155._0_4_ * 0.0 + auVar39._0_4_ + auVar43._0_4_ * 0.0;
        auVar234._4_4_ = auVar155._4_4_ * 0.0 + auVar39._4_4_ + auVar43._4_4_ * 0.0;
        auVar234._8_4_ = auVar155._8_4_ * 0.0 + auVar39._8_4_ + auVar43._8_4_ * 0.0;
        auVar234._12_4_ = auVar155._12_4_ * 0.0 + auVar39._12_4_ + auVar43._12_4_ * 0.0;
        auVar234._16_4_ = auVar155._16_4_ * 0.0 + auVar39._16_4_ + auVar43._16_4_ * 0.0;
        auVar234._20_4_ = auVar155._20_4_ * 0.0 + auVar39._20_4_ + auVar43._20_4_ * 0.0;
        auVar234._24_4_ = auVar155._24_4_ * 0.0 + auVar39._24_4_ + auVar43._24_4_ * 0.0;
        auVar234._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar43._28_4_;
        auVar155 = vmaxps_avx(auVar180,auVar234);
        auVar155 = vcmpps_avx(auVar155,ZEXT832(0) << 0x20,2);
        auVar372 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
        auVar372 = vpand_avx(auVar372,local_780._0_16_);
        auVar205 = vpmovsxwd_avx(auVar372);
        auVar206 = vpunpckhwd_avx(auVar372,auVar372);
        auVar214._16_16_ = auVar206;
        auVar214._0_16_ = auVar205;
        if ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar214 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar214 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar214 >> 0x7f,0) == '\0') &&
              (auVar214 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar206 >> 0x3f,0) == '\0') &&
            (auVar214 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar206[0xf]) {
LAB_0128eeb7:
          auVar183 = ZEXT3264(CONCAT824(uStack_4e8,
                                        CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        }
        else {
          auVar78._4_4_ = fVar225 * fVar358;
          auVar78._0_4_ = fVar219 * fVar200;
          auVar78._8_4_ = fVar239 * fVar227;
          auVar78._12_4_ = fVar255 * fVar241;
          auVar78._16_4_ = fVar261 * fVar256;
          auVar78._20_4_ = fVar339 * fVar337;
          auVar78._24_4_ = fVar323 * fVar166;
          auVar78._28_4_ = auVar206._12_4_;
          auVar346._0_4_ = fVar228 * fVar185;
          auVar346._4_4_ = fVar199 * fVar187;
          auVar346._8_4_ = fVar244 * fVar190;
          auVar346._12_4_ = fVar305 * fVar169;
          auVar346._16_4_ = fVar306 * fVar264;
          auVar346._20_4_ = fVar170 * fVar272;
          auVar346._24_4_ = fVar184 * fVar273;
          auVar346._28_4_ = 0;
          auVar155 = vsubps_avx(auVar346,auVar78);
          auVar79._4_4_ = fVar275 * fVar187;
          auVar79._0_4_ = fVar274 * fVar185;
          auVar79._8_4_ = fVar276 * fVar190;
          auVar79._12_4_ = fVar277 * fVar169;
          auVar79._16_4_ = fVar278 * fVar264;
          auVar79._20_4_ = fVar288 * fVar272;
          auVar79._24_4_ = fVar293 * fVar273;
          auVar79._28_4_ = auVar36._28_4_;
          auVar80._4_4_ = fVar225 * fVar223;
          auVar80._0_4_ = fVar219 * fVar258;
          auVar80._8_4_ = fVar239 * fVar238;
          auVar80._12_4_ = fVar255 * fVar246;
          auVar80._16_4_ = fVar261 * fVar260;
          auVar80._20_4_ = fVar339 * fVar262;
          auVar80._24_4_ = fVar323 * fVar263;
          auVar80._28_4_ = auVar176._28_4_;
          auVar40 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = fVar199 * fVar223;
          auVar81._0_4_ = fVar228 * fVar258;
          auVar81._8_4_ = fVar244 * fVar238;
          auVar81._12_4_ = fVar305 * fVar246;
          auVar81._16_4_ = fVar306 * fVar260;
          auVar81._20_4_ = fVar170 * fVar262;
          auVar81._24_4_ = fVar184 * fVar263;
          auVar81._28_4_ = auVar180._28_4_;
          auVar82._4_4_ = fVar275 * fVar358;
          auVar82._0_4_ = fVar274 * fVar200;
          auVar82._8_4_ = fVar276 * fVar227;
          auVar82._12_4_ = fVar277 * fVar241;
          auVar82._16_4_ = fVar278 * fVar256;
          auVar82._20_4_ = fVar288 * fVar337;
          auVar82._24_4_ = fVar293 * fVar166;
          auVar82._28_4_ = auVar46._28_4_;
          auVar41 = vsubps_avx(auVar82,auVar81);
          auVar285._0_4_ = auVar155._0_4_ * 0.0 + auVar41._0_4_ + auVar40._0_4_ * 0.0;
          auVar285._4_4_ = auVar155._4_4_ * 0.0 + auVar41._4_4_ + auVar40._4_4_ * 0.0;
          auVar285._8_4_ = auVar155._8_4_ * 0.0 + auVar41._8_4_ + auVar40._8_4_ * 0.0;
          auVar285._12_4_ = auVar155._12_4_ * 0.0 + auVar41._12_4_ + auVar40._12_4_ * 0.0;
          auVar285._16_4_ = auVar155._16_4_ * 0.0 + auVar41._16_4_ + auVar40._16_4_ * 0.0;
          auVar285._20_4_ = auVar155._20_4_ * 0.0 + auVar41._20_4_ + auVar40._20_4_ * 0.0;
          auVar285._24_4_ = auVar155._24_4_ * 0.0 + auVar41._24_4_ + auVar40._24_4_ * 0.0;
          auVar285._28_4_ = auVar46._28_4_ + auVar41._28_4_ + auVar180._28_4_;
          auVar39 = vrcpps_avx(auVar285);
          fVar258 = auVar39._0_4_;
          fVar219 = auVar39._4_4_;
          auVar83._4_4_ = auVar285._4_4_ * fVar219;
          auVar83._0_4_ = auVar285._0_4_ * fVar258;
          fVar358 = auVar39._8_4_;
          auVar83._8_4_ = auVar285._8_4_ * fVar358;
          fVar223 = auVar39._12_4_;
          auVar83._12_4_ = auVar285._12_4_ * fVar223;
          fVar225 = auVar39._16_4_;
          auVar83._16_4_ = auVar285._16_4_ * fVar225;
          fVar227 = auVar39._20_4_;
          auVar83._20_4_ = auVar285._20_4_ * fVar227;
          fVar238 = auVar39._24_4_;
          auVar83._24_4_ = auVar285._24_4_ * fVar238;
          auVar83._28_4_ = auVar176._28_4_;
          auVar347._8_4_ = 0x3f800000;
          auVar347._0_8_ = &DAT_3f8000003f800000;
          auVar347._12_4_ = 0x3f800000;
          auVar347._16_4_ = 0x3f800000;
          auVar347._20_4_ = 0x3f800000;
          auVar347._24_4_ = 0x3f800000;
          auVar347._28_4_ = 0x3f800000;
          auVar43 = vsubps_avx(auVar347,auVar83);
          fVar258 = auVar43._0_4_ * fVar258 + fVar258;
          fVar219 = auVar43._4_4_ * fVar219 + fVar219;
          fVar358 = auVar43._8_4_ * fVar358 + fVar358;
          fVar223 = auVar43._12_4_ * fVar223 + fVar223;
          fVar225 = auVar43._16_4_ * fVar225 + fVar225;
          fVar227 = auVar43._20_4_ * fVar227 + fVar227;
          fVar238 = auVar43._24_4_ * fVar238 + fVar238;
          auVar84._4_4_ =
               (auVar155._4_4_ * fVar168 + auVar40._4_4_ * fVar221 + auVar41._4_4_ * fVar201) *
               fVar219;
          auVar84._0_4_ =
               (auVar155._0_4_ * fVar217 + auVar40._0_4_ * fVar188 + auVar41._0_4_ * fVar167) *
               fVar258;
          auVar84._8_4_ =
               (auVar155._8_4_ * fVar237 + auVar40._8_4_ * fVar229 + auVar41._8_4_ * fVar218) *
               fVar358;
          auVar84._12_4_ =
               (auVar155._12_4_ * fVar243 + auVar40._12_4_ * fVar242 + auVar41._12_4_ * fVar220) *
               fVar223;
          auVar84._16_4_ =
               (auVar155._16_4_ * fVar259 + auVar40._16_4_ * fVar257 + auVar41._16_4_ * fVar222) *
               fVar225;
          auVar84._20_4_ =
               (auVar155._20_4_ * fVar338 + auVar40._20_4_ * fVar186 + auVar41._20_4_ * fVar224) *
               fVar227;
          auVar84._24_4_ =
               (auVar155._24_4_ * fVar189 + auVar40._24_4_ * fVar245 + auVar41._24_4_ * fVar226) *
               fVar238;
          auVar84._28_4_ = local_620._28_4_ + auVar42._28_4_ + auVar38._28_4_;
          auVar205 = vpermilps_avx(ZEXT416(local_7c0),0);
          auVar215._16_16_ = auVar205;
          auVar215._0_16_ = auVar205;
          auVar155 = vcmpps_avx(auVar215,auVar84,2);
          fVar200 = local_7e8->tfar;
          auVar251._4_4_ = fVar200;
          auVar251._0_4_ = fVar200;
          auVar251._8_4_ = fVar200;
          auVar251._12_4_ = fVar200;
          auVar251._16_4_ = fVar200;
          auVar251._20_4_ = fVar200;
          auVar251._24_4_ = fVar200;
          auVar251._28_4_ = fVar200;
          auVar38 = vcmpps_avx(auVar84,auVar251,2);
          auVar155 = vandps_avx(auVar38,auVar155);
          auVar205 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
          auVar372 = vpand_avx(auVar372,auVar205);
          auVar205 = vpmovsxwd_avx(auVar372);
          auVar206 = vpshufd_avx(auVar372,0xee);
          auVar206 = vpmovsxwd_avx(auVar206);
          auVar216._16_16_ = auVar206;
          auVar216._0_16_ = auVar205;
          if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar216 >> 0x7f,0) == '\0') &&
                (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar206 >> 0x3f,0) == '\0') &&
              (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar206[0xf]) goto LAB_0128eeb7;
          auVar155 = vcmpps_avx(ZEXT832(0) << 0x20,auVar285,4);
          auVar205 = vpackssdw_avx(auVar155._0_16_,auVar155._16_16_);
          auVar372 = vpand_avx(auVar372,auVar205);
          auVar205 = vpmovsxwd_avx(auVar372);
          auVar372 = vpunpckhwd_avx(auVar372,auVar372);
          auVar269._16_16_ = auVar372;
          auVar269._0_16_ = auVar205;
          auVar183 = ZEXT3264(CONCAT824(uStack_4e8,
                                        CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
          if ((((((((auVar269 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar269 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar269 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar269 >> 0x7f,0) != '\0') ||
                (auVar269 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar372 >> 0x3f,0) != '\0') ||
              (auVar269 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar372[0xf] < '\0') {
            auVar85._4_4_ = auVar180._4_4_ * fVar219;
            auVar85._0_4_ = auVar180._0_4_ * fVar258;
            auVar85._8_4_ = auVar180._8_4_ * fVar358;
            auVar85._12_4_ = auVar180._12_4_ * fVar223;
            auVar85._16_4_ = auVar180._16_4_ * fVar225;
            auVar85._20_4_ = auVar180._20_4_ * fVar227;
            auVar85._24_4_ = auVar180._24_4_ * fVar238;
            auVar85._28_4_ = local_4c0._28_4_;
            auVar86._4_4_ = auVar234._4_4_ * fVar219;
            auVar86._0_4_ = auVar234._0_4_ * fVar258;
            auVar86._8_4_ = auVar234._8_4_ * fVar358;
            auVar86._12_4_ = auVar234._12_4_ * fVar223;
            auVar86._16_4_ = auVar234._16_4_ * fVar225;
            auVar86._20_4_ = auVar234._20_4_ * fVar227;
            auVar86._24_4_ = auVar234._24_4_ * fVar238;
            auVar86._28_4_ = auVar43._28_4_ + auVar39._28_4_;
            auVar252._8_4_ = 0x3f800000;
            auVar252._0_8_ = &DAT_3f8000003f800000;
            auVar252._12_4_ = 0x3f800000;
            auVar252._16_4_ = 0x3f800000;
            auVar252._20_4_ = 0x3f800000;
            auVar252._24_4_ = 0x3f800000;
            auVar252._28_4_ = 0x3f800000;
            auVar155 = vsubps_avx(auVar252,auVar85);
            local_4a0 = vblendvps_avx(auVar155,auVar85,auVar44);
            auVar155 = vsubps_avx(auVar252,auVar86);
            _local_360 = vblendvps_avx(auVar155,auVar86,auVar44);
            auVar183 = ZEXT3264(auVar269);
            local_4c0 = auVar84;
          }
        }
        auVar362 = ZEXT3264(local_640);
        auVar165 = ZEXT3264(auVar345);
        auVar155 = auVar183._0_32_;
        if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar155 >> 0x7f,0) == '\0') &&
              (auVar183 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar155 >> 0xbf,0) == '\0') &&
            (auVar183 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar183[0x1f]) {
          uVar151 = 0;
          _local_690 = auVar14;
        }
        else {
          auVar38 = vsubps_avx(local_6c0._0_32_,_local_7e0);
          fVar188 = (float)local_7e0 + auVar38._0_4_ * local_4a0._0_4_;
          fVar217 = (float)auStack_7dc._0_4_ + auVar38._4_4_ * local_4a0._4_4_;
          fVar258 = (float)auStack_7dc._4_4_ + auVar38._8_4_ * local_4a0._8_4_;
          fVar219 = fStack_7d4 + auVar38._12_4_ * local_4a0._12_4_;
          fVar358 = fStack_7d0 + auVar38._16_4_ * local_4a0._16_4_;
          fVar221 = fStack_7cc + auVar38._20_4_ * local_4a0._20_4_;
          fVar168 = fStack_7c8 + auVar38._24_4_ * local_4a0._24_4_;
          fVar223 = auVar38._28_4_ + 0.0;
          fVar200 = local_788->depth_scale;
          auVar87._4_4_ = (fVar217 + fVar217) * fVar200;
          auVar87._0_4_ = (fVar188 + fVar188) * fVar200;
          auVar87._8_4_ = (fVar258 + fVar258) * fVar200;
          auVar87._12_4_ = (fVar219 + fVar219) * fVar200;
          auVar87._16_4_ = (fVar358 + fVar358) * fVar200;
          auVar87._20_4_ = (fVar221 + fVar221) * fVar200;
          auVar87._24_4_ = (fVar168 + fVar168) * fVar200;
          auVar87._28_4_ = fVar223 + fVar223;
          auVar38 = vcmpps_avx(local_4c0,auVar87,6);
          auVar39 = auVar155 & auVar38;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0x7f,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar39 >> 0xbf,0) != '\0') ||
              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar39[0x1f] < '\0') {
            local_240 = vandps_avx(auVar38,auVar155);
            local_2e0._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_2e0._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            fStack_2d8 = (float)uStack_358 + (float)uStack_358 + -1.0;
            fStack_2d4 = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
            fStack_2d0 = (float)uStack_350 + (float)uStack_350 + -1.0;
            fStack_2cc = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            fStack_2c8 = (float)uStack_348 + (float)uStack_348 + -1.0;
            fStack_2c4 = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            local_300 = local_4a0;
            local_2c0 = local_4c0;
            local_2a0 = 0;
            local_29c = uVar147;
            local_290 = local_690;
            uStack_288 = uStack_688;
            local_280 = local_3f0._0_8_;
            uStack_278 = local_3f0._8_8_;
            local_270 = local_400._0_8_;
            uStack_268 = local_400._8_8_;
            local_260 = local_410._0_8_;
            uStack_258 = local_410._8_8_;
            local_360._4_4_ = local_2e0._4_4_;
            local_360._0_4_ = local_2e0._0_4_;
            uStack_358._0_4_ = fStack_2d8;
            uStack_358._4_4_ = fStack_2d4;
            uStack_350._0_4_ = fStack_2d0;
            uStack_350._4_4_ = fStack_2cc;
            auVar175 = _local_360;
            uStack_348._0_4_ = fStack_2c8;
            uStack_348._4_4_ = fStack_2c4;
            auVar155 = _local_360;
            if ((pGVar33->mask & local_7e8->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar151 = CONCAT71((int7)(uVar151 >> 8),1), _local_690 = auVar14,
                 pGVar33->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar193._0_4_ = 1.0 / auVar204._0_4_;
                auVar193._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar372 = vshufps_avx(auVar193,auVar193,0);
                local_220[0] = auVar372._0_4_ * (local_4a0._0_4_ + 0.0);
                local_220[1] = auVar372._4_4_ * (local_4a0._4_4_ + 1.0);
                local_220[2] = auVar372._8_4_ * (local_4a0._8_4_ + 2.0);
                local_220[3] = auVar372._12_4_ * (local_4a0._12_4_ + 3.0);
                fStack_210 = auVar372._0_4_ * (local_4a0._16_4_ + 4.0);
                fStack_20c = auVar372._4_4_ * (local_4a0._20_4_ + 5.0);
                fStack_208 = auVar372._8_4_ * (local_4a0._24_4_ + 6.0);
                fStack_204 = local_4a0._28_4_ + 7.0;
                uStack_350 = auVar175._16_8_;
                uStack_348 = auVar155._24_8_;
                local_200 = local_360;
                uStack_1f8 = uStack_358;
                uStack_1f0 = uStack_350;
                uStack_1e8 = uStack_348;
                local_1e0 = local_4c0;
                iVar144 = vmovmskps_avx(local_240);
                uVar146 = CONCAT44((int)((ulong)context->args >> 0x20),iVar144);
                lVar152 = 0;
                if (uVar146 != 0) {
                  for (; (uVar146 >> lVar152 & 1) == 0; lVar152 = lVar152 + 1) {
                  }
                }
                uVar151 = CONCAT71((int7)(uVar151 >> 8),iVar144 != 0);
                _local_690 = auVar14;
                _local_360 = auVar155;
                if (iVar144 != 0) {
                  local_780._0_8_ = uVar146;
                  _auStack_6d0 = auVar37._16_16_;
                  uStack_6d8 = local_3f0._8_8_;
                  local_6e0 = (undefined1  [8])local_3f0._0_8_;
                  _auStack_590 = auVar232._16_16_;
                  uStack_598 = local_400._8_8_;
                  local_5a0 = (undefined1  [8])local_400._0_8_;
                  _auStack_6f0 = auVar212._16_16_;
                  uStack_6f8 = local_410._8_8_;
                  local_700 = (undefined1  [8])local_410._0_8_;
                  local_410 = auVar13;
                  local_400 = auVar15;
                  local_3f0 = auVar16;
                  do {
                    local_674 = local_220[lVar152];
                    local_670 = *(undefined4 *)((long)&local_200 + lVar152 * 4);
                    local_620._0_4_ = ray->tfar;
                    local_6c0._0_8_ = lVar152;
                    ray->tfar = *(float *)(local_1e0 + lVar152 * 4);
                    fVar188 = 1.0 - local_674;
                    fVar200 = local_674 * 3.0;
                    auVar372 = ZEXT416((uint)((fVar188 * -2.0 * local_674 + local_674 * local_674) *
                                             0.5));
                    auVar372 = vshufps_avx(auVar372,auVar372,0);
                    auVar205 = ZEXT416((uint)(((fVar188 + fVar188) * (fVar200 + 2.0) +
                                              fVar188 * fVar188 * -3.0) * 0.5));
                    auVar205 = vshufps_avx(auVar205,auVar205,0);
                    auVar206 = ZEXT416((uint)(((local_674 + local_674) * (fVar200 + -5.0) +
                                              local_674 * fVar200) * 0.5));
                    auVar206 = vshufps_avx(auVar206,auVar206,0);
                    auVar207 = ZEXT416((uint)((local_674 * (fVar188 + fVar188) - fVar188 * fVar188)
                                             * 0.5));
                    auVar207 = vshufps_avx(auVar207,auVar207,0);
                    auVar194._0_4_ =
                         auVar207._0_4_ * (float)local_690._0_4_ +
                         auVar206._0_4_ * (float)local_6e0._0_4_ +
                         auVar372._0_4_ * (float)local_700._0_4_ +
                         auVar205._0_4_ * (float)local_5a0._0_4_;
                    auVar194._4_4_ =
                         auVar207._4_4_ * (float)local_690._4_4_ +
                         auVar206._4_4_ * (float)local_6e0._4_4_ +
                         auVar372._4_4_ * (float)local_700._4_4_ +
                         auVar205._4_4_ * (float)local_5a0._4_4_;
                    auVar194._8_4_ =
                         auVar207._8_4_ * (float)uStack_688 +
                         auVar206._8_4_ * (float)uStack_6d8 +
                         auVar372._8_4_ * (float)uStack_6f8 + auVar205._8_4_ * (float)uStack_598;
                    auVar194._12_4_ =
                         auVar207._12_4_ * uStack_688._4_4_ +
                         auVar206._12_4_ * uStack_6d8._4_4_ +
                         auVar372._12_4_ * uStack_6f8._4_4_ + auVar205._12_4_ * uStack_598._4_4_;
                    local_730.context = context->user;
                    local_680 = vmovlps_avx(auVar194);
                    local_678 = vextractps_avx(auVar194,2);
                    local_66c = (int)local_648;
                    local_668 = (int)local_790;
                    local_664 = (local_730.context)->instID[0];
                    local_660 = (local_730.context)->instPrimID[0];
                    local_7ec = -1;
                    local_730.valid = &local_7ec;
                    local_730.geometryUserPtr = pGVar33->userPtr;
                    local_730.ray = (RTCRayN *)ray;
                    local_730.hit = (RTCHitN *)&local_680;
                    local_730.N = 1;
                    local_7e0 = (undefined1  [4])(int)uVar151;
                    if (pGVar33->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0128f1aa:
                      auVar345 = auVar165._0_32_;
                      p_Var35 = context->args->filter;
                      auVar13 = local_410;
                      auVar15 = local_400;
                      auVar16 = local_3f0;
                      if (p_Var35 == (RTCFilterFunctionN)0x0) break;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar33->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var35)(&local_730);
                        uVar151 = (ulong)(uint)local_7e0;
                        auVar165 = ZEXT3264(_local_560);
                        auVar362 = ZEXT3264(local_640);
                        ray = local_7e8;
                      }
                      auVar345 = auVar165._0_32_;
                      auVar13 = local_410;
                      auVar15 = local_400;
                      auVar16 = local_3f0;
                      if (*local_730.valid != 0) break;
                    }
                    else {
                      (*pGVar33->occlusionFilterN)(&local_730);
                      uVar151 = (ulong)(uint)local_7e0;
                      auVar165 = ZEXT3264(_local_560);
                      auVar362 = ZEXT3264(local_640);
                      ray = local_7e8;
                      if (*local_730.valid != 0) goto LAB_0128f1aa;
                    }
                    auVar345 = auVar165._0_32_;
                    ray->tfar = (float)local_620._0_4_;
                    uVar146 = local_780._0_8_ ^ 1L << (local_6c0._0_8_ & 0x3f);
                    lVar152 = 0;
                    if (uVar146 != 0) {
                      for (; (uVar146 >> lVar152 & 1) == 0; lVar152 = lVar152 + 1) {
                      }
                    }
                    local_780._0_8_ = uVar146;
                    uVar151 = CONCAT71((int7)(uVar151 >> 8),uVar146 != 0);
                    auVar13 = local_410;
                    auVar15 = local_400;
                    auVar16 = local_3f0;
                  } while (uVar146 != 0);
                }
                local_3f0 = auVar16;
                local_400 = auVar15;
                local_410 = auVar13;
                uVar151 = uVar151 & 0xffffffffffffff01;
                auVar13 = local_410;
                auVar15 = local_400;
                auVar16 = local_3f0;
              }
              goto LAB_0128dff4;
            }
          }
          uVar151 = 0;
          _local_690 = auVar14;
        }
LAB_0128dff4:
        local_3f0 = auVar16;
        local_400 = auVar15;
        local_410 = auVar13;
        auVar372 = local_760._0_16_;
      }
      auVar183 = ZEXT1664(auVar372);
      if (8 < (int)uVar147) {
        _local_440 = vpshufd_avx(ZEXT416(uVar147),0);
        auVar372 = vshufps_avx(auVar372,auVar372,0);
        local_120._16_16_ = auVar372;
        local_120._0_16_ = auVar372;
        auVar133._4_4_ = uStack_7bc;
        auVar133._0_4_ = local_7c0;
        auVar133._8_4_ = fStack_7b8;
        auVar133._12_4_ = fStack_7b4;
        auVar372 = vpermilps_avx(auVar133,0);
        local_140._16_16_ = auVar372;
        local_140._0_16_ = auVar372;
        auVar154._0_4_ = 1.0 / (float)local_3e0._0_4_;
        auVar154._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar372 = vshufps_avx(auVar154,auVar154,0);
        _fStack_3d0 = auVar372;
        _local_3e0 = auVar372;
        auVar165 = ZEXT3264(_local_3e0);
        lVar152 = 8;
        auVar330 = ZEXT3264(_local_580);
        local_640 = auVar362._0_32_;
        _local_560 = auVar345;
        fVar200 = (float)local_600._0_4_;
        fVar188 = (float)local_600._4_4_;
        fVar217 = fStack_5f8;
        fVar258 = fStack_5f4;
        fVar219 = fStack_5f0;
        fVar358 = fStack_5ec;
        fVar221 = fStack_5e8;
        fVar168 = fStack_5e4;
        fVar223 = (float)local_4e0._0_4_;
        fVar225 = (float)local_4e0._4_4_;
        fVar227 = fStack_4d8;
        fVar229 = fStack_4d4;
        fVar237 = fStack_4d0;
        fVar238 = fStack_4cc;
        fVar239 = fStack_4c8;
        do {
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar152 * 4 + lVar150);
          fVar241 = *(float *)*pauVar9;
          fVar242 = *(float *)(*pauVar9 + 4);
          fVar243 = *(float *)(*pauVar9 + 8);
          fVar246 = *(float *)(*pauVar9 + 0xc);
          fVar255 = *(float *)(*pauVar9 + 0x10);
          fVar256 = *(float *)(*pauVar9 + 0x14);
          fVar257 = *(float *)(*pauVar9 + 0x18);
          auVar141 = *pauVar9;
          pauVar10 = (undefined1 (*) [28])(lVar150 + 0x22307f0 + lVar152 * 4);
          fVar259 = *(float *)*pauVar10;
          fVar260 = *(float *)(*pauVar10 + 4);
          fVar261 = *(float *)(*pauVar10 + 8);
          fVar337 = *(float *)(*pauVar10 + 0xc);
          fVar186 = *(float *)(*pauVar10 + 0x10);
          fVar338 = *(float *)(*pauVar10 + 0x14);
          fVar262 = *(float *)(*pauVar10 + 0x18);
          auVar140 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar150 + 0x2230c74 + lVar152 * 4);
          fVar339 = *(float *)*pauVar10;
          fVar166 = *(float *)(*pauVar10 + 4);
          fVar245 = *(float *)(*pauVar10 + 8);
          fVar189 = *(float *)(*pauVar10 + 0xc);
          fVar263 = *(float *)(*pauVar10 + 0x10);
          fVar323 = *(float *)(*pauVar10 + 0x14);
          fVar167 = *(float *)(*pauVar10 + 0x18);
          auVar139 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar150 + 0x22310f8 + lVar152 * 4);
          fVar201 = *(float *)*pauVar10;
          fVar218 = *(float *)(*pauVar10 + 4);
          fVar220 = *(float *)(*pauVar10 + 8);
          fVar222 = *(float *)(*pauVar10 + 0xc);
          fVar224 = *(float *)(*pauVar10 + 0x10);
          fVar226 = *(float *)(*pauVar10 + 0x14);
          fVar228 = *(float *)(*pauVar10 + 0x18);
          auVar138 = *pauVar10;
          fVar199 = fVar168 + *(float *)pauVar10[1];
          fVar305 = auVar362._0_4_;
          fVar306 = auVar362._4_4_;
          fVar170 = auVar362._8_4_;
          fVar184 = auVar362._12_4_;
          fVar185 = auVar362._16_4_;
          fVar187 = auVar362._20_4_;
          fVar190 = auVar362._24_4_;
          fStack_7a4 = fVar168 + fVar168 + auVar165._28_4_;
          fVar244 = fVar168 + fVar199;
          auVar314._0_4_ =
               (float)local_180._0_4_ * fVar241 +
               fVar305 * fVar259 + auVar330._0_4_ * fVar339 + (float)local_3c0._0_4_ * fVar201;
          auVar314._4_4_ =
               (float)local_180._4_4_ * fVar242 +
               fVar306 * fVar260 + auVar330._4_4_ * fVar166 + (float)local_3c0._4_4_ * fVar218;
          auVar314._8_4_ =
               fStack_178 * fVar243 +
               fVar170 * fVar261 + auVar330._8_4_ * fVar245 + fStack_3b8 * fVar220;
          auVar314._12_4_ =
               fStack_174 * fVar246 +
               fVar184 * fVar337 + auVar330._12_4_ * fVar189 + fStack_3b4 * fVar222;
          auVar314._16_4_ =
               fStack_170 * fVar255 +
               fVar185 * fVar186 + auVar330._16_4_ * fVar263 + fStack_3b0 * fVar224;
          auVar314._20_4_ =
               fStack_16c * fVar256 +
               fVar187 * fVar338 + auVar330._20_4_ * fVar323 + fStack_3ac * fVar226;
          auVar314._24_4_ =
               fStack_168 * fVar257 +
               fVar190 * fVar262 + auVar330._24_4_ * fVar167 + fStack_3a8 * fVar228;
          auVar314._28_4_ = fVar199 + fStack_7a4;
          local_760._0_4_ =
               (float)local_3a0._0_4_ * fVar241 +
               fVar223 * fVar259 + (float)local_5e0._0_4_ * fVar339 + fVar200 * fVar201;
          local_760._4_4_ =
               (float)local_3a0._4_4_ * fVar242 +
               fVar225 * fVar260 + (float)local_5e0._4_4_ * fVar166 + fVar188 * fVar218;
          local_760._8_4_ =
               fStack_398 * fVar243 + fVar227 * fVar261 + fStack_5d8 * fVar245 + fVar217 * fVar220;
          local_760._12_4_ =
               fStack_394 * fVar246 + fVar229 * fVar337 + fStack_5d4 * fVar189 + fVar258 * fVar222;
          local_760._16_4_ =
               fStack_390 * fVar255 + fVar237 * fVar186 + fStack_5d0 * fVar263 + fVar219 * fVar224;
          local_760._20_4_ =
               fStack_38c * fVar256 + fVar238 * fVar338 + fStack_5cc * fVar323 + fVar358 * fVar226;
          local_760._24_4_ =
               fStack_388 * fVar257 + fVar239 * fVar262 + fStack_5c8 * fVar167 + fVar221 * fVar228;
          local_760._28_4_ = fStack_7a4 + fVar168 + fVar168 + auVar183._28_4_;
          fVar259 = (float)local_e0._0_4_ * fVar241 +
                    fVar259 * (float)local_160._0_4_ +
                    (float)local_a0._0_4_ * fVar339 + (float)local_c0._0_4_ * fVar201;
          fVar260 = (float)local_e0._4_4_ * fVar242 +
                    fVar260 * (float)local_160._4_4_ +
                    (float)local_a0._4_4_ * fVar166 + (float)local_c0._4_4_ * fVar218;
          fStack_7b8 = fStack_d8 * fVar243 +
                       fVar261 * fStack_158 + fStack_98 * fVar245 + fStack_b8 * fVar220;
          fStack_7b4 = fStack_d4 * fVar246 +
                       fVar337 * fStack_154 + fStack_94 * fVar189 + fStack_b4 * fVar222;
          fStack_7b0 = fStack_d0 * fVar255 +
                       fVar186 * fStack_150 + fStack_90 * fVar263 + fStack_b0 * fVar224;
          fStack_7ac = fStack_cc * fVar256 +
                       fVar338 * fStack_14c + fStack_8c * fVar323 + fStack_ac * fVar226;
          fStack_7a8 = fStack_c8 * fVar257 +
                       fVar262 * fStack_148 + fStack_88 * fVar167 + fStack_a8 * fVar228;
          fStack_7a4 = fStack_7a4 + fVar244;
          auVar175 = *(undefined1 (*) [24])(catmullrom_basis1 + lVar152 * 4 + lVar150);
          auVar155 = *(undefined1 (*) [32])(lVar150 + 0x2232c10 + lVar152 * 4);
          auVar165 = ZEXT3264(auVar155);
          auVar37 = *(undefined1 (*) [32])(lVar150 + 0x2233094 + lVar152 * 4);
          auVar183 = ZEXT3264(auVar37);
          pauVar10 = (undefined1 (*) [28])(lVar150 + 0x2233518 + lVar152 * 4);
          fVar223 = *(float *)*pauVar10;
          fVar225 = *(float *)(*pauVar10 + 4);
          fVar227 = *(float *)(*pauVar10 + 8);
          fVar229 = *(float *)(*pauVar10 + 0xc);
          fVar237 = *(float *)(*pauVar10 + 0x10);
          fVar238 = *(float *)(*pauVar10 + 0x14);
          fVar239 = *(float *)(*pauVar10 + 0x18);
          auVar142 = *pauVar10;
          fVar261 = auVar37._0_4_;
          fVar337 = auVar37._4_4_;
          fVar186 = auVar37._8_4_;
          fVar338 = auVar37._12_4_;
          fVar262 = auVar37._16_4_;
          fVar339 = auVar37._20_4_;
          fVar166 = auVar37._24_4_;
          local_7e0 = auVar175._0_4_;
          auStack_7dc._0_4_ = auVar175._4_4_;
          auStack_7dc._4_4_ = auVar175._8_4_;
          fStack_7d4 = auVar175._12_4_;
          fStack_7d0 = auVar175._16_4_;
          fStack_7cc = auVar175._20_4_;
          fStack_7c8 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(catmullrom_basis1 + lVar152 * 4 + lVar150))[1]
          ;
          fVar241 = auVar155._0_4_;
          fVar242 = auVar155._4_4_;
          fVar243 = auVar155._8_4_;
          fVar246 = auVar155._12_4_;
          fVar255 = auVar155._16_4_;
          fVar256 = auVar155._20_4_;
          fVar257 = auVar155._24_4_;
          fVar245 = fVar168 + fVar168 + fVar244;
          auVar270._0_4_ =
               (float)local_180._0_4_ * (float)local_7e0 +
               fVar305 * fVar241 +
               fVar261 * (float)local_580._0_4_ + (float)local_3c0._0_4_ * fVar223;
          auVar270._4_4_ =
               (float)local_180._4_4_ * (float)auStack_7dc._0_4_ +
               fVar306 * fVar242 +
               fVar337 * (float)local_580._4_4_ + (float)local_3c0._4_4_ * fVar225;
          auVar270._8_4_ =
               fStack_178 * (float)auStack_7dc._4_4_ +
               fVar170 * fVar243 + fVar186 * fStack_578 + fStack_3b8 * fVar227;
          auVar270._12_4_ =
               fStack_174 * fStack_7d4 +
               fVar184 * fVar246 + fVar338 * fStack_574 + fStack_3b4 * fVar229;
          auVar270._16_4_ =
               fStack_170 * fStack_7d0 +
               fVar185 * fVar255 + fVar262 * fStack_570 + fStack_3b0 * fVar237;
          auVar270._20_4_ =
               fStack_16c * fStack_7cc +
               fVar187 * fVar256 + fVar339 * fStack_56c + fStack_3ac * fVar238;
          auVar270._24_4_ =
               fStack_168 * fStack_7c8 +
               fVar190 * fVar257 + fVar166 * fStack_568 + fStack_3a8 * fVar239;
          auVar270._28_4_ = fVar168 + fStack_a4 + fVar245;
          auVar253._0_4_ =
               (float)local_3a0._0_4_ * (float)local_7e0 +
               (float)local_4e0._0_4_ * fVar241 +
               (float)local_5e0._0_4_ * fVar261 + fVar223 * fVar200;
          auVar253._4_4_ =
               (float)local_3a0._4_4_ * (float)auStack_7dc._0_4_ +
               (float)local_4e0._4_4_ * fVar242 +
               (float)local_5e0._4_4_ * fVar337 + fVar225 * fVar188;
          auVar253._8_4_ =
               fStack_398 * (float)auStack_7dc._4_4_ +
               fStack_4d8 * fVar243 + fStack_5d8 * fVar186 + fVar227 * fVar217;
          auVar253._12_4_ =
               fStack_394 * fStack_7d4 +
               fStack_4d4 * fVar246 + fStack_5d4 * fVar338 + fVar229 * fVar258;
          auVar253._16_4_ =
               fStack_390 * fStack_7d0 +
               fStack_4d0 * fVar255 + fStack_5d0 * fVar262 + fVar237 * fVar219;
          auVar253._20_4_ =
               fStack_38c * fStack_7cc +
               fStack_4cc * fVar256 + fStack_5cc * fVar339 + fVar238 * fVar358;
          auVar253._24_4_ =
               fStack_388 * fStack_7c8 +
               fStack_4c8 * fVar257 + fStack_5c8 * fVar166 + fVar239 * fVar221;
          auVar253._28_4_ = fVar245 + fVar168 + fVar168 + *(float *)pauVar9[1];
          auVar352._0_4_ =
               fVar241 * (float)local_160._0_4_ +
               (float)local_a0._0_4_ * fVar261 + fVar223 * (float)local_c0._0_4_ +
               (float)local_7e0 * (float)local_e0._0_4_;
          auVar352._4_4_ =
               fVar242 * (float)local_160._4_4_ +
               (float)local_a0._4_4_ * fVar337 + fVar225 * (float)local_c0._4_4_ +
               (float)auStack_7dc._0_4_ * (float)local_e0._4_4_;
          auVar352._8_4_ =
               fVar243 * fStack_158 + fStack_98 * fVar186 + fVar227 * fStack_b8 +
               (float)auStack_7dc._4_4_ * fStack_d8;
          auVar352._12_4_ =
               fVar246 * fStack_154 + fStack_94 * fVar338 + fVar229 * fStack_b4 +
               fStack_7d4 * fStack_d4;
          auVar352._16_4_ =
               fVar255 * fStack_150 + fStack_90 * fVar262 + fVar237 * fStack_b0 +
               fStack_7d0 * fStack_d0;
          auVar352._20_4_ =
               fVar256 * fStack_14c + fStack_8c * fVar339 + fVar238 * fStack_ac +
               fStack_7cc * fStack_cc;
          auVar352._24_4_ =
               fVar257 * fStack_148 + fStack_88 * fVar166 + fVar239 * fStack_a8 +
               fStack_7c8 * fStack_c8;
          auVar352._28_4_ = fVar168 + fVar168 + fStack_a4 + fVar245;
          auVar39 = vsubps_avx(auVar270,auVar314);
          auVar40 = vsubps_avx(auVar253,local_760._0_32_);
          fVar168 = auVar39._0_4_;
          fVar223 = auVar39._4_4_;
          auVar88._4_4_ = fVar223 * local_760._4_4_;
          auVar88._0_4_ = fVar168 * local_760._0_4_;
          fVar225 = auVar39._8_4_;
          auVar88._8_4_ = fVar225 * local_760._8_4_;
          fVar227 = auVar39._12_4_;
          auVar88._12_4_ = fVar227 * local_760._12_4_;
          fVar229 = auVar39._16_4_;
          auVar88._16_4_ = fVar229 * local_760._16_4_;
          fVar237 = auVar39._20_4_;
          auVar88._20_4_ = fVar237 * local_760._20_4_;
          fVar238 = auVar39._24_4_;
          auVar88._24_4_ = fVar238 * local_760._24_4_;
          auVar88._28_4_ = fVar245;
          fVar200 = auVar40._0_4_;
          fVar188 = auVar40._4_4_;
          auVar89._4_4_ = auVar314._4_4_ * fVar188;
          auVar89._0_4_ = auVar314._0_4_ * fVar200;
          fVar217 = auVar40._8_4_;
          auVar89._8_4_ = auVar314._8_4_ * fVar217;
          fVar258 = auVar40._12_4_;
          auVar89._12_4_ = auVar314._12_4_ * fVar258;
          fVar219 = auVar40._16_4_;
          auVar89._16_4_ = auVar314._16_4_ * fVar219;
          fVar358 = auVar40._20_4_;
          auVar89._20_4_ = auVar314._20_4_ * fVar358;
          fVar221 = auVar40._24_4_;
          auVar89._24_4_ = auVar314._24_4_ * fVar221;
          auVar89._28_4_ = auVar253._28_4_;
          auVar41 = vsubps_avx(auVar88,auVar89);
          auVar134._4_4_ = fVar260;
          auVar134._0_4_ = fVar259;
          auVar134._8_4_ = fStack_7b8;
          auVar134._12_4_ = fStack_7b4;
          auVar134._16_4_ = fStack_7b0;
          auVar134._20_4_ = fStack_7ac;
          auVar134._24_4_ = fStack_7a8;
          auVar134._28_4_ = fStack_7a4;
          auVar38 = vmaxps_avx(auVar134,auVar352);
          auVar90._4_4_ = auVar38._4_4_ * auVar38._4_4_ * (fVar223 * fVar223 + fVar188 * fVar188);
          auVar90._0_4_ = auVar38._0_4_ * auVar38._0_4_ * (fVar168 * fVar168 + fVar200 * fVar200);
          auVar90._8_4_ = auVar38._8_4_ * auVar38._8_4_ * (fVar225 * fVar225 + fVar217 * fVar217);
          auVar90._12_4_ = auVar38._12_4_ * auVar38._12_4_ * (fVar227 * fVar227 + fVar258 * fVar258)
          ;
          auVar90._16_4_ = auVar38._16_4_ * auVar38._16_4_ * (fVar229 * fVar229 + fVar219 * fVar219)
          ;
          auVar90._20_4_ = auVar38._20_4_ * auVar38._20_4_ * (fVar237 * fVar237 + fVar358 * fVar358)
          ;
          auVar90._24_4_ = auVar38._24_4_ * auVar38._24_4_ * (fVar238 * fVar238 + fVar221 * fVar221)
          ;
          auVar90._28_4_ = auVar270._28_4_ + auVar253._28_4_;
          auVar91._4_4_ = auVar41._4_4_ * auVar41._4_4_;
          auVar91._0_4_ = auVar41._0_4_ * auVar41._0_4_;
          auVar91._8_4_ = auVar41._8_4_ * auVar41._8_4_;
          auVar91._12_4_ = auVar41._12_4_ * auVar41._12_4_;
          auVar91._16_4_ = auVar41._16_4_ * auVar41._16_4_;
          auVar91._20_4_ = auVar41._20_4_ * auVar41._20_4_;
          auVar91._24_4_ = auVar41._24_4_ * auVar41._24_4_;
          auVar91._28_4_ = auVar41._28_4_;
          auVar38 = vcmpps_avx(auVar91,auVar90,2);
          local_2a0 = (uint)lVar152;
          auVar205 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar372 = vpor_avx(auVar205,_DAT_01ff0cf0);
          auVar205 = vpor_avx(auVar205,_DAT_02020ea0);
          auVar372 = vpcmpgtd_avx(_local_440,auVar372);
          auVar205 = vpcmpgtd_avx(_local_440,auVar205);
          register0x000012d0 = auVar205;
          _local_460 = auVar372;
          auVar41 = _local_460 & auVar38;
          fVar200 = (float)local_600._0_4_;
          fVar188 = (float)local_600._4_4_;
          fVar217 = fStack_5f8;
          fVar258 = fStack_5f4;
          fVar219 = fStack_5f0;
          fVar358 = fStack_5ec;
          fVar221 = fStack_5e8;
          fVar168 = fStack_5e4;
          fVar223 = (float)local_4e0._0_4_;
          fVar225 = (float)local_4e0._4_4_;
          fVar227 = fStack_4d8;
          fVar229 = fStack_4d4;
          fVar237 = fStack_4d0;
          fVar238 = fStack_4cc;
          fVar239 = fStack_4c8;
          if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar41 >> 0x7f,0) == '\0') &&
                (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar41 >> 0xbf,0) == '\0') &&
              (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar41[0x1f]) {
            auVar330 = ZEXT3264(_local_580);
          }
          else {
            local_5c0._0_4_ = auVar142._0_4_;
            local_5c0._4_4_ = auVar142._4_4_;
            fStack_5b8 = auVar142._8_4_;
            fStack_5b4 = auVar142._12_4_;
            fStack_5b0 = auVar142._16_4_;
            fStack_5ac = auVar142._20_4_;
            fStack_5a8 = auVar142._24_4_;
            local_5c0._0_4_ =
                 (float)local_7e0 * (float)local_560._0_4_ +
                 (float)local_320._0_4_ * fVar241 +
                 (float)local_100._0_4_ * fVar261 + (float)local_540._0_4_ * (float)local_5c0._0_4_;
            local_5c0._4_4_ =
                 (float)auStack_7dc._0_4_ * (float)local_560._4_4_ +
                 (float)local_320._4_4_ * fVar242 +
                 (float)local_100._4_4_ * fVar337 + (float)local_540._4_4_ * (float)local_5c0._4_4_;
            fStack_5b8 = (float)auStack_7dc._4_4_ * fStack_558 +
                         fStack_318 * fVar243 + fStack_f8 * fVar186 + fStack_538 * fStack_5b8;
            fStack_5b4 = fStack_7d4 * fStack_554 +
                         fStack_314 * fVar246 + fStack_f4 * fVar338 + fStack_534 * fStack_5b4;
            fStack_5b0 = fStack_7d0 * fStack_550 +
                         fStack_310 * fVar255 + fStack_f0 * fVar262 + fStack_530 * fStack_5b0;
            fStack_5ac = fStack_7cc * fStack_54c +
                         fStack_30c * fVar256 + fStack_ec * fVar339 + fStack_52c * fStack_5ac;
            fStack_5a8 = fStack_7c8 * fStack_548 +
                         fStack_308 * fVar257 + fStack_e8 * fVar166 + fStack_528 * fStack_5a8;
            fStack_5a4 = auVar314._28_4_ + auVar155._28_4_ + auVar37._28_4_ + 0.0;
            local_5a0._0_4_ = auVar140._0_4_;
            local_5a0._4_4_ = auVar140._4_4_;
            uStack_598._0_4_ = auVar140._8_4_;
            uStack_598._4_4_ = auVar140._12_4_;
            auStack_590._0_4_ = auVar140._16_4_;
            auStack_590._4_4_ = auVar140._20_4_;
            fStack_588 = auVar140._24_4_;
            local_700._0_4_ = auVar139._0_4_;
            local_700._4_4_ = auVar139._4_4_;
            uStack_6f8._0_4_ = auVar139._8_4_;
            uStack_6f8._4_4_ = auVar139._12_4_;
            auStack_6f0._0_4_ = auVar139._16_4_;
            auStack_6f0._4_4_ = auVar139._20_4_;
            fStack_6e8 = auVar139._24_4_;
            local_520._0_4_ = auVar138._0_4_;
            local_520._4_4_ = auVar138._4_4_;
            fStack_518 = auVar138._8_4_;
            fStack_514 = auVar138._12_4_;
            fStack_510 = auVar138._16_4_;
            fStack_50c = auVar138._20_4_;
            fStack_508 = auVar138._24_4_;
            fVar264 = (float)local_540._0_4_ * (float)local_520._0_4_;
            fVar272 = (float)local_540._4_4_ * (float)local_520._4_4_;
            fVar273 = fStack_538 * fStack_518;
            fVar274 = fStack_534 * fStack_514;
            fVar275 = fStack_530 * fStack_510;
            fVar276 = fStack_52c * fStack_50c;
            fVar277 = fStack_528 * fStack_508;
            pfVar1 = (float *)(lVar150 + 0x2231e84 + lVar152 * 4);
            fVar241 = *pfVar1;
            fVar242 = pfVar1[1];
            fVar243 = pfVar1[2];
            fVar246 = pfVar1[3];
            fVar255 = pfVar1[4];
            fVar256 = pfVar1[5];
            fVar257 = pfVar1[6];
            pfVar2 = (float *)(lVar150 + 0x2232308 + lVar152 * 4);
            fVar261 = *pfVar2;
            fVar337 = pfVar2[1];
            fVar186 = pfVar2[2];
            fVar338 = pfVar2[3];
            fVar262 = pfVar2[4];
            fVar339 = pfVar2[5];
            fVar166 = pfVar2[6];
            _local_520 = auVar40;
            fVar278 = auVar362._28_4_ + 0.0;
            pfVar3 = (float *)(lVar150 + 0x2231a00 + lVar152 * 4);
            fVar245 = *pfVar3;
            fVar189 = pfVar3[1];
            fVar263 = pfVar3[2];
            fVar323 = pfVar3[3];
            fVar167 = pfVar3[4];
            fVar201 = pfVar3[5];
            fVar218 = pfVar3[6];
            fVar169 = pfVar1[7] + pfVar2[7];
            fStack_464 = pfVar2[7] + fVar278;
            fVar278 = auVar362._28_4_ + fStack_164 + fVar278;
            pfVar1 = (float *)(lVar150 + 0x223157c + lVar152 * 4);
            fVar220 = *pfVar1;
            fVar222 = pfVar1[1];
            fVar224 = pfVar1[2];
            fVar226 = pfVar1[3];
            fVar228 = pfVar1[4];
            fVar199 = pfVar1[5];
            fVar244 = pfVar1[6];
            local_340 = (float)local_180._0_4_ * fVar220 +
                        fVar245 * fVar305 +
                        (float)local_580._0_4_ * fVar241 + (float)local_3c0._0_4_ * fVar261;
            fStack_33c = (float)local_180._4_4_ * fVar222 +
                         fVar189 * fVar306 +
                         (float)local_580._4_4_ * fVar242 + (float)local_3c0._4_4_ * fVar337;
            fStack_338 = fStack_178 * fVar224 +
                         fVar263 * fVar170 + fStack_578 * fVar243 + fStack_3b8 * fVar186;
            fStack_334 = fStack_174 * fVar226 +
                         fVar323 * fVar184 + fStack_574 * fVar246 + fStack_3b4 * fVar338;
            fStack_330 = fStack_170 * fVar228 +
                         fVar167 * fVar185 + fStack_570 * fVar255 + fStack_3b0 * fVar262;
            fStack_32c = fStack_16c * fVar199 +
                         fVar201 * fVar187 + fStack_56c * fVar256 + fStack_3ac * fVar339;
            fStack_328 = fStack_168 * fVar244 +
                         fVar218 * fVar190 + fStack_568 * fVar257 + fStack_3a8 * fVar166;
            fStack_324 = fVar169 + fStack_464;
            local_480 = fVar220 * (float)local_3a0._0_4_ +
                        fVar241 * (float)local_5e0._0_4_ + (float)local_600._0_4_ * fVar261 +
                        (float)local_4e0._0_4_ * fVar245;
            fStack_47c = fVar222 * (float)local_3a0._4_4_ +
                         fVar242 * (float)local_5e0._4_4_ + (float)local_600._4_4_ * fVar337 +
                         (float)local_4e0._4_4_ * fVar189;
            fStack_478 = fVar224 * fStack_398 +
                         fVar243 * fStack_5d8 + fStack_5f8 * fVar186 + fStack_4d8 * fVar263;
            fStack_474 = fVar226 * fStack_394 +
                         fVar246 * fStack_5d4 + fStack_5f4 * fVar338 + fStack_4d4 * fVar323;
            fStack_470 = fVar228 * fStack_390 +
                         fVar255 * fStack_5d0 + fStack_5f0 * fVar262 + fStack_4d0 * fVar167;
            fStack_46c = fVar199 * fStack_38c +
                         fVar256 * fStack_5cc + fStack_5ec * fVar339 + fStack_4cc * fVar201;
            fStack_468 = fVar244 * fStack_388 +
                         fVar257 * fStack_5c8 + fStack_5e8 * fVar166 + fStack_4c8 * fVar218;
            fStack_464 = fStack_464 + fVar278;
            auVar353._0_4_ =
                 fVar245 * (float)local_320._0_4_ +
                 (float)local_100._0_4_ * fVar241 + (float)local_540._0_4_ * fVar261 +
                 fVar220 * (float)local_560._0_4_;
            auVar353._4_4_ =
                 fVar189 * (float)local_320._4_4_ +
                 (float)local_100._4_4_ * fVar242 + (float)local_540._4_4_ * fVar337 +
                 fVar222 * (float)local_560._4_4_;
            auVar353._8_4_ =
                 fVar263 * fStack_318 + fStack_f8 * fVar243 + fStack_538 * fVar186 +
                 fVar224 * fStack_558;
            auVar353._12_4_ =
                 fVar323 * fStack_314 + fStack_f4 * fVar246 + fStack_534 * fVar338 +
                 fVar226 * fStack_554;
            auVar353._16_4_ =
                 fVar167 * fStack_310 + fStack_f0 * fVar255 + fStack_530 * fVar262 +
                 fVar228 * fStack_550;
            auVar353._20_4_ =
                 fVar201 * fStack_30c + fStack_ec * fVar256 + fStack_52c * fVar339 +
                 fVar199 * fStack_54c;
            auVar353._24_4_ =
                 fVar218 * fStack_308 + fStack_e8 * fVar257 + fStack_528 * fVar166 +
                 fVar244 * fStack_548;
            auVar353._28_4_ = pfVar3[7] + fVar169 + fVar278;
            pfVar1 = (float *)(lVar150 + 0x22342a4 + lVar152 * 4);
            fVar241 = *pfVar1;
            fVar242 = pfVar1[1];
            fVar243 = pfVar1[2];
            fVar246 = pfVar1[3];
            fVar255 = pfVar1[4];
            fVar256 = pfVar1[5];
            fVar257 = pfVar1[6];
            pfVar2 = (float *)(lVar150 + 0x2234728 + lVar152 * 4);
            fVar261 = *pfVar2;
            fVar337 = pfVar2[1];
            fVar186 = pfVar2[2];
            fVar338 = pfVar2[3];
            fVar262 = pfVar2[4];
            fVar339 = pfVar2[5];
            fVar166 = pfVar2[6];
            pfVar3 = (float *)(lVar150 + 0x2233e20 + lVar152 * 4);
            fVar245 = *pfVar3;
            fVar189 = pfVar3[1];
            fVar263 = pfVar3[2];
            fVar323 = pfVar3[3];
            fVar167 = pfVar3[4];
            fVar201 = pfVar3[5];
            fVar218 = pfVar3[6];
            pfVar4 = (float *)(lVar150 + 0x223399c + lVar152 * 4);
            fVar220 = *pfVar4;
            fVar222 = pfVar4[1];
            fVar224 = pfVar4[2];
            fVar226 = pfVar4[3];
            fVar228 = pfVar4[4];
            fVar199 = pfVar4[5];
            fVar244 = pfVar4[6];
            auVar315._0_4_ =
                 fVar220 * (float)local_180._0_4_ +
                 fVar245 * fVar305 +
                 (float)local_580._0_4_ * fVar241 + (float)local_3c0._0_4_ * fVar261;
            auVar315._4_4_ =
                 fVar222 * (float)local_180._4_4_ +
                 fVar189 * fVar306 +
                 (float)local_580._4_4_ * fVar242 + (float)local_3c0._4_4_ * fVar337;
            auVar315._8_4_ =
                 fVar224 * fStack_178 +
                 fVar263 * fVar170 + fStack_578 * fVar243 + fStack_3b8 * fVar186;
            auVar315._12_4_ =
                 fVar226 * fStack_174 +
                 fVar323 * fVar184 + fStack_574 * fVar246 + fStack_3b4 * fVar338;
            auVar315._16_4_ =
                 fVar228 * fStack_170 +
                 fVar167 * fVar185 + fStack_570 * fVar255 + fStack_3b0 * fVar262;
            auVar315._20_4_ =
                 fVar199 * fStack_16c +
                 fVar201 * fVar187 + fStack_56c * fVar256 + fStack_3ac * fVar339;
            auVar315._24_4_ =
                 fVar244 * fStack_168 +
                 fVar218 * fVar190 + fStack_568 * fVar257 + fStack_3a8 * fVar166;
            auVar315._28_4_ = fStack_4c4 + fStack_4c4 + fStack_3a4 + fStack_4c4;
            auVar348._0_4_ =
                 fVar220 * (float)local_3a0._0_4_ +
                 fVar245 * (float)local_4e0._0_4_ +
                 fVar241 * (float)local_5e0._0_4_ + (float)local_600._0_4_ * fVar261;
            auVar348._4_4_ =
                 fVar222 * (float)local_3a0._4_4_ +
                 fVar189 * (float)local_4e0._4_4_ +
                 fVar242 * (float)local_5e0._4_4_ + (float)local_600._4_4_ * fVar337;
            auVar348._8_4_ =
                 fVar224 * fStack_398 +
                 fVar263 * fStack_4d8 + fVar243 * fStack_5d8 + fStack_5f8 * fVar186;
            auVar348._12_4_ =
                 fVar226 * fStack_394 +
                 fVar323 * fStack_4d4 + fVar246 * fStack_5d4 + fStack_5f4 * fVar338;
            auVar348._16_4_ =
                 fVar228 * fStack_390 +
                 fVar167 * fStack_4d0 + fVar255 * fStack_5d0 + fStack_5f0 * fVar262;
            auVar348._20_4_ =
                 fVar199 * fStack_38c +
                 fVar201 * fStack_4cc + fVar256 * fStack_5cc + fStack_5ec * fVar339;
            auVar348._24_4_ =
                 fVar244 * fStack_388 +
                 fVar218 * fStack_4c8 + fVar257 * fStack_5c8 + fStack_5e8 * fVar166;
            auVar348._28_4_ = fStack_4c4 + fStack_4c4 + fStack_164 + fStack_4c4;
            auVar254._8_4_ = 0x7fffffff;
            auVar254._0_8_ = 0x7fffffff7fffffff;
            auVar254._12_4_ = 0x7fffffff;
            auVar254._16_4_ = 0x7fffffff;
            auVar254._20_4_ = 0x7fffffff;
            auVar254._24_4_ = 0x7fffffff;
            auVar254._28_4_ = 0x7fffffff;
            auVar137._4_4_ = fStack_33c;
            auVar137._0_4_ = local_340;
            auVar137._8_4_ = fStack_338;
            auVar137._12_4_ = fStack_334;
            auVar137._16_4_ = fStack_330;
            auVar137._20_4_ = fStack_32c;
            auVar137._24_4_ = fStack_328;
            auVar137._28_4_ = fStack_324;
            auVar155 = vandps_avx(auVar137,auVar254);
            auVar136._4_4_ = fStack_47c;
            auVar136._0_4_ = local_480;
            auVar136._8_4_ = fStack_478;
            auVar136._12_4_ = fStack_474;
            auVar136._16_4_ = fStack_470;
            auVar136._20_4_ = fStack_46c;
            auVar136._24_4_ = fStack_468;
            auVar136._28_4_ = fStack_464;
            auVar41 = vandps_avx(auVar136,auVar254);
            auVar41 = vmaxps_avx(auVar155,auVar41);
            auVar155 = vandps_avx(auVar353,auVar254);
            auVar41 = vmaxps_avx(auVar41,auVar155);
            auVar41 = vcmpps_avx(auVar41,local_120,1);
            auVar42 = vblendvps_avx(auVar137,auVar39,auVar41);
            auVar162._0_4_ =
                 fVar220 * (float)local_560._0_4_ +
                 fVar245 * (float)local_320._0_4_ +
                 fVar261 * (float)local_540._0_4_ + (float)local_100._0_4_ * fVar241;
            auVar162._4_4_ =
                 fVar222 * (float)local_560._4_4_ +
                 fVar189 * (float)local_320._4_4_ +
                 fVar337 * (float)local_540._4_4_ + (float)local_100._4_4_ * fVar242;
            auVar162._8_4_ =
                 fVar224 * fStack_558 +
                 fVar263 * fStack_318 + fVar186 * fStack_538 + fStack_f8 * fVar243;
            auVar162._12_4_ =
                 fVar226 * fStack_554 +
                 fVar323 * fStack_314 + fVar338 * fStack_534 + fStack_f4 * fVar246;
            auVar162._16_4_ =
                 fVar228 * fStack_550 +
                 fVar167 * fStack_310 + fVar262 * fStack_530 + fStack_f0 * fVar255;
            auVar162._20_4_ =
                 fVar199 * fStack_54c +
                 fVar201 * fStack_30c + fVar339 * fStack_52c + fStack_ec * fVar256;
            auVar162._24_4_ =
                 fVar244 * fStack_548 +
                 fVar218 * fStack_308 + fVar166 * fStack_528 + fStack_e8 * fVar257;
            auVar162._28_4_ = auVar155._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar43 = vblendvps_avx(auVar136,auVar40,auVar41);
            auVar155 = vandps_avx(auVar315,auVar254);
            auVar41 = vandps_avx(auVar348,auVar254);
            auVar44 = vmaxps_avx(auVar155,auVar41);
            auVar155 = vandps_avx(auVar162,auVar254);
            auVar155 = vmaxps_avx(auVar44,auVar155);
            local_6e0._0_4_ = auVar141._0_4_;
            local_6e0._4_4_ = auVar141._4_4_;
            uStack_6d8._0_4_ = auVar141._8_4_;
            uStack_6d8._4_4_ = auVar141._12_4_;
            auStack_6d0._0_4_ = auVar141._16_4_;
            auStack_6d0._4_4_ = auVar141._20_4_;
            fStack_6c8 = auVar141._24_4_;
            auVar41 = vcmpps_avx(auVar155,local_120,1);
            auVar155 = vblendvps_avx(auVar315,auVar39,auVar41);
            auVar163._0_4_ =
                 (float)local_560._0_4_ * (float)local_6e0._0_4_ +
                 (float)local_320._0_4_ * (float)local_5a0._0_4_ +
                 (float)local_100._0_4_ * (float)local_700._0_4_ + fVar264;
            auVar163._4_4_ =
                 (float)local_560._4_4_ * (float)local_6e0._4_4_ +
                 (float)local_320._4_4_ * (float)local_5a0._4_4_ +
                 (float)local_100._4_4_ * (float)local_700._4_4_ + fVar272;
            auVar163._8_4_ =
                 fStack_558 * (float)uStack_6d8 +
                 fStack_318 * (float)uStack_598 + fStack_f8 * (float)uStack_6f8 + fVar273;
            auVar163._12_4_ =
                 fStack_554 * uStack_6d8._4_4_ +
                 fStack_314 * uStack_598._4_4_ + fStack_f4 * uStack_6f8._4_4_ + fVar274;
            auVar163._16_4_ =
                 fStack_550 * (float)auStack_6d0._0_4_ +
                 fStack_310 * (float)auStack_590._0_4_ +
                 fStack_f0 * (float)auStack_6f0._0_4_ + fVar275;
            auVar163._20_4_ =
                 fStack_54c * (float)auStack_6d0._4_4_ +
                 fStack_30c * (float)auStack_590._4_4_ +
                 fStack_ec * (float)auStack_6f0._4_4_ + fVar276;
            auVar163._24_4_ =
                 fStack_548 * fStack_6c8 +
                 fStack_308 * fStack_588 + fStack_e8 * fStack_6e8 + fVar277;
            auVar163._28_4_ = auVar44._28_4_ + fStack_5a4 + auVar37._28_4_ + 0.0;
            auVar37 = vblendvps_avx(auVar348,auVar40,auVar41);
            fVar169 = auVar42._0_4_;
            fVar264 = auVar42._4_4_;
            fVar272 = auVar42._8_4_;
            fVar273 = auVar42._12_4_;
            fVar274 = auVar42._16_4_;
            fVar275 = auVar42._20_4_;
            fVar276 = auVar42._24_4_;
            fVar277 = auVar42._28_4_;
            fVar245 = auVar155._0_4_;
            fVar263 = auVar155._4_4_;
            fVar167 = auVar155._8_4_;
            fVar218 = auVar155._12_4_;
            fVar222 = auVar155._16_4_;
            fVar226 = auVar155._20_4_;
            fVar199 = auVar155._24_4_;
            fVar241 = auVar43._0_4_;
            fVar243 = auVar43._4_4_;
            fVar255 = auVar43._8_4_;
            fVar257 = auVar43._12_4_;
            fVar337 = auVar43._16_4_;
            fVar338 = auVar43._20_4_;
            fVar339 = auVar43._24_4_;
            auVar329._0_4_ = fVar241 * fVar241 + fVar169 * fVar169;
            auVar329._4_4_ = fVar243 * fVar243 + fVar264 * fVar264;
            auVar329._8_4_ = fVar255 * fVar255 + fVar272 * fVar272;
            auVar329._12_4_ = fVar257 * fVar257 + fVar273 * fVar273;
            auVar329._16_4_ = fVar337 * fVar337 + fVar274 * fVar274;
            auVar329._20_4_ = fVar338 * fVar338 + fVar275 * fVar275;
            auVar329._24_4_ = fVar339 * fVar339 + fVar276 * fVar276;
            auVar329._28_4_ = auVar39._28_4_ + auVar40._28_4_;
            auVar39 = vrsqrtps_avx(auVar329);
            fVar242 = auVar39._0_4_;
            fVar246 = auVar39._4_4_;
            auVar92._4_4_ = fVar246 * 1.5;
            auVar92._0_4_ = fVar242 * 1.5;
            fVar256 = auVar39._8_4_;
            auVar92._8_4_ = fVar256 * 1.5;
            fVar261 = auVar39._12_4_;
            auVar92._12_4_ = fVar261 * 1.5;
            fVar186 = auVar39._16_4_;
            auVar92._16_4_ = fVar186 * 1.5;
            fVar262 = auVar39._20_4_;
            auVar92._20_4_ = fVar262 * 1.5;
            fVar166 = auVar39._24_4_;
            auVar92._24_4_ = fVar166 * 1.5;
            auVar92._28_4_ = auVar348._28_4_;
            auVar93._4_4_ = fVar246 * fVar246 * fVar246 * auVar329._4_4_ * 0.5;
            auVar93._0_4_ = fVar242 * fVar242 * fVar242 * auVar329._0_4_ * 0.5;
            auVar93._8_4_ = fVar256 * fVar256 * fVar256 * auVar329._8_4_ * 0.5;
            auVar93._12_4_ = fVar261 * fVar261 * fVar261 * auVar329._12_4_ * 0.5;
            auVar93._16_4_ = fVar186 * fVar186 * fVar186 * auVar329._16_4_ * 0.5;
            auVar93._20_4_ = fVar262 * fVar262 * fVar262 * auVar329._20_4_ * 0.5;
            auVar93._24_4_ = fVar166 * fVar166 * fVar166 * auVar329._24_4_ * 0.5;
            auVar93._28_4_ = auVar329._28_4_;
            auVar40 = vsubps_avx(auVar92,auVar93);
            fVar305 = auVar40._0_4_;
            fVar306 = auVar40._4_4_;
            fVar170 = auVar40._8_4_;
            fVar184 = auVar40._12_4_;
            fVar185 = auVar40._16_4_;
            fVar187 = auVar40._20_4_;
            fVar190 = auVar40._24_4_;
            fVar242 = auVar37._0_4_;
            fVar246 = auVar37._4_4_;
            fVar256 = auVar37._8_4_;
            fVar261 = auVar37._12_4_;
            fVar186 = auVar37._16_4_;
            fVar262 = auVar37._20_4_;
            fVar166 = auVar37._24_4_;
            auVar300._0_4_ = fVar242 * fVar242 + fVar245 * fVar245;
            auVar300._4_4_ = fVar246 * fVar246 + fVar263 * fVar263;
            auVar300._8_4_ = fVar256 * fVar256 + fVar167 * fVar167;
            auVar300._12_4_ = fVar261 * fVar261 + fVar218 * fVar218;
            auVar300._16_4_ = fVar186 * fVar186 + fVar222 * fVar222;
            auVar300._20_4_ = fVar262 * fVar262 + fVar226 * fVar226;
            auVar300._24_4_ = fVar166 * fVar166 + fVar199 * fVar199;
            auVar300._28_4_ = auVar39._28_4_ + auVar155._28_4_;
            auVar155 = vrsqrtps_avx(auVar300);
            fVar189 = auVar155._0_4_;
            fVar323 = auVar155._4_4_;
            auVar94._4_4_ = fVar323 * 1.5;
            auVar94._0_4_ = fVar189 * 1.5;
            fVar201 = auVar155._8_4_;
            auVar94._8_4_ = fVar201 * 1.5;
            fVar220 = auVar155._12_4_;
            auVar94._12_4_ = fVar220 * 1.5;
            fVar224 = auVar155._16_4_;
            auVar94._16_4_ = fVar224 * 1.5;
            fVar228 = auVar155._20_4_;
            auVar94._20_4_ = fVar228 * 1.5;
            fVar244 = auVar155._24_4_;
            auVar94._24_4_ = fVar244 * 1.5;
            auVar94._28_4_ = auVar348._28_4_;
            auVar95._4_4_ = fVar323 * fVar323 * fVar323 * auVar300._4_4_ * 0.5;
            auVar95._0_4_ = fVar189 * fVar189 * fVar189 * auVar300._0_4_ * 0.5;
            auVar95._8_4_ = fVar201 * fVar201 * fVar201 * auVar300._8_4_ * 0.5;
            auVar95._12_4_ = fVar220 * fVar220 * fVar220 * auVar300._12_4_ * 0.5;
            auVar95._16_4_ = fVar224 * fVar224 * fVar224 * auVar300._16_4_ * 0.5;
            auVar95._20_4_ = fVar228 * fVar228 * fVar228 * auVar300._20_4_ * 0.5;
            auVar95._24_4_ = fVar244 * fVar244 * fVar244 * auVar300._24_4_ * 0.5;
            auVar95._28_4_ = auVar300._28_4_;
            auVar37 = vsubps_avx(auVar94,auVar95);
            fVar189 = auVar37._0_4_;
            fVar323 = auVar37._4_4_;
            fVar201 = auVar37._8_4_;
            fVar220 = auVar37._12_4_;
            fVar224 = auVar37._16_4_;
            fVar228 = auVar37._20_4_;
            fVar244 = auVar37._24_4_;
            fVar241 = fVar259 * fVar305 * fVar241;
            fVar243 = fVar260 * fVar306 * fVar243;
            auVar96._4_4_ = fVar243;
            auVar96._0_4_ = fVar241;
            fVar255 = fStack_7b8 * fVar170 * fVar255;
            auVar96._8_4_ = fVar255;
            fVar257 = fStack_7b4 * fVar184 * fVar257;
            auVar96._12_4_ = fVar257;
            fVar337 = fStack_7b0 * fVar185 * fVar337;
            auVar96._16_4_ = fVar337;
            fVar338 = fStack_7ac * fVar187 * fVar338;
            auVar96._20_4_ = fVar338;
            fVar339 = fStack_7a8 * fVar190 * fVar339;
            auVar96._24_4_ = fVar339;
            auVar96._28_4_ = auVar155._28_4_;
            local_6e0._4_4_ = fVar243 + auVar314._4_4_;
            local_6e0._0_4_ = fVar241 + auVar314._0_4_;
            uStack_6d8._0_4_ = fVar255 + auVar314._8_4_;
            uStack_6d8._4_4_ = fVar257 + auVar314._12_4_;
            auStack_6d0._0_4_ = fVar337 + auVar314._16_4_;
            auStack_6d0._4_4_ = fVar338 + auVar314._20_4_;
            fStack_6c8 = fVar339 + auVar314._24_4_;
            fStack_6c4 = auVar155._28_4_ + auVar314._28_4_;
            fVar241 = fVar259 * fVar305 * -fVar169;
            fVar243 = fVar260 * fVar306 * -fVar264;
            auVar97._4_4_ = fVar243;
            auVar97._0_4_ = fVar241;
            fVar255 = fStack_7b8 * fVar170 * -fVar272;
            auVar97._8_4_ = fVar255;
            fVar257 = fStack_7b4 * fVar184 * -fVar273;
            auVar97._12_4_ = fVar257;
            fVar337 = fStack_7b0 * fVar185 * -fVar274;
            auVar97._16_4_ = fVar337;
            fVar338 = fStack_7ac * fVar187 * -fVar275;
            auVar97._20_4_ = fVar338;
            fVar339 = fStack_7a8 * fVar190 * -fVar276;
            auVar97._24_4_ = fVar339;
            auVar97._28_4_ = -fVar277;
            local_700._4_4_ = local_760._4_4_ + fVar243;
            local_700._0_4_ = local_760._0_4_ + fVar241;
            uStack_6f8._0_4_ = local_760._8_4_ + fVar255;
            uStack_6f8._4_4_ = local_760._12_4_ + fVar257;
            auStack_6f0._0_4_ = local_760._16_4_ + fVar337;
            auStack_6f0._4_4_ = local_760._20_4_ + fVar338;
            fStack_6e8 = local_760._24_4_ + fVar339;
            fStack_6e4 = local_760._28_4_ + -fVar277;
            fVar241 = fVar305 * 0.0 * fVar259;
            fVar243 = fVar306 * 0.0 * fVar260;
            auVar98._4_4_ = fVar243;
            auVar98._0_4_ = fVar241;
            fVar255 = fVar170 * 0.0 * fStack_7b8;
            auVar98._8_4_ = fVar255;
            fVar257 = fVar184 * 0.0 * fStack_7b4;
            auVar98._12_4_ = fVar257;
            fVar337 = fVar185 * 0.0 * fStack_7b0;
            auVar98._16_4_ = fVar337;
            fVar338 = fVar187 * 0.0 * fStack_7ac;
            auVar98._20_4_ = fVar338;
            fVar339 = fVar190 * 0.0 * fStack_7a8;
            auVar98._24_4_ = fVar339;
            auVar98._28_4_ = fVar277;
            auVar43 = vsubps_avx(auVar314,auVar96);
            auVar368._0_4_ = fVar241 + auVar163._0_4_;
            auVar368._4_4_ = fVar243 + auVar163._4_4_;
            auVar368._8_4_ = fVar255 + auVar163._8_4_;
            auVar368._12_4_ = fVar257 + auVar163._12_4_;
            auVar368._16_4_ = fVar337 + auVar163._16_4_;
            auVar368._20_4_ = fVar338 + auVar163._20_4_;
            auVar368._24_4_ = fVar339 + auVar163._24_4_;
            auVar368._28_4_ = fVar277 + auVar163._28_4_;
            fVar241 = auVar352._0_4_ * fVar189 * fVar242;
            fVar242 = auVar352._4_4_ * fVar323 * fVar246;
            auVar99._4_4_ = fVar242;
            auVar99._0_4_ = fVar241;
            fVar243 = auVar352._8_4_ * fVar201 * fVar256;
            auVar99._8_4_ = fVar243;
            fVar246 = auVar352._12_4_ * fVar220 * fVar261;
            auVar99._12_4_ = fVar246;
            fVar255 = auVar352._16_4_ * fVar224 * fVar186;
            auVar99._16_4_ = fVar255;
            fVar256 = auVar352._20_4_ * fVar228 * fVar262;
            auVar99._20_4_ = fVar256;
            fVar257 = auVar352._24_4_ * fVar244 * fVar166;
            auVar99._24_4_ = fVar257;
            auVar99._28_4_ = fStack_7a4;
            auVar156 = vsubps_avx(local_760._0_32_,auVar97);
            auVar354._0_4_ = auVar270._0_4_ + fVar241;
            auVar354._4_4_ = auVar270._4_4_ + fVar242;
            auVar354._8_4_ = auVar270._8_4_ + fVar243;
            auVar354._12_4_ = auVar270._12_4_ + fVar246;
            auVar354._16_4_ = auVar270._16_4_ + fVar255;
            auVar354._20_4_ = auVar270._20_4_ + fVar256;
            auVar354._24_4_ = auVar270._24_4_ + fVar257;
            auVar354._28_4_ = auVar270._28_4_ + fStack_7a4;
            fVar241 = fVar189 * -fVar245 * auVar352._0_4_;
            fVar242 = fVar323 * -fVar263 * auVar352._4_4_;
            auVar100._4_4_ = fVar242;
            auVar100._0_4_ = fVar241;
            fVar243 = fVar201 * -fVar167 * auVar352._8_4_;
            auVar100._8_4_ = fVar243;
            fVar246 = fVar220 * -fVar218 * auVar352._12_4_;
            auVar100._12_4_ = fVar246;
            fVar255 = fVar224 * -fVar222 * auVar352._16_4_;
            auVar100._16_4_ = fVar255;
            fVar256 = fVar228 * -fVar226 * auVar352._20_4_;
            auVar100._20_4_ = fVar256;
            fVar257 = fVar244 * -fVar199 * auVar352._24_4_;
            auVar100._24_4_ = fVar257;
            auVar100._28_4_ = auVar314._28_4_;
            auVar157 = vsubps_avx(auVar163,auVar98);
            auVar235._0_4_ = auVar253._0_4_ + fVar241;
            auVar235._4_4_ = auVar253._4_4_ + fVar242;
            auVar235._8_4_ = auVar253._8_4_ + fVar243;
            auVar235._12_4_ = auVar253._12_4_ + fVar246;
            auVar235._16_4_ = auVar253._16_4_ + fVar255;
            auVar235._20_4_ = auVar253._20_4_ + fVar256;
            auVar235._24_4_ = auVar253._24_4_ + fVar257;
            auVar235._28_4_ = auVar253._28_4_ + auVar314._28_4_;
            fVar241 = fVar189 * 0.0 * auVar352._0_4_;
            fVar242 = fVar323 * 0.0 * auVar352._4_4_;
            auVar101._4_4_ = fVar242;
            auVar101._0_4_ = fVar241;
            fVar243 = fVar201 * 0.0 * auVar352._8_4_;
            auVar101._8_4_ = fVar243;
            fVar246 = fVar220 * 0.0 * auVar352._12_4_;
            auVar101._12_4_ = fVar246;
            fVar255 = fVar224 * 0.0 * auVar352._16_4_;
            auVar101._16_4_ = fVar255;
            fVar256 = fVar228 * 0.0 * auVar352._20_4_;
            auVar101._20_4_ = fVar256;
            fVar257 = fVar244 * 0.0 * auVar352._24_4_;
            auVar101._24_4_ = fVar257;
            auVar101._28_4_ = auVar163._28_4_;
            auVar155 = vsubps_avx(auVar270,auVar99);
            auVar316._0_4_ = (float)local_5c0._0_4_ + fVar241;
            auVar316._4_4_ = (float)local_5c0._4_4_ + fVar242;
            auVar316._8_4_ = fStack_5b8 + fVar243;
            auVar316._12_4_ = fStack_5b4 + fVar246;
            auVar316._16_4_ = fStack_5b0 + fVar255;
            auVar316._20_4_ = fStack_5ac + fVar256;
            auVar316._24_4_ = fStack_5a8 + fVar257;
            auVar316._28_4_ = fStack_5a4 + auVar163._28_4_;
            auVar39 = vsubps_avx(auVar253,auVar100);
            auVar40 = vsubps_avx(_local_5c0,auVar101);
            auVar41 = vsubps_avx(auVar235,auVar156);
            auVar42 = vsubps_avx(auVar316,auVar157);
            auVar102._4_4_ = auVar157._4_4_ * auVar41._4_4_;
            auVar102._0_4_ = auVar157._0_4_ * auVar41._0_4_;
            auVar102._8_4_ = auVar157._8_4_ * auVar41._8_4_;
            auVar102._12_4_ = auVar157._12_4_ * auVar41._12_4_;
            auVar102._16_4_ = auVar157._16_4_ * auVar41._16_4_;
            auVar102._20_4_ = auVar157._20_4_ * auVar41._20_4_;
            auVar102._24_4_ = auVar157._24_4_ * auVar41._24_4_;
            auVar102._28_4_ = auVar348._28_4_;
            auVar103._4_4_ = auVar156._4_4_ * auVar42._4_4_;
            auVar103._0_4_ = auVar156._0_4_ * auVar42._0_4_;
            auVar103._8_4_ = auVar156._8_4_ * auVar42._8_4_;
            auVar103._12_4_ = auVar156._12_4_ * auVar42._12_4_;
            auVar103._16_4_ = auVar156._16_4_ * auVar42._16_4_;
            auVar103._20_4_ = auVar156._20_4_ * auVar42._20_4_;
            auVar103._24_4_ = auVar156._24_4_ * auVar42._24_4_;
            auVar103._28_4_ = fStack_5a4;
            auVar44 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = auVar43._4_4_ * auVar42._4_4_;
            auVar104._0_4_ = auVar43._0_4_ * auVar42._0_4_;
            auVar104._8_4_ = auVar43._8_4_ * auVar42._8_4_;
            auVar104._12_4_ = auVar43._12_4_ * auVar42._12_4_;
            auVar104._16_4_ = auVar43._16_4_ * auVar42._16_4_;
            auVar104._20_4_ = auVar43._20_4_ * auVar42._20_4_;
            auVar104._24_4_ = auVar43._24_4_ * auVar42._24_4_;
            auVar104._28_4_ = auVar42._28_4_;
            auVar42 = vsubps_avx(auVar354,auVar43);
            auVar105._4_4_ = auVar157._4_4_ * auVar42._4_4_;
            auVar105._0_4_ = auVar157._0_4_ * auVar42._0_4_;
            auVar105._8_4_ = auVar157._8_4_ * auVar42._8_4_;
            auVar105._12_4_ = auVar157._12_4_ * auVar42._12_4_;
            auVar105._16_4_ = auVar157._16_4_ * auVar42._16_4_;
            auVar105._20_4_ = auVar157._20_4_ * auVar42._20_4_;
            auVar105._24_4_ = auVar157._24_4_ * auVar42._24_4_;
            auVar105._28_4_ = auVar37._28_4_;
            auVar46 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = auVar156._4_4_ * auVar42._4_4_;
            auVar106._0_4_ = auVar156._0_4_ * auVar42._0_4_;
            auVar106._8_4_ = auVar156._8_4_ * auVar42._8_4_;
            auVar106._12_4_ = auVar156._12_4_ * auVar42._12_4_;
            auVar106._16_4_ = auVar156._16_4_ * auVar42._16_4_;
            auVar106._20_4_ = auVar156._20_4_ * auVar42._20_4_;
            auVar106._24_4_ = auVar156._24_4_ * auVar42._24_4_;
            auVar106._28_4_ = auVar37._28_4_;
            auVar107._4_4_ = auVar43._4_4_ * auVar41._4_4_;
            auVar107._0_4_ = auVar43._0_4_ * auVar41._0_4_;
            auVar107._8_4_ = auVar43._8_4_ * auVar41._8_4_;
            auVar107._12_4_ = auVar43._12_4_ * auVar41._12_4_;
            auVar107._16_4_ = auVar43._16_4_ * auVar41._16_4_;
            auVar107._20_4_ = auVar43._20_4_ * auVar41._20_4_;
            auVar107._24_4_ = auVar43._24_4_ * auVar41._24_4_;
            auVar107._28_4_ = auVar41._28_4_;
            auVar37 = vsubps_avx(auVar107,auVar106);
            auVar181._0_4_ = auVar44._0_4_ * 0.0 + auVar37._0_4_ + auVar46._0_4_ * 0.0;
            auVar181._4_4_ = auVar44._4_4_ * 0.0 + auVar37._4_4_ + auVar46._4_4_ * 0.0;
            auVar181._8_4_ = auVar44._8_4_ * 0.0 + auVar37._8_4_ + auVar46._8_4_ * 0.0;
            auVar181._12_4_ = auVar44._12_4_ * 0.0 + auVar37._12_4_ + auVar46._12_4_ * 0.0;
            auVar181._16_4_ = auVar44._16_4_ * 0.0 + auVar37._16_4_ + auVar46._16_4_ * 0.0;
            auVar181._20_4_ = auVar44._20_4_ * 0.0 + auVar37._20_4_ + auVar46._20_4_ * 0.0;
            auVar181._24_4_ = auVar44._24_4_ * 0.0 + auVar37._24_4_ + auVar46._24_4_ * 0.0;
            auVar181._28_4_ = auVar44._28_4_ + auVar37._28_4_ + auVar46._28_4_;
            auVar36 = vcmpps_avx(auVar181,ZEXT832(0) << 0x20,2);
            auVar155 = vblendvps_avx(auVar155,_local_6e0,auVar36);
            auVar37 = vblendvps_avx(auVar39,_local_700,auVar36);
            auVar39 = vblendvps_avx(auVar40,auVar368,auVar36);
            auVar40 = vblendvps_avx(auVar43,auVar354,auVar36);
            auVar41 = vblendvps_avx(auVar156,auVar235,auVar36);
            auVar42 = vblendvps_avx(auVar157,auVar316,auVar36);
            auVar43 = vblendvps_avx(auVar354,auVar43,auVar36);
            auVar44 = vblendvps_avx(auVar235,auVar156,auVar36);
            auVar46 = vblendvps_avx(auVar316,auVar157,auVar36);
            local_760._0_32_ = vandps_avx(auVar38,_local_460);
            auVar43 = vsubps_avx(auVar43,auVar155);
            auVar176 = vsubps_avx(auVar44,auVar37);
            auVar46 = vsubps_avx(auVar46,auVar39);
            auVar177 = vsubps_avx(auVar37,auVar41);
            fVar241 = auVar176._0_4_;
            fVar240 = auVar39._0_4_;
            fVar261 = auVar176._4_4_;
            fVar286 = auVar39._4_4_;
            auVar108._4_4_ = fVar286 * fVar261;
            auVar108._0_4_ = fVar240 * fVar241;
            fVar245 = auVar176._8_4_;
            fVar287 = auVar39._8_4_;
            auVar108._8_4_ = fVar287 * fVar245;
            fVar220 = auVar176._12_4_;
            fVar289 = auVar39._12_4_;
            auVar108._12_4_ = fVar289 * fVar220;
            fVar305 = auVar176._16_4_;
            fVar290 = auVar39._16_4_;
            auVar108._16_4_ = fVar290 * fVar305;
            fVar169 = auVar176._20_4_;
            fVar291 = auVar39._20_4_;
            auVar108._20_4_ = fVar291 * fVar169;
            fVar277 = auVar176._24_4_;
            fVar292 = auVar39._24_4_;
            auVar108._24_4_ = fVar292 * fVar277;
            auVar108._28_4_ = auVar44._28_4_;
            fVar242 = auVar37._0_4_;
            fVar307 = auVar46._0_4_;
            fVar337 = auVar37._4_4_;
            fVar317 = auVar46._4_4_;
            auVar109._4_4_ = fVar317 * fVar337;
            auVar109._0_4_ = fVar307 * fVar242;
            fVar189 = auVar37._8_4_;
            fVar318 = auVar46._8_4_;
            auVar109._8_4_ = fVar318 * fVar189;
            fVar222 = auVar37._12_4_;
            fVar319 = auVar46._12_4_;
            auVar109._12_4_ = fVar319 * fVar222;
            fVar306 = auVar37._16_4_;
            fVar320 = auVar46._16_4_;
            auVar109._16_4_ = fVar320 * fVar306;
            fVar264 = auVar37._20_4_;
            fVar321 = auVar46._20_4_;
            auVar109._20_4_ = fVar321 * fVar264;
            fVar278 = auVar37._24_4_;
            fVar322 = auVar46._24_4_;
            uVar11 = auVar156._28_4_;
            auVar109._24_4_ = fVar322 * fVar278;
            auVar109._28_4_ = uVar11;
            auVar44 = vsubps_avx(auVar109,auVar108);
            fVar243 = auVar155._0_4_;
            fVar186 = auVar155._4_4_;
            auVar110._4_4_ = fVar317 * fVar186;
            auVar110._0_4_ = fVar307 * fVar243;
            fVar263 = auVar155._8_4_;
            auVar110._8_4_ = fVar318 * fVar263;
            fVar224 = auVar155._12_4_;
            auVar110._12_4_ = fVar319 * fVar224;
            fVar170 = auVar155._16_4_;
            auVar110._16_4_ = fVar320 * fVar170;
            fVar272 = auVar155._20_4_;
            auVar110._20_4_ = fVar321 * fVar272;
            fVar288 = auVar155._24_4_;
            auVar110._24_4_ = fVar322 * fVar288;
            auVar110._28_4_ = uVar11;
            fVar246 = auVar43._0_4_;
            fVar338 = auVar43._4_4_;
            auVar111._4_4_ = fVar286 * fVar338;
            auVar111._0_4_ = fVar240 * fVar246;
            fVar323 = auVar43._8_4_;
            auVar111._8_4_ = fVar287 * fVar323;
            fVar226 = auVar43._12_4_;
            auVar111._12_4_ = fVar289 * fVar226;
            fVar184 = auVar43._16_4_;
            auVar111._16_4_ = fVar290 * fVar184;
            fVar273 = auVar43._20_4_;
            auVar111._20_4_ = fVar291 * fVar273;
            fVar293 = auVar43._24_4_;
            auVar111._24_4_ = fVar292 * fVar293;
            auVar111._28_4_ = auVar354._28_4_;
            auVar156 = vsubps_avx(auVar111,auVar110);
            auVar112._4_4_ = fVar337 * fVar338;
            auVar112._0_4_ = fVar242 * fVar246;
            auVar112._8_4_ = fVar189 * fVar323;
            auVar112._12_4_ = fVar222 * fVar226;
            auVar112._16_4_ = fVar306 * fVar184;
            auVar112._20_4_ = fVar264 * fVar273;
            auVar112._24_4_ = fVar278 * fVar293;
            auVar112._28_4_ = uVar11;
            auVar113._4_4_ = fVar186 * fVar261;
            auVar113._0_4_ = fVar243 * fVar241;
            auVar113._8_4_ = fVar263 * fVar245;
            auVar113._12_4_ = fVar224 * fVar220;
            auVar113._16_4_ = fVar170 * fVar305;
            auVar113._20_4_ = fVar272 * fVar169;
            auVar113._24_4_ = fVar288 * fVar277;
            auVar113._28_4_ = auVar157._28_4_;
            auVar157 = vsubps_avx(auVar113,auVar112);
            auVar178 = vsubps_avx(auVar39,auVar42);
            fVar256 = auVar157._28_4_ + auVar156._28_4_;
            local_780._0_4_ = auVar157._0_4_ + auVar156._0_4_ * 0.0 + auVar44._0_4_ * 0.0;
            local_780._4_4_ = auVar157._4_4_ + auVar156._4_4_ * 0.0 + auVar44._4_4_ * 0.0;
            local_780._8_4_ = auVar157._8_4_ + auVar156._8_4_ * 0.0 + auVar44._8_4_ * 0.0;
            local_780._12_4_ = auVar157._12_4_ + auVar156._12_4_ * 0.0 + auVar44._12_4_ * 0.0;
            local_780._16_4_ = auVar157._16_4_ + auVar156._16_4_ * 0.0 + auVar44._16_4_ * 0.0;
            local_780._20_4_ = auVar157._20_4_ + auVar156._20_4_ * 0.0 + auVar44._20_4_ * 0.0;
            local_780._24_4_ = auVar157._24_4_ + auVar156._24_4_ * 0.0 + auVar44._24_4_ * 0.0;
            local_780._28_4_ = fVar256 + auVar44._28_4_;
            fVar255 = auVar177._0_4_;
            fVar262 = auVar177._4_4_;
            auVar114._4_4_ = auVar42._4_4_ * fVar262;
            auVar114._0_4_ = auVar42._0_4_ * fVar255;
            fVar167 = auVar177._8_4_;
            auVar114._8_4_ = auVar42._8_4_ * fVar167;
            fVar228 = auVar177._12_4_;
            auVar114._12_4_ = auVar42._12_4_ * fVar228;
            fVar185 = auVar177._16_4_;
            auVar114._16_4_ = auVar42._16_4_ * fVar185;
            fVar274 = auVar177._20_4_;
            auVar114._20_4_ = auVar42._20_4_ * fVar274;
            fVar302 = auVar177._24_4_;
            auVar114._24_4_ = auVar42._24_4_ * fVar302;
            auVar114._28_4_ = fVar256;
            fVar256 = auVar178._0_4_;
            fVar339 = auVar178._4_4_;
            auVar115._4_4_ = auVar41._4_4_ * fVar339;
            auVar115._0_4_ = auVar41._0_4_ * fVar256;
            fVar201 = auVar178._8_4_;
            auVar115._8_4_ = auVar41._8_4_ * fVar201;
            fVar199 = auVar178._12_4_;
            auVar115._12_4_ = auVar41._12_4_ * fVar199;
            fVar187 = auVar178._16_4_;
            auVar115._16_4_ = auVar41._16_4_ * fVar187;
            fVar275 = auVar178._20_4_;
            auVar115._20_4_ = auVar41._20_4_ * fVar275;
            fVar303 = auVar178._24_4_;
            auVar115._24_4_ = auVar41._24_4_ * fVar303;
            auVar115._28_4_ = auVar157._28_4_;
            auVar156 = vsubps_avx(auVar115,auVar114);
            auVar157 = vsubps_avx(auVar155,auVar40);
            fVar257 = auVar157._0_4_;
            fVar166 = auVar157._4_4_;
            auVar116._4_4_ = auVar42._4_4_ * fVar166;
            auVar116._0_4_ = auVar42._0_4_ * fVar257;
            fVar218 = auVar157._8_4_;
            auVar116._8_4_ = auVar42._8_4_ * fVar218;
            fVar244 = auVar157._12_4_;
            auVar116._12_4_ = auVar42._12_4_ * fVar244;
            fVar190 = auVar157._16_4_;
            auVar116._16_4_ = auVar42._16_4_ * fVar190;
            fVar276 = auVar157._20_4_;
            auVar116._20_4_ = auVar42._20_4_ * fVar276;
            fVar304 = auVar157._24_4_;
            auVar116._24_4_ = auVar42._24_4_ * fVar304;
            auVar116._28_4_ = auVar42._28_4_;
            auVar117._4_4_ = fVar339 * auVar40._4_4_;
            auVar117._0_4_ = fVar256 * auVar40._0_4_;
            auVar117._8_4_ = fVar201 * auVar40._8_4_;
            auVar117._12_4_ = fVar199 * auVar40._12_4_;
            auVar117._16_4_ = fVar187 * auVar40._16_4_;
            auVar117._20_4_ = fVar275 * auVar40._20_4_;
            auVar117._24_4_ = fVar303 * auVar40._24_4_;
            auVar117._28_4_ = auVar44._28_4_;
            auVar42 = vsubps_avx(auVar116,auVar117);
            auVar118._4_4_ = auVar41._4_4_ * fVar166;
            auVar118._0_4_ = auVar41._0_4_ * fVar257;
            auVar118._8_4_ = auVar41._8_4_ * fVar218;
            auVar118._12_4_ = auVar41._12_4_ * fVar244;
            auVar118._16_4_ = auVar41._16_4_ * fVar190;
            auVar118._20_4_ = auVar41._20_4_ * fVar276;
            auVar118._24_4_ = auVar41._24_4_ * fVar304;
            auVar118._28_4_ = auVar41._28_4_;
            auVar119._4_4_ = fVar262 * auVar40._4_4_;
            auVar119._0_4_ = fVar255 * auVar40._0_4_;
            auVar119._8_4_ = fVar167 * auVar40._8_4_;
            auVar119._12_4_ = fVar228 * auVar40._12_4_;
            auVar119._16_4_ = fVar185 * auVar40._16_4_;
            auVar119._20_4_ = fVar274 * auVar40._20_4_;
            auVar119._24_4_ = fVar302 * auVar40._24_4_;
            auVar119._28_4_ = auVar40._28_4_;
            auVar40 = vsubps_avx(auVar119,auVar118);
            auVar164._0_4_ = auVar156._0_4_ * 0.0 + auVar40._0_4_ + auVar42._0_4_ * 0.0;
            auVar164._4_4_ = auVar156._4_4_ * 0.0 + auVar40._4_4_ + auVar42._4_4_ * 0.0;
            auVar164._8_4_ = auVar156._8_4_ * 0.0 + auVar40._8_4_ + auVar42._8_4_ * 0.0;
            auVar164._12_4_ = auVar156._12_4_ * 0.0 + auVar40._12_4_ + auVar42._12_4_ * 0.0;
            auVar164._16_4_ = auVar156._16_4_ * 0.0 + auVar40._16_4_ + auVar42._16_4_ * 0.0;
            auVar164._20_4_ = auVar156._20_4_ * 0.0 + auVar40._20_4_ + auVar42._20_4_ * 0.0;
            auVar164._24_4_ = auVar156._24_4_ * 0.0 + auVar40._24_4_ + auVar42._24_4_ * 0.0;
            auVar164._28_4_ = auVar42._28_4_ + auVar40._28_4_ + auVar42._28_4_;
            auVar165 = ZEXT3264(auVar164);
            auVar40 = vmaxps_avx(local_780,auVar164);
            auVar40 = vcmpps_avx(auVar40,ZEXT432(0) << 0x20,2);
            auVar41 = local_760._0_32_ & auVar40;
            if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar41 >> 0x7f,0) == '\0') &&
                  (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar41 >> 0xbf,0) == '\0') &&
                (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar41[0x1f]) {
LAB_0128ee7b:
              auVar183 = ZEXT3264(CONCAT824(uStack_4e8,
                                            CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
              auVar301._4_4_ = fVar260;
              auVar301._0_4_ = fVar259;
              auVar301._8_4_ = fStack_7b8;
              auVar301._12_4_ = fStack_7b4;
              auVar301._16_4_ = fStack_7b0;
              auVar301._20_4_ = fStack_7ac;
              auVar301._24_4_ = fStack_7a8;
              auVar301._28_4_ = fStack_7a4;
            }
            else {
              auVar41 = vandps_avx(auVar40,local_760._0_32_);
              auVar120._4_4_ = fVar339 * fVar261;
              auVar120._0_4_ = fVar256 * fVar241;
              auVar120._8_4_ = fVar201 * fVar245;
              auVar120._12_4_ = fVar199 * fVar220;
              auVar120._16_4_ = fVar187 * fVar305;
              auVar120._20_4_ = fVar275 * fVar169;
              auVar120._24_4_ = fVar303 * fVar277;
              auVar120._28_4_ = local_760._28_4_;
              auVar121._4_4_ = fVar262 * fVar317;
              auVar121._0_4_ = fVar255 * fVar307;
              auVar121._8_4_ = fVar167 * fVar318;
              auVar121._12_4_ = fVar228 * fVar319;
              auVar121._16_4_ = fVar185 * fVar320;
              auVar121._20_4_ = fVar274 * fVar321;
              auVar121._24_4_ = fVar302 * fVar322;
              auVar121._28_4_ = auVar40._28_4_;
              auVar42 = vsubps_avx(auVar121,auVar120);
              auVar122._4_4_ = fVar166 * fVar317;
              auVar122._0_4_ = fVar257 * fVar307;
              auVar122._8_4_ = fVar218 * fVar318;
              auVar122._12_4_ = fVar244 * fVar319;
              auVar122._16_4_ = fVar190 * fVar320;
              auVar122._20_4_ = fVar276 * fVar321;
              auVar122._24_4_ = fVar304 * fVar322;
              auVar122._28_4_ = auVar46._28_4_;
              auVar123._4_4_ = fVar339 * fVar338;
              auVar123._0_4_ = fVar256 * fVar246;
              auVar123._8_4_ = fVar201 * fVar323;
              auVar123._12_4_ = fVar199 * fVar226;
              auVar123._16_4_ = fVar187 * fVar184;
              auVar123._20_4_ = fVar275 * fVar273;
              auVar123._24_4_ = fVar303 * fVar293;
              auVar123._28_4_ = auVar178._28_4_;
              auVar44 = vsubps_avx(auVar123,auVar122);
              auVar124._4_4_ = fVar262 * fVar338;
              auVar124._0_4_ = fVar255 * fVar246;
              auVar124._8_4_ = fVar167 * fVar323;
              auVar124._12_4_ = fVar228 * fVar226;
              auVar124._16_4_ = fVar185 * fVar184;
              auVar124._20_4_ = fVar274 * fVar273;
              auVar124._24_4_ = fVar302 * fVar293;
              auVar124._28_4_ = auVar43._28_4_;
              auVar125._4_4_ = fVar166 * fVar261;
              auVar125._0_4_ = fVar257 * fVar241;
              auVar125._8_4_ = fVar218 * fVar245;
              auVar125._12_4_ = fVar244 * fVar220;
              auVar125._16_4_ = fVar190 * fVar305;
              auVar125._20_4_ = fVar276 * fVar169;
              auVar125._24_4_ = fVar304 * fVar277;
              auVar125._28_4_ = auVar176._28_4_;
              auVar46 = vsubps_avx(auVar125,auVar124);
              auVar182._0_4_ = auVar42._0_4_ * 0.0 + auVar46._0_4_ + auVar44._0_4_ * 0.0;
              auVar182._4_4_ = auVar42._4_4_ * 0.0 + auVar46._4_4_ + auVar44._4_4_ * 0.0;
              auVar182._8_4_ = auVar42._8_4_ * 0.0 + auVar46._8_4_ + auVar44._8_4_ * 0.0;
              auVar182._12_4_ = auVar42._12_4_ * 0.0 + auVar46._12_4_ + auVar44._12_4_ * 0.0;
              auVar182._16_4_ = auVar42._16_4_ * 0.0 + auVar46._16_4_ + auVar44._16_4_ * 0.0;
              auVar182._20_4_ = auVar42._20_4_ * 0.0 + auVar46._20_4_ + auVar44._20_4_ * 0.0;
              auVar182._24_4_ = auVar42._24_4_ * 0.0 + auVar46._24_4_ + auVar44._24_4_ * 0.0;
              auVar182._28_4_ = auVar176._28_4_ + auVar46._28_4_ + auVar43._28_4_;
              auVar40 = vrcpps_avx(auVar182);
              fVar246 = auVar40._0_4_;
              fVar255 = auVar40._4_4_;
              auVar126._4_4_ = auVar182._4_4_ * fVar255;
              auVar126._0_4_ = auVar182._0_4_ * fVar246;
              fVar256 = auVar40._8_4_;
              auVar126._8_4_ = auVar182._8_4_ * fVar256;
              fVar257 = auVar40._12_4_;
              auVar126._12_4_ = auVar182._12_4_ * fVar257;
              fVar261 = auVar40._16_4_;
              auVar126._16_4_ = auVar182._16_4_ * fVar261;
              fVar338 = auVar40._20_4_;
              auVar126._20_4_ = auVar182._20_4_ * fVar338;
              fVar262 = auVar40._24_4_;
              auVar126._24_4_ = auVar182._24_4_ * fVar262;
              auVar126._28_4_ = auVar178._28_4_;
              auVar349._8_4_ = 0x3f800000;
              auVar349._0_8_ = &DAT_3f8000003f800000;
              auVar349._12_4_ = 0x3f800000;
              auVar349._16_4_ = 0x3f800000;
              auVar349._20_4_ = 0x3f800000;
              auVar349._24_4_ = 0x3f800000;
              auVar349._28_4_ = 0x3f800000;
              auVar40 = vsubps_avx(auVar349,auVar126);
              fVar246 = auVar40._0_4_ * fVar246 + fVar246;
              fVar255 = auVar40._4_4_ * fVar255 + fVar255;
              fVar256 = auVar40._8_4_ * fVar256 + fVar256;
              fVar257 = auVar40._12_4_ * fVar257 + fVar257;
              fVar261 = auVar40._16_4_ * fVar261 + fVar261;
              fVar338 = auVar40._20_4_ * fVar338 + fVar338;
              fVar262 = auVar40._24_4_ * fVar262 + fVar262;
              auVar127._4_4_ =
                   (fVar186 * auVar42._4_4_ + auVar44._4_4_ * fVar337 + auVar46._4_4_ * fVar286) *
                   fVar255;
              auVar127._0_4_ =
                   (fVar243 * auVar42._0_4_ + auVar44._0_4_ * fVar242 + auVar46._0_4_ * fVar240) *
                   fVar246;
              auVar127._8_4_ =
                   (fVar263 * auVar42._8_4_ + auVar44._8_4_ * fVar189 + auVar46._8_4_ * fVar287) *
                   fVar256;
              auVar127._12_4_ =
                   (fVar224 * auVar42._12_4_ + auVar44._12_4_ * fVar222 + auVar46._12_4_ * fVar289)
                   * fVar257;
              auVar127._16_4_ =
                   (fVar170 * auVar42._16_4_ + auVar44._16_4_ * fVar306 + auVar46._16_4_ * fVar290)
                   * fVar261;
              auVar127._20_4_ =
                   (fVar272 * auVar42._20_4_ + auVar44._20_4_ * fVar264 + auVar46._20_4_ * fVar291)
                   * fVar338;
              auVar127._24_4_ =
                   (fVar288 * auVar42._24_4_ + auVar44._24_4_ * fVar278 + auVar46._24_4_ * fVar292)
                   * fVar262;
              auVar127._28_4_ = auVar155._28_4_ + auVar37._28_4_ + auVar39._28_4_;
              fVar241 = ray->tfar;
              auVar236._4_4_ = fVar241;
              auVar236._0_4_ = fVar241;
              auVar236._8_4_ = fVar241;
              auVar236._12_4_ = fVar241;
              auVar236._16_4_ = fVar241;
              auVar236._20_4_ = fVar241;
              auVar236._24_4_ = fVar241;
              auVar236._28_4_ = fVar241;
              auVar155 = vcmpps_avx(local_140,auVar127,2);
              auVar37 = vcmpps_avx(auVar127,auVar236,2);
              auVar155 = vandps_avx(auVar155,auVar37);
              auVar39 = auVar41 & auVar155;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar39 >> 0x7f,0) == '\0') &&
                    (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar39 >> 0xbf,0) == '\0') &&
                  (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar39[0x1f]) goto LAB_0128ee7b;
              auVar155 = vandps_avx(auVar41,auVar155);
              auVar39 = vcmpps_avx(ZEXT432(0) << 0x20,auVar182,4);
              auVar40 = auVar155 & auVar39;
              auVar183 = ZEXT3264(CONCAT824(uStack_4e8,
                                            CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
              auVar301._4_4_ = fVar260;
              auVar301._0_4_ = fVar259;
              auVar301._8_4_ = fStack_7b8;
              auVar301._12_4_ = fStack_7b4;
              auVar301._16_4_ = fStack_7b0;
              auVar301._20_4_ = fStack_7ac;
              auVar301._24_4_ = fStack_7a8;
              auVar301._28_4_ = fStack_7a4;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                auVar155 = vandps_avx(auVar39,auVar155);
                auVar183 = ZEXT3264(auVar155);
                auVar128._4_4_ = fVar255 * local_780._4_4_;
                auVar128._0_4_ = fVar246 * (float)local_780._0_4_;
                auVar128._8_4_ = fVar256 * local_780._8_4_;
                auVar128._12_4_ = fVar257 * local_780._12_4_;
                auVar128._16_4_ = fVar261 * local_780._16_4_;
                auVar128._20_4_ = fVar338 * local_780._20_4_;
                auVar128._24_4_ = fVar262 * local_780._24_4_;
                auVar128._28_4_ = auVar37._28_4_;
                auVar129._4_4_ = auVar164._4_4_ * fVar255;
                auVar129._0_4_ = auVar164._0_4_ * fVar246;
                auVar129._8_4_ = auVar164._8_4_ * fVar256;
                auVar129._12_4_ = auVar164._12_4_ * fVar257;
                auVar129._16_4_ = auVar164._16_4_ * fVar261;
                auVar129._20_4_ = auVar164._20_4_ * fVar338;
                auVar129._24_4_ = auVar164._24_4_ * fVar262;
                auVar129._28_4_ = auVar164._28_4_;
                auVar271._8_4_ = 0x3f800000;
                auVar271._0_8_ = &DAT_3f8000003f800000;
                auVar271._12_4_ = 0x3f800000;
                auVar271._16_4_ = 0x3f800000;
                auVar271._20_4_ = 0x3f800000;
                auVar271._24_4_ = 0x3f800000;
                auVar271._28_4_ = 0x3f800000;
                auVar155 = vsubps_avx(auVar271,auVar128);
                _local_1a0 = vblendvps_avx(auVar155,auVar128,auVar36);
                auVar155 = vsubps_avx(auVar271,auVar129);
                _local_380 = vblendvps_avx(auVar155,auVar129,auVar36);
                auVar165 = ZEXT3264(_local_380);
                local_1c0 = auVar127;
              }
            }
            auVar362 = ZEXT3264(local_640);
            auVar155 = auVar183._0_32_;
            if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar155 >> 0x7f,0) == '\0') &&
                  (auVar183 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar155 >> 0xbf,0) == '\0') &&
                (auVar183 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar183[0x1f]) {
              auVar330 = ZEXT3264(_local_580);
            }
            else {
              auVar37 = vsubps_avx(auVar352,auVar301);
              fVar242 = auVar301._0_4_ + auVar37._0_4_ * (float)local_1a0._0_4_;
              fVar243 = auVar301._4_4_ + auVar37._4_4_ * (float)local_1a0._4_4_;
              fVar246 = auVar301._8_4_ + auVar37._8_4_ * fStack_198;
              fVar255 = auVar301._12_4_ + auVar37._12_4_ * fStack_194;
              fVar256 = auVar301._16_4_ + auVar37._16_4_ * fStack_190;
              fVar257 = auVar301._20_4_ + auVar37._20_4_ * fStack_18c;
              fVar259 = auVar301._24_4_ + auVar37._24_4_ * fStack_188;
              fVar260 = auVar301._28_4_ + auVar37._28_4_;
              fVar241 = local_788->depth_scale;
              auVar130._4_4_ = (fVar243 + fVar243) * fVar241;
              auVar130._0_4_ = (fVar242 + fVar242) * fVar241;
              auVar130._8_4_ = (fVar246 + fVar246) * fVar241;
              auVar130._12_4_ = (fVar255 + fVar255) * fVar241;
              auVar130._16_4_ = (fVar256 + fVar256) * fVar241;
              auVar130._20_4_ = (fVar257 + fVar257) * fVar241;
              auVar130._24_4_ = (fVar259 + fVar259) * fVar241;
              auVar130._28_4_ = fVar260 + fVar260;
              auVar37 = vcmpps_avx(local_1c0,auVar130,6);
              auVar165 = ZEXT3264(auVar37);
              auVar39 = auVar155 & auVar37;
              auVar330 = ZEXT3264(_local_580);
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                local_240 = vandps_avx(auVar37,auVar155);
                auVar165 = ZEXT3264(local_240);
                auVar174._0_8_ =
                     CONCAT44((float)local_380._4_4_ + (float)local_380._4_4_ + -1.0,
                              (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0);
                auVar174._8_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
                auVar174._12_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
                auVar175._16_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
                auVar175._0_16_ = auVar174;
                auVar175._20_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
                fStack_2c8 = (float)uStack_368 + (float)uStack_368 + -1.0;
                _local_2e0 = auVar175;
                fStack_2c4 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
                auVar183 = ZEXT3264(_local_2e0);
                local_300 = _local_1a0;
                local_2c0 = local_1c0;
                local_29c = uVar147;
                local_290 = local_690;
                uStack_288 = uStack_688;
                local_280 = local_3f0._0_8_;
                uStack_278 = local_3f0._8_8_;
                local_270 = local_400._0_8_;
                uStack_268 = local_400._8_8_;
                local_260 = local_410._0_8_;
                uStack_258 = local_410._8_8_;
                local_6c0._0_8_ = (context->scene->geometries).items[local_790].ptr;
                _local_380 = _local_2e0;
                auVar155 = _local_380;
                if ((((Geometry *)local_6c0._0_8_)->mask & ray->mask) == 0) {
                  pRVar145 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar145 = context->args;
                  if ((pRVar145->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar145 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar145 >> 8),1),
                     ((Geometry *)local_6c0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_6c0._8_24_ = auVar270._8_24_;
                    _auStack_7dc = auVar352._4_28_;
                    local_7e0 = (undefined1  [4])(int)uVar151;
                    auVar372 = vshufps_avx(ZEXT416((uint)(float)(int)local_2a0),
                                           ZEXT416((uint)(float)(int)local_2a0),0);
                    local_220[0] = (auVar372._0_4_ + (float)local_1a0._0_4_ + 0.0) *
                                   (float)local_3e0._0_4_;
                    local_220[1] = (auVar372._4_4_ + (float)local_1a0._4_4_ + 1.0) *
                                   (float)local_3e0._4_4_;
                    local_220[2] = (auVar372._8_4_ + fStack_198 + 2.0) * fStack_3d8;
                    local_220[3] = (auVar372._12_4_ + fStack_194 + 3.0) * fStack_3d4;
                    fStack_210 = (auVar372._0_4_ + fStack_190 + 4.0) * fStack_3d0;
                    fStack_20c = (auVar372._4_4_ + fStack_18c + 5.0) * fStack_3cc;
                    fStack_208 = (auVar372._8_4_ + fStack_188 + 6.0) * fStack_3c8;
                    fStack_204 = auVar372._12_4_ + fStack_184 + 7.0;
                    uStack_378 = auVar174._8_8_;
                    uStack_370 = auVar175._16_8_;
                    uStack_368 = local_2e0._24_8_;
                    local_200 = auVar174._0_8_;
                    uStack_1f8 = uStack_378;
                    uStack_1f0 = uStack_370;
                    uStack_1e8 = uStack_368;
                    auVar183 = ZEXT3264(local_1c0);
                    local_1e0 = local_1c0;
                    iVar144 = vmovmskps_avx(local_240);
                    uVar146 = CONCAT44((int)((ulong)pRVar145 >> 0x20),iVar144);
                    lVar148 = 0;
                    if (uVar146 != 0) {
                      for (; (uVar146 >> lVar148 & 1) == 0; lVar148 = lVar148 + 1) {
                      }
                    }
                    local_7c0 = (uint)lVar148;
                    uStack_7bc = (undefined4)((ulong)lVar148 >> 0x20);
                    local_760._0_8_ = uVar146;
                    local_620._4_28_ = auVar253._4_28_;
                    local_620._0_4_ = (int)CONCAT71((int7)(uVar146 >> 8),iVar144 != 0);
                    _local_380 = auVar155;
                    if (iVar144 != 0) {
                      _local_6e0 = local_3f0;
                      _auStack_590 = auVar38._16_16_;
                      _local_5a0 = local_400;
                      _local_700 = local_410;
                      do {
                        lVar148 = CONCAT44(uStack_7bc,local_7c0);
                        local_674 = local_220[lVar148];
                        auVar165 = ZEXT464((uint)local_674);
                        local_670 = *(uint *)((long)&local_200 + lVar148 * 4);
                        auVar183 = ZEXT464(local_670);
                        local_780._0_4_ = local_7e8->tfar;
                        local_7e8->tfar = *(float *)(local_1e0 + lVar148 * 4);
                        fVar188 = 1.0 - local_674;
                        fVar200 = local_674 * 3.0;
                        auVar372 = ZEXT416((uint)((fVar188 * -2.0 * local_674 +
                                                  local_674 * local_674) * 0.5));
                        auVar372 = vshufps_avx(auVar372,auVar372,0);
                        auVar205 = ZEXT416((uint)(((fVar188 + fVar188) * (fVar200 + 2.0) +
                                                  fVar188 * fVar188 * -3.0) * 0.5));
                        auVar205 = vshufps_avx(auVar205,auVar205,0);
                        auVar206 = ZEXT416((uint)(((local_674 + local_674) * (fVar200 + -5.0) +
                                                  local_674 * fVar200) * 0.5));
                        auVar206 = vshufps_avx(auVar206,auVar206,0);
                        auVar207 = ZEXT416((uint)((local_674 * (fVar188 + fVar188) -
                                                  fVar188 * fVar188) * 0.5));
                        auVar207 = vshufps_avx(auVar207,auVar207,0);
                        auVar192._0_4_ =
                             auVar207._0_4_ * (float)local_690._0_4_ +
                             auVar206._0_4_ * (float)local_6e0._0_4_ +
                             auVar372._0_4_ * (float)local_700._0_4_ +
                             auVar205._0_4_ * (float)local_5a0._0_4_;
                        auVar192._4_4_ =
                             auVar207._4_4_ * (float)local_690._4_4_ +
                             auVar206._4_4_ * (float)local_6e0._4_4_ +
                             auVar372._4_4_ * (float)local_700._4_4_ +
                             auVar205._4_4_ * (float)local_5a0._4_4_;
                        auVar192._8_4_ =
                             auVar207._8_4_ * (float)uStack_688 +
                             auVar206._8_4_ * (float)uStack_6d8 +
                             auVar372._8_4_ * (float)uStack_6f8 + auVar205._8_4_ * (float)uStack_598
                        ;
                        auVar192._12_4_ =
                             auVar207._12_4_ * uStack_688._4_4_ +
                             auVar206._12_4_ * uStack_6d8._4_4_ +
                             auVar372._12_4_ * uStack_6f8._4_4_ + auVar205._12_4_ * uStack_598._4_4_
                        ;
                        local_730.context = context->user;
                        local_680 = vmovlps_avx(auVar192);
                        local_678 = vextractps_avx(auVar192,2);
                        local_66c = (int)local_648;
                        local_668 = (int)local_790;
                        local_664 = (local_730.context)->instID[0];
                        local_660 = (local_730.context)->instPrimID[0];
                        local_7ec = -1;
                        local_730.valid = &local_7ec;
                        local_730.geometryUserPtr = *(void **)(local_6c0._0_8_ + 0x18);
                        local_730.ray = (RTCRayN *)local_7e8;
                        local_730.hit = (RTCHitN *)&local_680;
                        local_730.N = 1;
                        if (*(code **)(local_6c0._0_8_ + 0x48) == (code *)0x0) {
LAB_0128ed7f:
                          p_Var35 = context->args->filter;
                          if (p_Var35 == (RTCFilterFunctionN)0x0) break;
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_6c0._0_8_ + 0x3e) & 0x40) != 0)) {
                            auVar372 = (*p_Var35)(&local_730);
                            auVar183._0_8_ = auVar372._8_8_;
                            auVar165._0_8_ = auVar372._0_8_;
                            auVar183._8_56_ = extraout_var_02;
                            auVar165._8_56_ = extraout_var_00;
                          }
                          if (*local_730.valid != 0) break;
                        }
                        else {
                          auVar372 = (**(code **)(local_6c0._0_8_ + 0x48))(&local_730);
                          auVar183._0_8_ = auVar372._8_8_;
                          auVar165._0_8_ = auVar372._0_8_;
                          auVar183._8_56_ = extraout_var_01;
                          auVar165._8_56_ = extraout_var;
                          if (*local_730.valid != 0) goto LAB_0128ed7f;
                        }
                        auVar165 = ZEXT464((uint)local_780._0_4_);
                        local_7e8->tfar = (float)local_780._0_4_;
                        uVar146 = local_760._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
                        lVar148 = 0;
                        if (uVar146 != 0) {
                          for (; (uVar146 >> lVar148 & 1) == 0; lVar148 = lVar148 + 1) {
                          }
                        }
                        local_7c0 = (uint)lVar148;
                        uStack_7bc = (undefined4)((ulong)lVar148 >> 0x20);
                        local_760._0_8_ = uVar146;
                        local_620._0_4_ = (int)CONCAT71((int7)(uVar146 >> 8),uVar146 != 0);
                      } while (uVar146 != 0);
                    }
                    pRVar145 = (RTCIntersectArguments *)(ulong)(local_620[0] & 1);
                    auVar330 = ZEXT3264(_local_580);
                    auVar362 = ZEXT3264(local_640);
                    uVar151 = (ulong)(uint)local_7e0;
                    ray = local_7e8;
                  }
                }
                uVar151 = CONCAT71((int7)(uVar151 >> 8),(byte)uVar151 | (byte)pRVar145);
                fVar200 = (float)local_600._0_4_;
                fVar188 = (float)local_600._4_4_;
                fVar217 = fStack_5f8;
                fVar258 = fStack_5f4;
                fVar219 = fStack_5f0;
                fVar358 = fStack_5ec;
                fVar221 = fStack_5e8;
                fVar168 = fStack_5e4;
                fVar223 = (float)local_4e0._0_4_;
                fVar225 = (float)local_4e0._4_4_;
                fVar227 = fStack_4d8;
                fVar229 = fStack_4d4;
                fVar237 = fStack_4d0;
                fVar238 = fStack_4cc;
                fVar239 = fStack_4c8;
              }
            }
          }
          lVar152 = lVar152 + 8;
        } while ((int)lVar152 < (int)uVar147);
      }
      if ((uVar151 & 1) != 0) {
        return local_7f9;
      }
      fVar200 = ray->tfar;
      auVar161._4_4_ = fVar200;
      auVar161._0_4_ = fVar200;
      auVar161._8_4_ = fVar200;
      auVar161._12_4_ = fVar200;
      auVar161._16_4_ = fVar200;
      auVar161._20_4_ = fVar200;
      auVar161._24_4_ = fVar200;
      auVar161._28_4_ = fVar200;
      auVar155 = vcmpps_avx(local_80,auVar161,2);
      uVar147 = vmovmskps_avx(auVar155);
      uVar143 = uVar143 & uVar143 + 0xff & uVar147;
      local_7f9 = uVar143 != 0;
    } while (local_7f9);
  }
  return local_7f9;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }